

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  Layer *pLVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  char cVar20;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined4 uVar29;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined1 uVar36;
  undefined4 uVar37;
  undefined1 uVar38;
  undefined1 uVar40;
  undefined1 uVar42;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar48;
  undefined1 uVar50;
  size_t sVar51;
  int iVar52;
  int iVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  Mat *pMVar62;
  long lVar63;
  uint uVar64;
  long lVar65;
  undefined1 (*pauVar66) [32];
  long lVar67;
  ulong uVar68;
  undefined4 uVar69;
  int iVar70;
  int iVar71;
  long lVar72;
  ulong uVar73;
  undefined1 (*pauVar74) [16];
  ulong *puVar75;
  int *piVar76;
  char *r0;
  Option *pOVar77;
  int iVar78;
  int iVar79;
  long lVar80;
  undefined1 (*pauVar81) [32];
  undefined1 (*pauVar82) [32];
  ulong uVar83;
  uint uVar84;
  uint uVar85;
  long lVar86;
  void *pvVar87;
  int iVar88;
  int iVar89;
  uint uVar90;
  undefined8 *puVar91;
  undefined1 *puVar92;
  long lVar93;
  uint uVar94;
  uint uVar95;
  int iVar96;
  int iVar97;
  char *r0_4;
  long lVar98;
  undefined1 (*pauVar99) [32];
  int iVar100;
  char *r2_5;
  long lVar101;
  int k_4;
  uint uVar102;
  long lVar103;
  ulong uVar104;
  long lVar105;
  int *piVar106;
  int k;
  int iVar107;
  int iVar108;
  ulong *puVar109;
  int iVar110;
  int iVar111;
  char *r3_3;
  int iVar116;
  int iVar117;
  int iVar118;
  uint uVar119;
  ulong uVar112;
  long lVar113;
  ulong *puVar114;
  bool bVar115;
  char *r1;
  undefined1 (*pauVar120) [16];
  bool bVar121;
  undefined1 (*pauVar122) [32];
  void *pvVar123;
  int sum0 [4];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  int sum1 [4];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  int sum0_1 [4];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  ulong local_4b0;
  int cstep;
  ulong local_490;
  long local_468;
  ulong local_438;
  long local_430;
  long local_420;
  undefined1 (*local_408) [16];
  undefined1 (*local_400) [16];
  Mat local_3c8;
  void *local_378;
  int TILE_K;
  undefined1 local_368 [16];
  undefined8 local_350;
  long local_348;
  Option *local_340;
  int TILE_N;
  void *local_330;
  undefined8 local_328;
  long local_320;
  Mat local_318;
  ulong local_2d0;
  long local_2c8;
  int TILE_K_1;
  Option opt_q;
  Option local_278;
  undefined8 local_238;
  int local_22c;
  Mat local_228;
  Mat m;
  Mat local_160;
  ulong local_118;
  long local_110;
  int local_104;
  ulong local_100;
  ulong local_f8;
  int TILE_M;
  int *local_e8;
  Allocator *local_e0;
  int local_d8;
  Allocator *local_d0;
  int local_c8;
  int local_c4;
  undefined8 local_c0;
  int local_b8;
  size_t local_b0;
  Mat local_a8;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined4 uVar31;
  undefined3 uVar33;
  undefined2 uVar35;
  undefined4 uVar39;
  undefined3 uVar41;
  undefined2 uVar43;
  undefined3 uVar47;
  undefined2 uVar49;
  
  local_a8.elempack = bottom_blob->elempack;
  local_a8.elemsize = bottom_blob->elemsize;
  piVar106 = bottom_blob->refcount;
  local_a8.data = bottom_blob->data;
  local_a8.refcount = bottom_blob->refcount;
  local_a8.allocator = bottom_blob->allocator;
  local_a8.dims = bottom_blob->dims;
  local_a8.w = bottom_blob->w;
  local_a8.h = bottom_blob->h;
  local_a8.d = bottom_blob->d;
  local_a8.c = bottom_blob->c;
  local_a8.cstep = bottom_blob->cstep;
  if (piVar106 != (int *)0x0) {
    LOCK();
    *piVar106 = *piVar106 + 1;
    UNLOCK();
  }
  if (local_a8.elempack == 0 || ((int)local_a8.elemsize * 8) / local_a8.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_ops = opt->use_subgroup_ops;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar21 = opt->openmp_blocktime;
    uVar22 = opt->use_winograd_convolution;
    uVar24 = opt->use_sgemm_convolution;
    uVar26 = opt->use_int8_inference;
    uVar28 = opt->use_vulkan_compute;
    uVar27 = CONCAT11(uVar28,uVar26);
    uVar25 = CONCAT21(uVar27,uVar24);
    uVar23 = CONCAT31(uVar25,uVar22);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    uVar29 = opt->vulkan_device_index;
    uVar30 = opt->use_reserved_1;
    uVar32 = opt->use_image_storage;
    uVar34 = opt->use_tensor_storage;
    uVar36 = opt->use_reserved_2;
    uVar35 = CONCAT11(uVar36,uVar34);
    uVar33 = CONCAT21(uVar35,uVar32);
    uVar31 = CONCAT31(uVar33,uVar30);
    uVar37 = opt->flush_denormals;
    uVar38 = opt->use_local_pool_allocator;
    uVar40 = opt->use_shader_local_memory;
    uVar42 = opt->use_cooperative_matrix;
    uVar44 = opt->use_winograd23_convolution;
    uVar43 = CONCAT11(uVar44,uVar42);
    uVar41 = CONCAT21(uVar43,uVar40);
    uVar39 = CONCAT31(uVar41,uVar38);
    uVar2._0_1_ = opt->use_winograd43_convolution;
    uVar2._1_1_ = opt->use_winograd63_convolution;
    uVar2._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar2._3_1_ = opt->use_fp16_uniform;
    uVar45 = opt->use_int8_uniform;
    uVar46 = opt->use_reserved_9;
    uVar48 = opt->use_reserved_10;
    uVar50 = opt->use_reserved_11;
    uVar49 = CONCAT11(uVar50,uVar48);
    uVar47 = CONCAT21(uVar49,uVar46);
    uVar2._4_4_ = CONCAT31(uVar47,uVar45);
    opt_q._56_4_ = SUB84(uVar2,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar21;
    opt_q._28_4_ = uVar23;
    opt_q.vulkan_device_index = uVar29;
    opt_q._44_4_ = uVar31;
    opt_q.flush_denormals = uVar37;
    opt_q._52_4_ = uVar39;
    opt_q._60_4_ = uVar2._4_4_;
    quantize_to_int8(bottom_blob,&local_a8,&(this->super_Convolution).bottom_blob_int8_scales,&opt_q
                    );
    if ((local_a8.data == (void *)0x0) || ((long)local_a8.c * local_a8.cstep == 0)) {
      iVar100 = -100;
      goto LAB_0020c203;
    }
  }
  local_3c8.cstep = 0;
  local_3c8.data = (void *)0x0;
  local_3c8.refcount._0_4_ = 0;
  local_3c8.refcount._4_4_ = 0;
  local_3c8.elemsize = 0;
  local_3c8.elempack = 0;
  local_3c8.allocator = (Allocator *)0x0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_3c8.h = 0;
  local_3c8.d = 0;
  local_3c8.c = 0;
  local_340 = opt;
  Convolution::make_padding(&this->super_Convolution,&local_a8,&local_3c8,opt);
  iVar57 = local_3c8.c;
  iVar59 = local_3c8.elempack;
  iVar100 = -100;
  if ((local_3c8.data != (void *)0x0) && (local_3c8.cstep * (long)local_3c8.c != 0)) {
    uVar119 = (this->super_Convolution).num_output;
    iVar78 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w) +
             local_3c8.w) / (this->super_Convolution).stride_w + 1;
    iVar116 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h) +
              local_3c8.h) / (this->super_Convolution).stride_h + 1;
    local_22c = (this->super_Convolution).int8_scale_term;
    uVar54 = 1;
    if (local_340->use_packing_layout == true) {
      if (local_22c < 0x65) {
        uVar54 = 8;
        if ((uVar119 & 7) != 0) {
          uVar54 = (uint)((uVar119 & 3) == 0) * 3 + 1;
        }
      }
      else {
        uVar54 = 1;
        if ((uVar119 & 7) == 0) {
          uVar54 = 8;
        }
      }
    }
    uVar90 = uVar54 * 4;
    if (100 < local_22c) {
      uVar90 = uVar54;
    }
    Mat::create(top_blob,iVar78,iVar116,(int)uVar119 / (int)uVar54,(ulong)uVar90,uVar54,
                local_340->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar100 = 1;
      if (local_340->use_packing_layout == true) {
        uVar119 = (this->super_Convolution).num_output;
        if (local_22c < 0x65) {
          iVar100 = 8;
          if ((uVar119 & 7) != 0) {
            iVar100 = (uint)((uVar119 & 3) == 0) * 3 + 1;
          }
        }
        else {
          iVar100 = 1;
          if ((uVar119 & 7) == 0) {
            iVar100 = 8;
          }
        }
      }
      if ((local_340->use_winograd23_convolution == false) &&
         (local_340->use_winograd43_convolution != true)) {
        bVar121 = false;
      }
      else {
        bVar121 = true;
        if (iVar59 * iVar57 < 9) {
          bVar121 = 8 < (this->super_Convolution).num_output;
        }
      }
      if ((local_340->use_packing_layout != false) &&
         ((auVar127._0_4_ = (this->super_Convolution).kernel_w,
          auVar127._4_4_ = (this->super_Convolution).kernel_h,
          auVar127._8_4_ = (this->super_Convolution).dilation_w,
          auVar127._12_4_ = (this->super_Convolution).dilation_h,
          ((this->super_Convolution).stride_w == 1 & local_340->use_winograd_convolution &
           (this->super_Convolution).stride_h == 1 & auVar127 == _DAT_005a5480 & bVar121) != 0 ||
          (local_340->use_sgemm_convolution == false)))) {
        iVar100 = (uint)(((this->super_Convolution).num_output & 3) == 0) * 3 + 1;
      }
      local_318.cstep = 0;
      local_318.data = (void *)0x0;
      local_318.refcount._0_4_ = 0;
      local_318.refcount._4_4_ = 0;
      local_318.elemsize = 0;
      local_318.elempack = 0;
      local_318.allocator = (Allocator *)0x0;
      local_318.dims = 0;
      local_318.w = 0;
      local_318.h = 0;
      local_318.d = 0;
      local_318.c = 0;
      Mat::create(&local_318,iVar78,iVar116,(this->super_Convolution).num_output / iVar100,
                  (ulong)(uint)(iVar100 * 4),iVar100,local_340->workspace_allocator);
      pOVar77 = local_340;
      iVar100 = -100;
      if ((local_318.data != (void *)0x0) && ((long)local_318.c * local_318.cstep != 0)) {
        uVar119 = this->nT;
        uVar54 = uVar119;
        if (uVar119 == 0) {
          uVar54 = local_340->num_threads;
        }
        if (local_340->num_threads != uVar119 && uVar119 != 0) {
          forward_int8_x86();
        }
        auVar133._0_4_ = (this->super_Convolution).kernel_w;
        auVar133._4_4_ = (this->super_Convolution).kernel_h;
        auVar133._8_4_ = (this->super_Convolution).dilation_w;
        auVar133._12_4_ = (this->super_Convolution).dilation_h;
        uVar119 = (this->super_Convolution).stride_w;
        iVar59 = (this->super_Convolution).stride_h;
        if ((uVar119 == 1 & pOVar77->use_winograd_convolution & iVar59 == 1 & bVar121 &
            auVar133 == _DAT_005a5480) == 1) {
          if (((pOVar77->use_winograd43_convolution == true) &&
              ((this->weight_winograd43_data).data != (void *)0x0)) &&
             ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep != 0)) {
            iVar100 = conv3x3s1_winograd43_int8
                                (&local_3c8,&local_318,&this->weight_winograd43_data,uVar54,pOVar77)
            ;
          }
          else {
            iVar100 = cpu_support_x86_avx_vnni();
            pMVar62 = &this->weight_winograd23_data;
            if (iVar100 == 0) {
              iVar100 = cpu_support_x86_avx2();
              if (iVar100 == 0) {
                iVar100 = cpu_support_x86_xop();
                if (iVar100 == 0) {
                  auVar126._4_4_ = local_318.h;
                  auVar126._0_4_ = local_318.w;
                  auVar127 = vpcmpeqd_avx(auVar133,auVar133);
                  auVar126._8_8_ = 0;
                  auVar127 = vpsubd_avx(auVar126,auVar127);
                  auVar133 = vpsrld_avx(auVar127,0x1f);
                  auVar127 = vpaddd_avx(auVar127,auVar133);
                  auVar127 = vpsrad_avx(auVar127,1);
                  iVar111 = local_318.elempack * local_318.c;
                  iVar118 = auVar127._4_4_ * auVar127._0_4_;
                  iVar78 = local_3c8.elempack * local_3c8.c;
                  get_optimal_tile_mnk_int8(iVar111,iVar118,iVar78,&TILE_M,&TILE_N,&TILE_K,uVar54);
                  iVar57 = TILE_N;
                  iVar59 = TILE_K;
                  local_348 = CONCAT44(local_348._4_4_,(TILE_M + iVar111 + -1) / TILE_M);
                  iVar107 = (iVar118 + TILE_N + -1) / TILE_N;
                  iVar96 = (iVar78 + TILE_K + -1) / TILE_K;
                  iVar116 = TILE_K * TILE_N;
                  local_228.cstep = 0;
                  local_228.data = (void *)0x0;
                  local_228.refcount._0_4_ = 0;
                  local_228.refcount._4_4_ = 0;
                  local_228.elemsize = 0;
                  local_228.elempack = 0;
                  local_228.allocator = (Allocator *)0x0;
                  local_228.dims = 0;
                  local_228.w = 0;
                  local_228.h = 0;
                  local_228.d = 0;
                  local_228.c = 0;
                  Mat::create(&local_228,iVar116,0x10,iVar96,iVar107,2,
                              local_340->workspace_allocator);
                  iVar100 = -100;
                  if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0))
                  {
                    iVar107 = iVar107 * iVar96;
                    iVar116 = iVar116 * 0x10;
                    if (((int)uVar54 < 2) || ((int)uVar54 <= iVar107)) {
                      local_278.lightmode = false;
                      local_278.use_shader_pack8 = false;
                      local_278.use_subgroup_ops = false;
                      local_278.use_reserved_0 = false;
                      local_278.num_threads = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator = (Allocator *)0x0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.use_bf16_storage = false;
                      opt_q.use_fp16_packed = false;
                      opt_q.use_fp16_storage = false;
                      opt_q.use_fp16_arithmetic = false;
                      opt_q.use_int8_packed = false;
                      opt_q.use_int8_storage = false;
                      opt_q.use_int8_arithmetic = false;
                      opt_q.use_packing_layout = false;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                      Mat::create((Mat *)&opt_q,iVar116,1,uVar54,2,local_340->workspace_allocator);
                      if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_278._0_8_ != 0)) {
                        if (0 < iVar107) {
                          iVar100 = 0;
                          do {
                            iVar97 = (iVar100 / iVar96) * iVar57;
                            iVar71 = (iVar100 % iVar96) * iVar59;
                            iVar116 = iVar118 - iVar97;
                            if (iVar57 < iVar116) {
                              iVar116 = iVar57;
                            }
                            iVar79 = iVar78 - iVar71;
                            if (iVar59 < iVar79) {
                              iVar79 = iVar59;
                            }
                            iVar58 = get_omp_thread_num();
                            m.data = (void *)((long)iVar58 * local_278._0_8_ *
                                              (long)opt_q.workspace_allocator + opt_q._0_8_);
                            m.refcount._0_4_ = 0;
                            m.refcount._4_4_ = 0;
                            m.elemsize = (size_t)opt_q.workspace_allocator;
                            m.elempack = opt_q.openmp_blocktime;
                            m.allocator = (Allocator *)opt_q._32_8_;
                            m.w._0_1_ = opt_q.use_reserved_1;
                            m.w._1_1_ = opt_q.use_image_storage;
                            m.w._2_1_ = opt_q.use_tensor_storage;
                            m.w._3_1_ = opt_q.use_reserved_2;
                            m.h = opt_q.flush_denormals;
                            m.d = 1;
                            m.c._0_1_ = opt_q.use_local_pool_allocator;
                            m.c._1_1_ = opt_q.use_shader_local_memory;
                            m.c._2_1_ = opt_q.use_cooperative_matrix;
                            m.c._3_1_ = opt_q.use_winograd23_convolution;
                            m.dims = opt_q.vulkan_device_index + -1;
                            m.cstep = ((long)opt_q.workspace_allocator *
                                       (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU
                                      & 0xfffffffffffffff0) / (ulong)opt_q.workspace_allocator;
                            if (opt_q.vulkan_device_index == 4) {
                              m.cstep = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                            }
                            conv3x3s1_winograd23_transform_input_tile_int8
                                      (&local_3c8,&m,iVar97,iVar116,iVar71,iVar79,iVar96);
                            local_160.cstep = (long)local_228.h * (long)local_228.w;
                            local_160.data =
                                 (void *)((long)local_228.data +
                                         (uint)(iVar100 % iVar96) * local_228.elemsize *
                                         local_160.cstep +
                                         (long)(iVar100 / iVar96) * local_228.cstep *
                                         local_228.elemsize);
                            local_160.refcount = (int *)0x0;
                            local_160.elemsize = local_228.elemsize;
                            local_160.elempack = local_228.elempack;
                            local_160.allocator = local_228.allocator;
                            local_160.dims = 2;
                            local_160.w = local_228.w;
                            local_160.h = local_228.h;
                            local_160.d = 1;
                            local_160.c = 1;
                            transpose_pack_B_tile_int8
                                      (&m,&local_160,0x10,iVar116,iVar79,(int)local_160.cstep);
                            iVar100 = iVar100 + 1;
                          } while (iVar107 != iVar100);
                        }
                        piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                   opt_q.blob_allocator._0_4_);
                        if (piVar106 != (int *)0x0) {
                          LOCK();
                          *piVar106 = *piVar106 + -1;
                          UNLOCK();
                          if (*piVar106 == 0) {
                            if (opt_q._32_8_ == 0) goto joined_r0x0020c3c3;
                            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                          }
                        }
                        goto LAB_0020c3cd;
                      }
                      piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                 opt_q.blob_allocator._0_4_);
                      if (piVar106 != (int *)0x0) {
                        LOCK();
                        *piVar106 = *piVar106 + -1;
                        UNLOCK();
                        if (*piVar106 == 0) {
                          pvVar87 = (void *)opt_q._0_8_;
                          if (opt_q._32_8_ == 0) goto joined_r0x0020c3ae;
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
                    else {
                      local_278.lightmode = false;
                      local_278.use_shader_pack8 = false;
                      local_278.use_subgroup_ops = false;
                      local_278.use_reserved_0 = false;
                      local_278.num_threads = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator = (Allocator *)0x0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.use_bf16_storage = false;
                      opt_q.use_fp16_packed = false;
                      opt_q.use_fp16_storage = false;
                      opt_q.use_fp16_arithmetic = false;
                      opt_q.use_int8_packed = false;
                      opt_q.use_int8_storage = false;
                      opt_q.use_int8_arithmetic = false;
                      opt_q.use_packing_layout = false;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                      Mat::create((Mat *)&opt_q,iVar116,2,local_340->workspace_allocator);
                      if ((opt_q._0_8_ == 0) || ((long)(int)opt_q._56_4_ * local_278._0_8_ == 0)) {
                        piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                   opt_q.blob_allocator._0_4_);
                        if (piVar106 != (int *)0x0) {
                          LOCK();
                          *piVar106 = *piVar106 + -1;
                          UNLOCK();
                          if (*piVar106 == 0) {
                            pvVar87 = (void *)opt_q._0_8_;
                            if (opt_q._32_8_ == 0) goto joined_r0x0020c3ae;
                            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                          }
                        }
                      }
                      else {
                        if (0 < iVar107) {
                          iVar100 = 0;
                          do {
                            iVar71 = (iVar100 / iVar96) * iVar57;
                            iVar97 = (int)((long)iVar100 % (long)iVar96) * iVar59;
                            iVar116 = iVar118 - iVar71;
                            if (iVar57 < iVar116) {
                              iVar116 = iVar57;
                            }
                            iVar79 = iVar78 - iVar97;
                            if (iVar59 < iVar79) {
                              iVar79 = iVar59;
                            }
                            conv3x3s1_winograd23_transform_input_tile_int8
                                      (&local_3c8,(Mat *)&opt_q,iVar71,iVar116,iVar97,iVar79,iVar96)
                            ;
                            m.cstep = (long)local_228.h * (long)local_228.w;
                            m.data = (void *)((long)local_228.data +
                                             ((long)iVar100 % (long)iVar96 & 0xffffffffU) *
                                             local_228.elemsize * m.cstep +
                                             (long)(iVar100 / iVar96) * local_228.cstep *
                                             local_228.elemsize);
                            m.refcount._0_4_ = 0;
                            m.refcount._4_4_ = 0;
                            m.elemsize = local_228.elemsize;
                            m.elempack = local_228.elempack;
                            m.allocator = local_228.allocator;
                            m.dims = 2;
                            m.w = local_228.w;
                            m.h = local_228.h;
                            m.d = 1;
                            m.c = 1;
                            transpose_pack_B_tile_int8
                                      ((Mat *)&opt_q,&m,0x10,iVar116,iVar79,(int)m.cstep);
                            iVar100 = iVar100 + 1;
                          } while (iVar107 != iVar100);
                        }
                        piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                   opt_q.blob_allocator._0_4_);
                        if (piVar106 != (int *)0x0) {
                          LOCK();
                          *piVar106 = *piVar106 + -1;
                          UNLOCK();
                          if (*piVar106 == 0) {
                            if (opt_q._32_8_ == 0) {
joined_r0x0020c3c3:
                              if ((void *)opt_q._0_8_ != (void *)0x0) {
                                free((void *)opt_q._0_8_);
                              }
                            }
                            else {
                              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                            }
                          }
                        }
LAB_0020c3cd:
                        uVar83 = (ulong)(uint)TILE_N;
                        m.cstep = 0;
                        m.data = (void *)0x0;
                        m.refcount._0_4_ = 0;
                        m.refcount._4_4_ = 0;
                        m.elemsize = 0;
                        m.elempack = 0;
                        m.allocator = (Allocator *)0x0;
                        m.dims = 0;
                        m.w = 0;
                        m.h = 0;
                        m.d = 0;
                        m.c = 0;
                        Mat::create(&m,TILE_M * TILE_N * 0x10,1,uVar54,4,
                                    local_340->workspace_allocator);
                        iVar100 = -100;
                        if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                          if (0 < (int)local_348) {
                            iVar100 = 0;
                            do {
                              iVar59 = TILE_M;
                              uVar112 = (ulong)_TILE_M & 0xffffffff;
                              iVar57 = get_omp_thread_num();
                              iVar116 = iVar59 * iVar100;
                              uVar73 = (ulong)(uint)(iVar111 - iVar116);
                              if (iVar59 < iVar111 - iVar116) {
                                uVar73 = uVar112;
                              }
                              if (0 < iVar118) {
                                pMVar62 = (Mat *)((long)iVar57 * m.cstep * m.elemsize + (long)m.data
                                                 );
                                iVar57 = (int)uVar73;
                                iVar59 = 0;
                                do {
                                  iVar96 = TILE_K;
                                  uVar112 = (ulong)(uint)(iVar118 - iVar59);
                                  if ((int)uVar83 < iVar118 - iVar59) {
                                    uVar112 = uVar83;
                                  }
                                  iVar107 = (int)uVar112;
                                  if (0 < iVar78) {
                                    iVar79 = iVar116 / TILE_M;
                                    iVar71 = iVar78;
                                    iVar97 = 0;
                                    do {
                                      iVar58 = iVar71;
                                      if (iVar96 < iVar71) {
                                        iVar58 = iVar96;
                                      }
                                      opt_q._44_4_ = (this->weight_winograd23_data).w;
                                      opt_q.flush_denormals = (this->weight_winograd23_data).h;
                                      opt_q.workspace_allocator =
                                           (Allocator *)(this->weight_winograd23_data).elemsize;
                                      opt_q.openmp_blocktime =
                                           (this->weight_winograd23_data).elempack;
                                      opt_q._32_8_ = (this->weight_winograd23_data).allocator;
                                      local_278._0_8_ =
                                           (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                                      opt_q._0_8_ = (long)(this->weight_winograd23_data).data +
                                                    (long)opt_q.workspace_allocator *
                                                    local_278._0_8_ * (long)(iVar97 / iVar96) +
                                                    (this->weight_winograd23_data).cstep *
                                                    (long)iVar79 * (long)opt_q.workspace_allocator;
                                      opt_q.blob_allocator._0_4_ = 0;
                                      opt_q.blob_allocator._4_4_ = 0;
                                      opt_q.vulkan_device_index = 2;
                                      opt_q.use_local_pool_allocator = true;
                                      opt_q.use_shader_local_memory = false;
                                      opt_q.use_cooperative_matrix = false;
                                      opt_q.use_winograd23_convolution = false;
                                      opt_q.use_winograd43_convolution = true;
                                      opt_q.use_winograd63_convolution = false;
                                      opt_q.use_a53_a55_optimized_kernel = false;
                                      opt_q.use_fp16_uniform = false;
                                      local_160.cstep = (long)local_228.h * (long)local_228.w;
                                      local_160.data =
                                           (void *)((long)local_228.data +
                                                   local_160.cstep * local_228.elemsize *
                                                   (long)(iVar97 / iVar96) +
                                                   local_228.cstep * (long)(iVar59 / (int)uVar83) *
                                                   local_228.elemsize);
                                      local_160.refcount = (int *)0x0;
                                      local_160.elemsize = local_228.elemsize;
                                      local_160.elempack = local_228.elempack;
                                      local_160.allocator = local_228.allocator;
                                      local_160.dims = 2;
                                      local_160.w = local_228.w;
                                      iVar71 = -(iVar96 - iVar71);
                                      local_160.h = local_228.h;
                                      local_160.d = 1;
                                      local_160.c = 1;
                                      iVar108 = iVar97 + iVar96;
                                      gemm_transB_packed_tile_int8
                                                ((Mat *)&opt_q,&local_160,pMVar62,0x10,iVar57,
                                                 iVar107,iVar97,iVar58,iVar78 <= iVar108);
                                      iVar97 = iVar108;
                                    } while (iVar108 < iVar78);
                                  }
                                  iVar71 = (int)local_318.cstep * local_318.elempack;
                                  iVar96 = (local_318.w - (local_318.w + 1 >> 0x1f)) + 1 >> 1;
                                  uVar83 = 0;
                                  if (3 < iVar57) {
                                    local_368._0_8_ = uVar112;
                                    iVar97 = 0;
                                    local_438 = 0;
                                    do {
                                      if (0 < iVar107) {
                                        pauVar120 = (undefined1 (*) [16])
                                                    ((long)&pMVar62->data + (long)iVar97 * 4);
                                        uVar83 = 0;
                                        do {
                                          lVar63 = 0x40;
                                          pauVar74 = pauVar120;
                                          do {
                                            auVar127 = vpaddd_avx(*(undefined1 (*) [16])
                                                                   (*pauVar74 +
                                                                   (long)(iVar107 * 4) * 4),
                                                                  *pauVar74);
                                            auVar127 = vpaddd_avx(auVar127,*(undefined1 (*) [16])
                                                                            (*pauVar74 +
                                                                            (long)(iVar107 * 8) * 4)
                                                                 );
                                            auVar133 = vpsubd_avx(*(undefined1 (*) [16])
                                                                   (*pauVar74 +
                                                                   (long)(iVar107 * 4) * 4),
                                                                  *(undefined1 (*) [16])
                                                                   (*pauVar74 +
                                                                   (long)(iVar107 * 8) * 4));
                                            auVar133 = vpaddd_avx(auVar133,*(undefined1 (*) [16])
                                                                            (*pauVar74 +
                                                                            (long)(iVar107 * 0xc) *
                                                                            4));
                                            *(undefined1 (*) [16])
                                             ((long)&local_318.allocator + lVar63) = auVar127;
                                            *(undefined1 (*) [16])(&opt_q.lightmode + lVar63) =
                                                 auVar133;
                                            lVar63 = lVar63 + 0x10;
                                            pauVar74 = (undefined1 (*) [16])
                                                       (*pauVar74 + (long)(iVar107 * 0x10) * 4);
                                          } while (lVar63 != 0x80);
                                          iVar58 = iVar59 + (int)uVar83;
                                          iVar79 = iVar58 % iVar96;
                                          uVar119 = (iVar58 / iVar96) * 2;
                                          pauVar74 = (undefined1 (*) [16])
                                                     ((long)local_318.data +
                                                     (long)(iVar79 * 2 * local_318.elempack) * 4 +
                                                     (long)local_318.w * local_318.elemsize *
                                                     (long)(int)uVar119 +
                                                     local_318.cstep *
                                                     (long)((iVar116 + (int)local_438) /
                                                           local_318.elempack) * local_318.elemsize)
                                          ;
                                          iVar79 = iVar79 * 2 + 1;
                                          uVar54 = 0;
                                          pOVar77 = &opt_q;
                                          bVar121 = true;
                                          do {
                                            bVar115 = bVar121;
                                            if ((int)(uVar54 | uVar119) < local_318.h) {
                                              auVar3._0_8_ = pOVar77->workspace_allocator;
                                              auVar3._8_4_ = pOVar77->openmp_blocktime;
                                              auVar3[0xc] = pOVar77->use_winograd_convolution;
                                              auVar3[0xd] = pOVar77->use_sgemm_convolution;
                                              auVar3[0xe] = pOVar77->use_int8_inference;
                                              auVar3[0xf] = pOVar77->use_vulkan_compute;
                                              auVar4[0] = pOVar77->lightmode;
                                              auVar4[1] = pOVar77->use_shader_pack8;
                                              auVar4[2] = pOVar77->use_subgroup_ops;
                                              auVar4[3] = pOVar77->use_reserved_0;
                                              auVar4._4_4_ = pOVar77->num_threads;
                                              auVar4._8_8_ = pOVar77->blob_allocator;
                                              auVar127 = vpaddd_avx(auVar3,auVar4);
                                              auVar5[0] = pOVar77->use_bf16_storage;
                                              auVar5[1] = pOVar77->use_fp16_packed;
                                              auVar5[2] = pOVar77->use_fp16_storage;
                                              auVar5[3] = pOVar77->use_fp16_arithmetic;
                                              auVar5[4] = pOVar77->use_int8_packed;
                                              auVar5[5] = pOVar77->use_int8_storage;
                                              auVar5[6] = pOVar77->use_int8_arithmetic;
                                              auVar5[7] = pOVar77->use_packing_layout;
                                              auVar5._8_4_ = pOVar77->vulkan_device_index;
                                              auVar5[0xc] = pOVar77->use_reserved_1;
                                              auVar5[0xd] = pOVar77->use_image_storage;
                                              auVar5[0xe] = pOVar77->use_tensor_storage;
                                              auVar5[0xf] = pOVar77->use_reserved_2;
                                              auVar133 = vpsubd_avx(auVar3,auVar5);
                                              auVar6._0_4_ = pOVar77->flush_denormals;
                                              auVar6[4] = pOVar77->use_local_pool_allocator;
                                              auVar6[5] = pOVar77->use_shader_local_memory;
                                              auVar6[6] = pOVar77->use_cooperative_matrix;
                                              auVar6[7] = pOVar77->use_winograd23_convolution;
                                              auVar6[8] = pOVar77->use_winograd43_convolution;
                                              auVar6[9] = pOVar77->use_winograd63_convolution;
                                              auVar6[10] = pOVar77->use_a53_a55_optimized_kernel;
                                              auVar6[0xb] = pOVar77->use_fp16_uniform;
                                              auVar6[0xc] = pOVar77->use_int8_uniform;
                                              auVar6[0xd] = pOVar77->use_reserved_9;
                                              auVar6[0xe] = pOVar77->use_reserved_10;
                                              auVar6[0xf] = pOVar77->use_reserved_11;
                                              auVar133 = vpaddd_avx(auVar133,auVar6);
                                              auVar127 = vpaddd_avx(auVar127,auVar5);
                                              auVar134 = vpsrad_avx(auVar127,2);
                                              auVar127 = vpsrad_avx(auVar133,2);
                                              if (local_318.elempack == 1) {
                                                *(int *)*pauVar74 = auVar134._0_4_;
                                                *(int *)(*pauVar74 + (long)iVar71 * 4) =
                                                     auVar134._4_4_;
                                                *(int *)(*pauVar74 + (long)(iVar71 * 2) * 4) =
                                                     auVar134._8_4_;
                                                *(int *)(*pauVar74 + (long)(iVar71 * 3) * 4) =
                                                     auVar134._12_4_;
                                                if (iVar79 < local_318.w) {
                                                  *(int *)(*pauVar74 + 4) = auVar127._0_4_;
                                                  *(int *)(*pauVar74 + (long)iVar71 * 4 + 4) =
                                                       auVar127._4_4_;
                                                  *(int *)(*pauVar74 + (long)(iVar71 * 2) * 4 + 4) =
                                                       auVar127._8_4_;
                                                  *(int *)(*pauVar74 + (long)(iVar71 * 3) * 4 + 4) =
                                                       auVar127._12_4_;
                                                }
                                              }
                                              else if ((local_318.elempack == 4) &&
                                                      (*pauVar74 = auVar134, iVar79 < local_318.w))
                                              {
                                                pauVar74[1] = auVar127;
                                              }
                                              pauVar74 = (undefined1 (*) [16])
                                                         (*pauVar74 +
                                                         (long)(local_318.elempack * local_318.w) *
                                                         4);
                                            }
                                            uVar54 = 1;
                                            pOVar77 = &local_278;
                                            bVar121 = false;
                                          } while (bVar115);
                                          uVar83 = uVar83 + 1;
                                          pauVar120 = pauVar120 + 1;
                                        } while (uVar83 != uVar112);
                                      }
                                      uVar83 = local_438 + 4;
                                      uVar68 = local_438 + 7;
                                      iVar97 = iVar97 + iVar107 * 0x40;
                                      local_438 = uVar83;
                                    } while (uVar68 < uVar73);
                                  }
                                  uVar119 = (uint)uVar83;
                                  if ((int)(uVar119 | 1) < iVar57) {
                                    iVar97 = uVar119 * iVar107 * 0x10;
                                    local_368._0_8_ = (long)(iVar107 * 2);
                                    local_490 = uVar83 & 0xffffffff;
                                    do {
                                      if (0 < iVar107) {
                                        puVar109 = (ulong *)((long)&pMVar62->data + (long)iVar97 * 4
                                                            );
                                        uVar83 = 0;
                                        do {
                                          lVar63 = 4;
                                          pOVar77 = &opt_q;
                                          puVar75 = puVar109;
                                          do {
                                            auVar128._8_8_ = 0;
                                            auVar128._0_8_ = *puVar75;
                                            auVar135._8_8_ = 0;
                                            auVar135._0_8_ =
                                                 *(ulong *)((long)puVar75 + (long)(iVar107 * 2) * 4)
                                            ;
                                            auVar127 = vpaddd_avx(auVar135,auVar128);
                                            auVar140._8_8_ = 0;
                                            auVar140._0_8_ =
                                                 *(ulong *)((long)puVar75 + (long)(iVar107 * 4) * 4)
                                            ;
                                            auVar127 = vpaddd_avx(auVar127,auVar140);
                                            (&local_318.cstep)[lVar63] = auVar127._0_8_;
                                            auVar127 = vpsubd_avx(auVar135,auVar140);
                                            auVar136._8_8_ = 0;
                                            auVar136._0_8_ =
                                                 *(ulong *)((long)puVar75 + (long)(iVar107 * 6) * 4)
                                            ;
                                            auVar127 = vpaddd_avx(auVar127,auVar136);
                                            *(long *)(&opt_q.lightmode + lVar63 * 8) =
                                                 auVar127._0_8_;
                                            lVar63 = lVar63 + 1;
                                            puVar75 = (ulong *)((long)puVar75 +
                                                               (long)(iVar107 * 8) * 4);
                                          } while (lVar63 != 8);
                                          iVar58 = iVar59 + (int)uVar83;
                                          iVar79 = iVar58 % iVar96;
                                          uVar119 = (iVar58 / iVar96) * 2;
                                          piVar106 = (int *)((long)local_318.data +
                                                            (long)(iVar79 * 2) * 4 +
                                                            (long)local_318.w * local_318.elemsize *
                                                            (long)(int)uVar119 +
                                                            ((long)iVar116 + local_490) *
                                                            local_318.cstep * local_318.elemsize);
                                          uVar54 = 0;
                                          bVar121 = true;
                                          do {
                                            bVar115 = bVar121;
                                            if ((int)(uVar54 | uVar119) < local_318.h) {
                                              iVar58 = *(int *)&pOVar77->blob_allocator;
                                              iVar108 = *(int *)((long)&pOVar77->blob_allocator + 4)
                                              ;
                                              iVar53 = *(int *)&pOVar77->workspace_allocator;
                                              iVar52 = pOVar77->num_threads;
                                              iVar88 = *(int *)((long)&pOVar77->workspace_allocator
                                                               + 4);
                                              iVar117 = pOVar77->openmp_blocktime;
                                              iVar89 = *(int *)&pOVar77->use_winograd_convolution;
                                              *piVar106 = *(int *)pOVar77 + iVar58 + iVar53 >> 2;
                                              piVar106[iVar71] = iVar52 + iVar108 + iVar88 >> 2;
                                              if (iVar79 * 2 + 1 < local_318.w) {
                                                piVar106[1] = (iVar58 - iVar53) + iVar117 >> 2;
                                                piVar106[(long)iVar71 + 1] =
                                                     (iVar108 - iVar88) + iVar89 >> 2;
                                              }
                                              piVar106 = piVar106 + local_318.w;
                                            }
                                            uVar54 = 1;
                                            pOVar77 = (Option *)&opt_q.use_bf16_storage;
                                            bVar121 = false;
                                          } while (bVar115);
                                          uVar83 = uVar83 + 1;
                                          puVar109 = puVar109 + 1;
                                        } while (uVar83 != uVar112);
                                      }
                                      uVar83 = local_490 + 2;
                                      lVar63 = local_490 + 3;
                                      iVar97 = iVar97 + iVar107 * 0x20;
                                      local_490 = uVar83;
                                    } while (lVar63 < iVar57);
                                    uVar119 = (uint)uVar83;
                                  }
                                  if ((int)uVar119 < iVar57) {
                                    local_368._0_8_ = local_318.cstep * local_318.elemsize;
                                    local_4b0 = (ulong)uVar119;
                                    iVar71 = uVar119 * iVar107 * 0x10;
                                    do {
                                      if (0 < iVar107) {
                                        piVar106 = (int *)((long)&pMVar62->data + (long)iVar71 * 4);
                                        uVar83 = 0;
                                        do {
                                          lVar63 = 4;
                                          piVar76 = piVar106;
                                          do {
                                            iVar97 = piVar76[iVar107];
                                            iVar79 = piVar76[iVar107 * 2];
                                            *(int *)((long)&local_2c8 + lVar63 * 4) =
                                                 *piVar76 + iVar97 + iVar79;
                                            *(int *)(&opt_q.lightmode + lVar63 * 4) =
                                                 (iVar97 - iVar79) + piVar76[iVar107 * 3];
                                            lVar63 = lVar63 + 1;
                                            piVar76 = piVar76 + iVar107 * 4;
                                          } while (lVar63 != 8);
                                          iVar79 = iVar59 + (int)uVar83;
                                          iVar97 = iVar79 % iVar96;
                                          uVar119 = (iVar79 / iVar96) * 2;
                                          piVar76 = (int *)((long)local_318.data +
                                                           (long)(iVar97 * 2) * 4 +
                                                           (long)local_318.w * local_318.elemsize *
                                                           (long)(int)uVar119 +
                                                           (local_4b0 + (long)iVar116) *
                                                           local_318.cstep * local_318.elemsize);
                                          uVar54 = 0;
                                          pOVar77 = &opt_q;
                                          bVar121 = true;
                                          do {
                                            bVar115 = bVar121;
                                            if ((int)(uVar54 | uVar119) < local_318.h) {
                                              iVar79 = pOVar77->num_threads;
                                              iVar58 = *(int *)&pOVar77->blob_allocator;
                                              iVar108 = *(int *)((long)&pOVar77->blob_allocator + 4)
                                              ;
                                              *piVar76 = *(int *)pOVar77 + iVar79 + iVar58 >> 2;
                                              if (iVar97 * 2 + 1 < local_318.w) {
                                                piVar76[1] = (iVar79 - iVar58) + iVar108 >> 2;
                                              }
                                              piVar76 = piVar76 + local_318.w;
                                            }
                                            uVar54 = 1;
                                            pOVar77 = (Option *)&opt_q.workspace_allocator;
                                            bVar121 = false;
                                          } while (bVar115);
                                          uVar83 = uVar83 + 1;
                                          piVar106 = piVar106 + 1;
                                        } while (uVar83 != uVar112);
                                      }
                                      local_4b0 = local_4b0 + 1;
                                      iVar71 = iVar71 + iVar107 * 0x10;
                                    } while (local_4b0 != uVar73);
                                  }
                                  uVar83 = (ulong)(uint)TILE_N;
                                  iVar59 = iVar59 + TILE_N;
                                } while (iVar59 < iVar118);
                              }
                              iVar100 = iVar100 + 1;
                            } while (iVar100 != (int)local_348);
                          }
                          iVar100 = 0;
                        }
                        piVar106 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                        if (piVar106 != (int *)0x0) {
                          LOCK();
                          *piVar106 = *piVar106 + -1;
                          UNLOCK();
                          if (*piVar106 == 0) {
                            pvVar87 = m.data;
                            if (m.allocator == (Allocator *)0x0) {
joined_r0x0020c3ae:
                              if (pvVar87 != (void *)0x0) {
                                free(pvVar87);
                              }
                            }
                            else {
                              (*(m.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                    }
                  }
                  piVar106 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                  if (piVar106 != (int *)0x0) {
                    LOCK();
                    *piVar106 = *piVar106 + -1;
                    UNLOCK();
                    if (*piVar106 == 0) {
                      pvVar87 = local_228.data;
                      if (local_228.allocator == (Allocator *)0x0) goto joined_r0x0020bbec;
                      (*(local_228.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  iVar100 = conv3x3s1_winograd23_int8_xop
                                      (&local_3c8,&local_318,pMVar62,uVar54,local_340);
                }
              }
              else {
                iVar100 = conv3x3s1_winograd23_int8_avx2
                                    (&local_3c8,&local_318,pMVar62,uVar54,local_340);
              }
            }
            else {
              iVar100 = conv3x3s1_winograd23_int8_avxvnni
                                  (&local_3c8,&local_318,pMVar62,uVar54,local_340);
            }
          }
LAB_00207a7d:
          if (iVar100 != 0) goto LAB_0020c17f;
        }
        else {
          if (pOVar77->use_sgemm_convolution == true) {
            iVar71 = auVar133._4_4_ * auVar133._0_4_;
            iVar111 = local_318.elempack * local_318.c;
            iVar118 = local_318.h * local_318.w;
            iVar97 = local_3c8.c * iVar71 * local_3c8.elempack;
            local_378 = (void *)(ulong)uVar54;
            convolution_im2col_gemm_get_optimal_tile_mnk_int8
                      (iVar111,iVar118,iVar97,&TILE_N,&TILE_K,&TILE_K_1,uVar54);
            iVar78 = TILE_N;
            iVar57 = TILE_K;
            iVar116 = (iVar111 + TILE_N + -1) / TILE_N;
            iVar96 = (iVar118 + TILE_K + -1) / TILE_K;
            iVar107 = (iVar97 + TILE_K_1 + -1) / TILE_K_1;
            local_278.lightmode = false;
            local_278.use_shader_pack8 = false;
            local_278.use_subgroup_ops = false;
            local_278.use_reserved_0 = false;
            local_278.num_threads = 0;
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.vulkan_device_index = 0;
            opt_q.use_reserved_1 = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_2 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_fp16_uniform = false;
            Mat::create((Mat *)&opt_q,TILE_K_1 * TILE_K,iVar107,iVar96,1,
                        local_340->workspace_allocator);
            iVar100 = -100;
            if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_278._0_8_ != 0)) {
              iVar96 = iVar96 * iVar107;
              if (0 < iVar96) {
                auVar127 = vpcmpeqd_avx(auVar133,_DAT_005a5480);
                uVar69 = vmovmskps_avx(auVar127);
                local_2d0 = (ulong)(uint)~((auVar133._0_4_ + -1) * auVar133._8_4_);
                local_368 = vpshufd_avx(ZEXT416(uVar119),0);
                iVar100 = 0;
                do {
                  iVar57 = TILE_K * (iVar100 / iVar107);
                  iVar78 = TILE_K_1 * (int)((long)iVar100 % (long)iVar107);
                  uVar54 = iVar118 - iVar57;
                  if (TILE_K < iVar118 - iVar57) {
                    uVar54 = TILE_K;
                  }
                  uVar90 = iVar97 - iVar78;
                  if (TILE_K_1 < iVar97 - iVar78) {
                    uVar90 = TILE_K_1;
                  }
                  local_228.cstep = (size_t)(int)opt_q._44_4_;
                  local_228.data =
                       (void *)(((long)iVar100 % (long)iVar107 & 0xffffffffU) * local_228.cstep *
                                (long)opt_q.workspace_allocator +
                               (long)(iVar100 / iVar107) * local_278._0_8_ *
                               (long)opt_q.workspace_allocator + opt_q._0_8_);
                  local_228.refcount._0_4_ = 0;
                  local_228.refcount._4_4_ = 0;
                  local_228.elemsize = (size_t)opt_q.workspace_allocator;
                  local_228.elempack = opt_q.openmp_blocktime;
                  local_228.allocator = (Allocator *)opt_q._32_8_;
                  local_228.dims = 2;
                  local_228.w._0_1_ = opt_q.use_reserved_1;
                  local_228.w._1_1_ = opt_q.use_image_storage;
                  local_228.w._2_1_ = opt_q.use_tensor_storage;
                  local_228.w._3_1_ = opt_q.use_reserved_2;
                  local_228.h = 1;
                  local_228.d = 1;
                  local_228.c = 1;
                  iVar79 = cpu_support_x86_avx_vnni_int8();
                  if (iVar79 == 0) {
                    iVar79 = cpu_support_x86_avx_vnni();
                    if (iVar79 == 0) {
                      iVar79 = cpu_support_x86_avx2();
                      if (iVar79 == 0) {
                        iVar79 = (int)local_3c8.cstep;
                        if (((((auVar133._4_4_ == 1 && auVar133._0_4_ == 1) && iVar59 == 1) &&
                             uVar119 == 1) & (byte)uVar69 >> 2 & (byte)uVar69 >> 3) == 0) {
                          uVar84 = ((int)local_2d0 + local_3c8.w) / (int)uVar119;
                          uVar94 = uVar84 + 1;
                          if (uVar84 == 0) {
                            uVar84 = 1;
                            uVar55 = 0;
                            uVar64 = 0;
                          }
                          else {
                            uVar55 = 0x1f;
                            if (uVar84 != 0) {
                              for (; uVar84 >> uVar55 == 0; uVar55 = uVar55 - 1) {
                              }
                            }
                            iVar58 = 1 << (-(char)(uVar55 ^ 0x1f) & 0x1fU);
                            uVar64 = 1;
                            if ((uVar55 ^ 0x1f) == 0) {
                              iVar58 = 0;
                            }
                            auVar18._4_8_ = 0;
                            auVar18._0_4_ = uVar94;
                            auVar19._4_8_ = 0;
                            auVar19._0_4_ = iVar58 - uVar94;
                            uVar84 = SUB124((auVar19 << 0x20) / auVar18,0) + 1;
                          }
                          auVar134 = vpshufd_avx(ZEXT416(uVar84),0);
                          auVar127 = vpmovzxdq_avx(ZEXT416(uVar64));
                          pauVar120 = (undefined1 (*) [16])local_228.data;
                          if ((int)uVar54 < 8) {
                            uVar84 = 0;
                          }
                          else {
                            auVar131 = vpshufd_avx(ZEXT416(uVar94),0);
                            iVar58 = local_3c8.w * auVar133._12_4_;
                            uVar64 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar64 = uVar90;
                            }
                            iVar108 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar108 = iVar78;
                            }
                            auVar124 = vpshufd_avx(ZEXT416((uint)(local_3c8.w * iVar59)),0);
                            uVar56 = 0;
                            do {
                              auVar178 = vpshufd_avx(ZEXT416(iVar57 + uVar56),0);
                              auVar160 = vpaddd_avx(auVar178,_DAT_005a5590);
                              auVar171 = vpmuludq_avx(auVar160,auVar134);
                              auVar167 = vpsrlq_avx(auVar171,0x20);
                              auVar171 = vpsrlq_avx(auVar160,0x20);
                              auVar171 = vpmuludq_avx(auVar171,auVar134);
                              auVar167 = vpblendw_avx(auVar167,auVar171,0xcc);
                              auVar171 = vpsubd_avx(auVar160,auVar167);
                              auVar172 = vpsrld_avx(auVar171,auVar127);
                              auVar171 = vpaddd_avx(auVar178,_DAT_005a55a0);
                              auVar167 = vpaddd_avx(auVar172,auVar167);
                              auVar178 = vpsrld_avx(auVar167,ZEXT416(uVar55));
                              auVar167 = vpmuludq_avx(auVar171,auVar134);
                              auVar172 = vpsrlq_avx(auVar167,0x20);
                              auVar167 = vpsrlq_avx(auVar171,0x20);
                              auVar167 = vpmuludq_avx(auVar167,auVar134);
                              auVar167 = vpblendw_avx(auVar172,auVar167,0xcc);
                              auVar172 = vpsubd_avx(auVar171,auVar167);
                              auVar172 = vpsrld_avx(auVar172,auVar127);
                              auVar167 = vpaddd_avx(auVar172,auVar167);
                              auVar172 = vpsrld_avx(auVar167,ZEXT416(uVar55));
                              auVar167 = vpmulld_avx(auVar178,auVar131);
                              auVar160 = vpsubd_avx(auVar160,auVar167);
                              auVar160 = vpmulld_avx(auVar160,local_368);
                              auVar167 = vpmulld_avx(auVar178,auVar124);
                              auVar178 = vpmulld_avx(auVar172,auVar124);
                              auVar160 = vpaddd_avx(auVar160,auVar167);
                              if ((uVar119 == 1) && (auVar167._0_4_ == auVar178._12_4_)) {
                                iVar53 = auVar160._0_4_;
                                if (local_3c8.elempack == 1) {
                                  iVar52 = 0;
                                  if (1 < (int)uVar90) {
                                    iVar88 = 0;
                                    do {
                                      uVar83 = (long)(iVar88 + iVar78) % (long)iVar71;
                                      iVar52 = iVar88 + iVar78 + 1;
                                      uVar73 = (long)iVar52 % (long)iVar71;
                                      uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                               uVar83 & 0xffffffff;
                                      uVar73 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                               uVar73 & 0xffffffff;
                                      auVar160._8_8_ = 0;
                                      auVar160._0_8_ =
                                           *(ulong *)((long)local_3c8.data +
                                                     (long)((int)((long)uVar83 %
                                                                 (long)(int)auVar133._0_4_) *
                                                            auVar133._8_4_ +
                                                            ((iVar88 + iVar78) / iVar71) * iVar79 +
                                                            iVar53 + (int)((long)uVar83 /
                                                                          (long)(int)auVar133._0_4_)
                                                                     * iVar58));
                                      auVar171._8_8_ = 0;
                                      auVar171._0_8_ =
                                           *(ulong *)((long)local_3c8.data +
                                                     (long)((int)((long)uVar73 %
                                                                 (long)(int)auVar133._0_4_) *
                                                            auVar133._8_4_ +
                                                            (iVar52 / iVar71) * iVar79 + iVar53 +
                                                           (int)((long)uVar73 /
                                                                (long)(int)auVar133._0_4_) * iVar58)
                                                     );
                                      auVar160 = vpunpcklbw_avx(auVar160,auVar171);
                                      *pauVar120 = auVar160;
                                      pauVar120 = pauVar120 + 1;
                                      iVar52 = iVar88 + 2;
                                      iVar117 = iVar88 + 3;
                                      iVar88 = iVar52;
                                    } while (iVar117 < (int)uVar90);
                                  }
                                  iVar88 = uVar90 - iVar52;
                                  if (iVar88 != 0 && iVar52 <= (int)uVar90) {
                                    iVar52 = iVar52 + iVar78;
                                    do {
                                      uVar83 = (ulong)(uint)((int)((long)iVar52 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar52 % (long)iVar71 & 0xffffffffU;
                                      *(undefined8 *)*pauVar120 =
                                           *(undefined8 *)
                                            ((long)local_3c8.data +
                                            (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                                   auVar133._8_4_ +
                                                   (iVar52 / iVar71) * iVar79 + iVar53 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58));
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                      iVar52 = iVar52 + 1;
                                      iVar88 = iVar88 + -1;
                                    } while (iVar88 != 0);
                                  }
                                }
                                iVar52 = (int)uVar64 >> 3;
                                iVar88 = iVar108 >> 3;
                                if (7 < (int)uVar90 && local_3c8.elempack == 8) {
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar88 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar88 % (long)iVar71 & 0xffffffffU;
                                    lVar63 = (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_)
                                                    * auVar133._8_4_ +
                                                    (iVar88 / iVar71) * iVar79 + iVar53 +
                                                   (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                   iVar58);
                                    auVar160 = *(undefined1 (*) [16])
                                                ((long)local_3c8.data + lVar63 * 8);
                                    auVar171 = *(undefined1 (*) [16])
                                                ((long)local_3c8.data + lVar63 * 8 + 0x10);
                                    auVar167 = *(undefined1 (*) [16])
                                                ((long)local_3c8.data + lVar63 * 8 + 0x20);
                                    auVar178 = *(undefined1 (*) [16])
                                                ((long)local_3c8.data + lVar63 * 8 + 0x30);
                                    auVar172 = vpunpcklwd_avx(auVar160,auVar171);
                                    auVar160 = vpunpckhwd_avx(auVar160,auVar171);
                                    auVar173 = vpunpcklwd_avx(auVar167,auVar178);
                                    auVar171 = vpunpckhwd_avx(auVar167,auVar178);
                                    auVar167 = vpunpcklwd_avx(auVar172,auVar160);
                                    auVar178 = vpunpcklwd_avx(auVar173,auVar171);
                                    auVar160 = vpunpckhwd_avx(auVar172,auVar160);
                                    auVar171 = vpunpckhwd_avx(auVar173,auVar171);
                                    auVar172 = vpunpcklqdq_avx(auVar167,auVar178);
                                    auVar167 = vpunpckhqdq_avx(auVar167,auVar178);
                                    auVar178 = vpunpcklqdq_avx(auVar160,auVar171);
                                    auVar160 = vpunpckhqdq_avx(auVar160,auVar171);
                                    *pauVar120 = auVar172;
                                    pauVar120[1] = auVar167;
                                    pauVar120[2] = auVar178;
                                    pauVar120[3] = auVar160;
                                    pauVar120 = pauVar120 + 4;
                                    iVar52 = iVar52 + -1;
                                    iVar88 = iVar88 + 1;
                                  } while (iVar52 != 0);
                                }
                              }
                              else {
                                auVar167 = vpmulld_avx(auVar172,auVar131);
                                auVar171 = vpsubd_avx(auVar171,auVar167);
                                auVar171 = vpmulld_avx(auVar171,local_368);
                                auVar171 = vpaddd_avx(auVar178,auVar171);
                                if (local_3c8.elempack == 1) {
                                  iVar53 = 0;
                                  if (1 < (int)uVar90) {
                                    iVar52 = 0;
                                    do {
                                      uVar83 = (long)(iVar78 + iVar52) % (long)iVar71;
                                      iVar53 = iVar78 + iVar52 + 1;
                                      uVar73 = (long)iVar53 % (long)iVar71;
                                      uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                               uVar83 & 0xffffffff;
                                      uVar73 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                               uVar73 & 0xffffffff;
                                      auVar178 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar83 %
                                                                                 (long)(int)auVar133
                                                  ._0_4_) * auVar133._8_4_ +
                                                  ((iVar78 + iVar52) / iVar71) * iVar79 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                      auVar167 = vpaddd_avx(auVar178,auVar160);
                                      auVar178 = vpaddd_avx(auVar178,auVar171);
                                      auVar173 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar73 %
                                                                                 (long)(int)auVar133
                                                  ._0_4_) * auVar133._8_4_ +
                                                  (iVar53 / iVar71) * iVar79 +
                                                  (int)((long)uVar73 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                      auVar172 = vpaddd_avx(auVar173,auVar160);
                                      auVar173 = vpaddd_avx(auVar173,auVar171);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._0_4_);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar172._0_4_);
                                      (*pauVar120)[2] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._4_4_);
                                      (*pauVar120)[3] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar172._4_4_);
                                      (*pauVar120)[4] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._8_4_);
                                      (*pauVar120)[5] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar172._8_4_);
                                      (*pauVar120)[6] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._12_4_);
                                      (*pauVar120)[7] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar172._12_4_);
                                      (*pauVar120)[8] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._0_4_);
                                      (*pauVar120)[9] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar173._0_4_);
                                      (*pauVar120)[10] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._4_4_);
                                      (*pauVar120)[0xb] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar173._4_4_);
                                      (*pauVar120)[0xc] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._8_4_);
                                      (*pauVar120)[0xd] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar173._8_4_);
                                      (*pauVar120)[0xe] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._12_4_);
                                      (*pauVar120)[0xf] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar173._12_4_);
                                      pauVar120 = pauVar120 + 1;
                                      iVar53 = iVar52 + 2;
                                      iVar88 = iVar52 + 3;
                                      iVar52 = iVar53;
                                    } while (iVar88 < (int)uVar90);
                                  }
                                  iVar52 = uVar90 - iVar53;
                                  if (iVar52 != 0 && iVar53 <= (int)uVar90) {
                                    iVar53 = iVar53 + iVar78;
                                    do {
                                      uVar83 = (ulong)(uint)((int)((long)iVar53 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar53 % (long)iVar71 & 0xffffffffU;
                                      auVar178 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar83 %
                                                                                 (long)(int)auVar133
                                                  ._0_4_) * auVar133._8_4_ +
                                                  (iVar53 / iVar71) * iVar79 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                      auVar167 = vpaddd_avx(auVar178,auVar160);
                                      auVar178 = vpaddd_avx(auVar178,auVar171);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._0_4_);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._4_4_);
                                      (*pauVar120)[2] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._8_4_);
                                      (*pauVar120)[3] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._12_4_);
                                      (*pauVar120)[4] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._0_4_);
                                      (*pauVar120)[5] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._4_4_);
                                      (*pauVar120)[6] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._8_4_);
                                      (*pauVar120)[7] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar178._12_4_);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                      iVar53 = iVar53 + 1;
                                      iVar52 = iVar52 + -1;
                                    } while (iVar52 != 0);
                                  }
                                }
                                iVar53 = (int)uVar64 >> 3;
                                iVar52 = iVar108 >> 3;
                                if (7 < (int)uVar90 && local_3c8.elempack == 8) {
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar52 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar52 % (long)iVar71 & 0xffffffffU;
                                    auVar178 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar83 %
                                                                               (long)(int)auVar133.
                                                  _0_4_) * auVar133._8_4_ +
                                                  (iVar52 / iVar71) * iVar79 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                    auVar167 = vpaddd_avx(auVar178,auVar160);
                                    auVar178 = vpaddd_avx(auVar178,auVar171);
                                    auVar172 = vpslld_avx(auVar167,3);
                                    auVar173 = vpslld_avx(auVar178,3);
                                    auVar167._8_8_ = 0;
                                    auVar167._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar172._0_4_);
                                    auVar195._8_8_ = 0;
                                    auVar195._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar172._4_4_);
                                    auVar167 = vpunpcklwd_avx(auVar167,auVar195);
                                    auVar178._8_8_ = 0;
                                    auVar178._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar172._8_4_);
                                    auVar198._8_8_ = 0;
                                    auVar198._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar172._12_4_);
                                    auVar178 = vpunpcklwd_avx(auVar178,auVar198);
                                    auVar172._8_8_ = 0;
                                    auVar172._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar173._0_4_);
                                    auVar199._8_8_ = 0;
                                    auVar199._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar173._4_4_);
                                    auVar172 = vpunpcklwd_avx(auVar172,auVar199);
                                    auVar179._8_8_ = 0;
                                    auVar179._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar173._8_4_);
                                    auVar196._8_8_ = 0;
                                    auVar196._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar173._12_4_);
                                    auVar173 = vpunpcklwd_avx(auVar179,auVar196);
                                    auVar179 = vpunpckldq_avx(auVar167,auVar178);
                                    auVar167 = vpunpckhdq_avx(auVar167,auVar178);
                                    auVar195 = vpunpckldq_avx(auVar172,auVar173);
                                    auVar178 = vpunpckhdq_avx(auVar172,auVar173);
                                    auVar173 = vpunpcklqdq_avx(auVar179,auVar195);
                                    auVar172 = vpunpckhqdq_avx(auVar179,auVar195);
                                    auVar179 = vpunpcklqdq_avx(auVar167,auVar178);
                                    auVar167 = vpunpckhqdq_avx(auVar167,auVar178);
                                    *pauVar120 = auVar173;
                                    pauVar120[1] = auVar172;
                                    pauVar120[2] = auVar179;
                                    pauVar120[3] = auVar167;
                                    pauVar120 = pauVar120 + 4;
                                    iVar53 = iVar53 + -1;
                                    iVar52 = iVar52 + 1;
                                  } while (iVar53 != 0);
                                }
                              }
                              uVar84 = uVar56 + 8;
                              iVar53 = uVar56 + 0xf;
                              uVar56 = uVar84;
                            } while (iVar53 < (int)uVar54);
                          }
                          if ((int)(uVar84 | 3) < (int)uVar54) {
                            auVar131 = vpshufd_avx(ZEXT416(uVar94),0);
                            auVar124 = vpshufd_avx(ZEXT416((uint)(local_3c8.w * iVar59)),0);
                            iVar58 = local_3c8.w * auVar133._12_4_;
                            uVar64 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar64 = uVar90;
                            }
                            iVar108 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar108 = iVar78;
                            }
                            uVar56 = uVar84;
                            do {
                              auVar160 = vpshufd_avx(ZEXT416(iVar57 + uVar56),0);
                              auVar160 = vpaddd_avx(auVar160,_DAT_005a5590);
                              auVar171 = vpmuludq_avx(auVar160,auVar134);
                              auVar167 = vpsrlq_avx(auVar171,0x20);
                              auVar171 = vpsrlq_avx(auVar160,0x20);
                              auVar171 = vpmuludq_avx(auVar171,auVar134);
                              auVar171 = vpblendw_avx(auVar167,auVar171,0xcc);
                              auVar167 = vpsubd_avx(auVar160,auVar171);
                              auVar167 = vpsrld_avx(auVar167,auVar127);
                              auVar171 = vpaddd_avx(auVar167,auVar171);
                              auVar167 = vpsrld_avx(auVar171,ZEXT416(uVar55));
                              auVar171 = vpmulld_avx(auVar167,auVar131);
                              auVar160 = vpsubd_avx(auVar160,auVar171);
                              auVar160 = vpmulld_avx(auVar160,local_368);
                              auVar171 = vpmulld_avx(auVar167,auVar124);
                              auVar160 = vpaddd_avx(auVar160,auVar171);
                              if ((uVar119 == 1) && (auVar171._0_4_ == auVar171._12_4_)) {
                                iVar53 = auVar160._0_4_;
                                if (local_3c8.elempack == 1) {
                                  iVar52 = 0;
                                  if (1 < (int)uVar90) {
                                    iVar88 = 0;
                                    do {
                                      uVar83 = (long)(iVar88 + iVar78) % (long)iVar71;
                                      iVar52 = iVar88 + iVar78 + 1;
                                      uVar73 = (long)iVar52 % (long)iVar71;
                                      uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                               uVar83 & 0xffffffff;
                                      uVar73 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                               uVar73 & 0xffffffff;
                                      auVar151._8_8_ = 0;
                                      auVar151._0_8_ =
                                           *(ulong *)((long)local_3c8.data +
                                                     (long)((int)((long)uVar83 %
                                                                 (long)(int)auVar133._0_4_) *
                                                            auVar133._8_4_ +
                                                            ((iVar88 + iVar78) / iVar71) * iVar79 +
                                                            iVar53 + (int)((long)uVar83 /
                                                                          (long)(int)auVar133._0_4_)
                                                                     * iVar58));
                                      auVar161._8_8_ = 0;
                                      auVar161._0_8_ =
                                           *(ulong *)((long)local_3c8.data +
                                                     (long)((int)((long)uVar73 %
                                                                 (long)(int)auVar133._0_4_) *
                                                            auVar133._8_4_ +
                                                            (iVar52 / iVar71) * iVar79 + iVar53 +
                                                           (int)((long)uVar73 /
                                                                (long)(int)auVar133._0_4_) * iVar58)
                                                     );
                                      auVar160 = vpunpcklbw_avx(auVar151,auVar161);
                                      *(long *)*pauVar120 = auVar160._0_8_;
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                      iVar52 = iVar88 + 2;
                                      iVar117 = iVar88 + 3;
                                      iVar88 = iVar52;
                                    } while (iVar117 < (int)uVar90);
                                  }
                                  iVar88 = uVar90 - iVar52;
                                  if (iVar88 != 0 && iVar52 <= (int)uVar90) {
                                    iVar52 = iVar52 + iVar78;
                                    do {
                                      uVar83 = (ulong)(uint)((int)((long)iVar52 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar52 % (long)iVar71 & 0xffffffffU;
                                      lVar63 = (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_
                                                           ) * auVar133._8_4_ +
                                                      (iVar52 / iVar71) * iVar79 + iVar53 +
                                                     (int)((long)uVar83 / (long)(int)auVar133._0_4_)
                                                     * iVar58);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63 + 1);
                                      (*pauVar120)[2] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63 + 2);
                                      (*pauVar120)[3] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63 + 3);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                      iVar52 = iVar52 + 1;
                                      iVar88 = iVar88 + -1;
                                    } while (iVar88 != 0);
                                  }
                                }
                                iVar52 = (int)uVar64 >> 3;
                                iVar88 = iVar108 >> 3;
                                if (7 < (int)uVar90 && local_3c8.elempack == 8) {
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar88 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar88 % (long)iVar71 & 0xffffffffU;
                                    lVar63 = (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_)
                                                    * auVar133._8_4_ +
                                                    (iVar88 / iVar71) * iVar79 + iVar53 +
                                                   (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                   iVar58);
                                    auVar160 = *(undefined1 (*) [16])
                                                ((long)local_3c8.data + lVar63 * 8);
                                    auVar171 = *(undefined1 (*) [16])
                                                ((long)local_3c8.data + lVar63 * 8 + 0x10);
                                    auVar167 = vpunpcklwd_avx(auVar160,auVar171);
                                    auVar160 = vpunpckhwd_avx(auVar160,auVar171);
                                    auVar171 = vpunpcklwd_avx(auVar167,auVar160);
                                    auVar160 = vpunpckhwd_avx(auVar167,auVar160);
                                    *pauVar120 = auVar171;
                                    pauVar120[1] = auVar160;
                                    pauVar120 = pauVar120 + 2;
                                    iVar52 = iVar52 + -1;
                                    iVar88 = iVar88 + 1;
                                  } while (iVar52 != 0);
                                }
                              }
                              else {
                                if (local_3c8.elempack == 1) {
                                  iVar53 = 0;
                                  if (1 < (int)uVar90) {
                                    iVar52 = 0;
                                    do {
                                      uVar83 = (long)(iVar78 + iVar52) % (long)iVar71;
                                      iVar53 = iVar78 + iVar52 + 1;
                                      uVar73 = (long)iVar53 % (long)iVar71;
                                      uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                               uVar83 & 0xffffffff;
                                      uVar73 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                               uVar73 & 0xffffffff;
                                      auVar171 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar83 %
                                                                                 (long)(int)auVar133
                                                  ._0_4_) * auVar133._8_4_ +
                                                  ((iVar78 + iVar52) / iVar71) * iVar79 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                      auVar171 = vpaddd_avx(auVar171,auVar160);
                                      auVar167 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar73 %
                                                                                 (long)(int)auVar133
                                                  ._0_4_) * auVar133._8_4_ +
                                                  (iVar53 / iVar71) * iVar79 +
                                                  (int)((long)uVar73 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                      auVar167 = vpaddd_avx(auVar167,auVar160);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._0_4_);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._0_4_);
                                      (*pauVar120)[2] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._4_4_);
                                      (*pauVar120)[3] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._4_4_);
                                      (*pauVar120)[4] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._8_4_);
                                      (*pauVar120)[5] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._8_4_);
                                      (*pauVar120)[6] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._12_4_);
                                      (*pauVar120)[7] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar167._12_4_);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                      iVar53 = iVar52 + 2;
                                      iVar88 = iVar52 + 3;
                                      iVar52 = iVar53;
                                    } while (iVar88 < (int)uVar90);
                                  }
                                  iVar52 = uVar90 - iVar53;
                                  if (iVar52 != 0 && iVar53 <= (int)uVar90) {
                                    iVar53 = iVar53 + iVar78;
                                    do {
                                      uVar83 = (ulong)(uint)((int)((long)iVar53 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar53 % (long)iVar71 & 0xffffffffU;
                                      auVar171 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar83 %
                                                                                 (long)(int)auVar133
                                                  ._0_4_) * auVar133._8_4_ +
                                                  (iVar53 / iVar71) * iVar79 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                      auVar171 = vpaddd_avx(auVar171,auVar160);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._0_4_);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._4_4_);
                                      (*pauVar120)[2] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._8_4_);
                                      (*pauVar120)[3] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)auVar171._12_4_);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                      iVar53 = iVar53 + 1;
                                      iVar52 = iVar52 + -1;
                                    } while (iVar52 != 0);
                                  }
                                }
                                iVar53 = (int)uVar64 >> 3;
                                iVar52 = iVar108 >> 3;
                                if (7 < (int)uVar90 && local_3c8.elempack == 8) {
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar52 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar52 % (long)iVar71 & 0xffffffffU;
                                    auVar171 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar83 %
                                                                               (long)(int)auVar133.
                                                  _0_4_) * auVar133._8_4_ +
                                                  (iVar52 / iVar71) * iVar79 +
                                                  (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                  iVar58)),0);
                                    auVar171 = vpaddd_avx(auVar171,auVar160);
                                    auVar167 = vpslld_avx(auVar171,3);
                                    auVar173._8_8_ = 0;
                                    auVar173._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar167._4_4_);
                                    auVar168._8_8_ = 0;
                                    auVar168._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar167._0_4_);
                                    auVar171 = vpunpcklwd_avx(auVar168,auVar173);
                                    auVar174._8_8_ = 0;
                                    auVar174._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar167._8_4_);
                                    auVar180._8_8_ = 0;
                                    auVar180._0_8_ =
                                         *(ulong *)((long)local_3c8.data + (long)auVar167._12_4_);
                                    auVar167 = vpunpcklwd_avx(auVar174,auVar180);
                                    auVar178 = vpunpckldq_avx(auVar171,auVar167);
                                    auVar171 = vpunpckhdq_avx(auVar171,auVar167);
                                    *pauVar120 = auVar178;
                                    pauVar120[1] = auVar171;
                                    pauVar120 = pauVar120 + 2;
                                    iVar53 = iVar53 + -1;
                                    iVar52 = iVar52 + 1;
                                  } while (iVar53 != 0);
                                }
                              }
                              uVar84 = uVar56 + 4;
                              iVar53 = uVar56 + 7;
                              uVar56 = uVar84;
                            } while (iVar53 < (int)uVar54);
                          }
                          if ((int)(uVar84 | 1) < (int)uVar54) {
                            iVar58 = local_3c8.w * auVar133._12_4_;
                            uVar55 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar55 = uVar90;
                            }
                            iVar53 = (int)uVar55 >> 3;
                            iVar108 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar108 = iVar78;
                            }
                            iVar108 = iVar108 >> 3;
                            local_348 = CONCAT44(local_348._4_4_,iVar108);
                            uVar55 = uVar84;
                            do {
                              iVar52 = uVar55 + iVar57 + 1;
                              iVar89 = ((int)(uVar55 + iVar57) / (int)uVar94) * local_3c8.w * iVar59
                              ;
                              iVar88 = (iVar52 / (int)uVar94) * local_3c8.w * iVar59;
                              iVar117 = ((int)(uVar55 + iVar57) % (int)uVar94) * uVar119 + iVar89;
                              if ((uVar119 == 1) && (iVar89 == iVar88)) {
                                if (local_3c8.elempack == 1) {
                                  iVar52 = 0;
                                  if (1 < (int)uVar90) {
                                    iVar88 = 0;
                                    do {
                                      uVar83 = (long)(iVar78 + iVar88) % (long)iVar71;
                                      iVar52 = iVar78 + iVar88 + 1;
                                      uVar73 = (long)iVar52 % (long)iVar71;
                                      uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                               uVar83 & 0xffffffff;
                                      uVar73 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                               uVar73 & 0xffffffff;
                                      lVar65 = (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_
                                                           ) * auVar133._8_4_ +
                                                      ((iVar78 + iVar88) / iVar71) * iVar79 +
                                                      iVar117 +
                                                     (int)((long)uVar83 / (long)(int)auVar133._0_4_)
                                                     * iVar58);
                                      lVar63 = (long)((int)((long)uVar73 % (long)(int)auVar133._0_4_
                                                           ) * auVar133._8_4_ +
                                                      (iVar52 / iVar71) * iVar79 + iVar117 +
                                                     (int)((long)uVar73 / (long)(int)auVar133._0_4_)
                                                     * iVar58);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)((long)local_3c8.data + lVar65);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63);
                                      (*pauVar120)[2] =
                                           *(undefined1 *)((long)local_3c8.data + lVar65 + 1);
                                      (*pauVar120)[3] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63 + 1);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                      iVar52 = iVar88 + 2;
                                      iVar89 = iVar88 + 3;
                                      iVar88 = iVar52;
                                    } while (iVar89 < (int)uVar90);
                                  }
                                  iVar88 = uVar90 - iVar52;
                                  if (iVar88 != 0 && iVar52 <= (int)uVar90) {
                                    iVar52 = iVar52 + iVar78;
                                    do {
                                      uVar83 = (ulong)(uint)((int)((long)iVar52 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar52 % (long)iVar71 & 0xffffffffU;
                                      lVar63 = (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_
                                                           ) * auVar133._8_4_ +
                                                      (iVar52 / iVar71) * iVar79 + iVar117 +
                                                     (int)((long)uVar83 / (long)(int)auVar133._0_4_)
                                                     * iVar58);
                                      (*pauVar120)[0] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63);
                                      (*pauVar120)[1] =
                                           *(undefined1 *)((long)local_3c8.data + lVar63 + 1);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 2);
                                      iVar52 = iVar52 + 1;
                                      iVar88 = iVar88 + -1;
                                    } while (iVar88 != 0);
                                  }
                                }
                                iVar52 = iVar53;
                                iVar88 = iVar108;
                                if (7 < (int)uVar90 && local_3c8.elempack == 8) {
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar88 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar88 % (long)iVar71 & 0xffffffffU;
                                    auVar127 = vpshufb_avx(*(undefined1 (*) [16])
                                                            ((long)local_3c8.data +
                                                            (long)((int)((long)uVar83 %
                                                                        (long)(int)auVar133._0_4_) *
                                                                   auVar133._8_4_ +
                                                                   (iVar88 / iVar71) * iVar79 +
                                                                   iVar117 +
                                                                  (int)((long)uVar83 /
                                                                       (long)(int)auVar133._0_4_) *
                                                                  iVar58) * 8),_DAT_005a5ac0);
                                    *pauVar120 = auVar127;
                                    pauVar120 = pauVar120 + 1;
                                    iVar52 = iVar52 + -1;
                                    iVar88 = iVar88 + 1;
                                  } while (iVar52 != 0);
                                }
                              }
                              else {
                                iVar88 = (iVar52 % (int)uVar94) * uVar119 + iVar88;
                                uVar84 = 0;
                                if (local_3c8.elempack == 1) {
                                  uVar84 = 0;
                                  if (1 < (int)uVar90) {
                                    uVar64 = 0;
                                    do {
                                      uVar83 = (long)(int)(iVar78 + uVar64) % (long)iVar71;
                                      iVar52 = iVar78 + uVar64 + 1;
                                      uVar73 = (long)iVar52 % (long)iVar71;
                                      uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                               uVar83 & 0xffffffff;
                                      iVar89 = (int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                               auVar133._8_4_ +
                                               ((int)(iVar78 + uVar64) / iVar71) * iVar79 +
                                               (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                               iVar58;
                                      uVar83 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                               uVar73 & 0xffffffff;
                                      iVar52 = (int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                               auVar133._8_4_ + (iVar52 / iVar71) * iVar79 +
                                               (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                               iVar58;
                                      (*pauVar120)[0] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)(iVar89 + iVar117));
                                      (*pauVar120)[1] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)(iVar52 + iVar117));
                                      (*pauVar120)[2] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)(iVar89 + iVar88));
                                      (*pauVar120)[3] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)(iVar52 + iVar88));
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                      uVar84 = uVar64 + 2;
                                      iVar52 = uVar64 + 3;
                                      uVar64 = uVar84;
                                    } while (iVar52 < (int)uVar90);
                                  }
                                  iVar52 = uVar90 - uVar84;
                                  if (iVar52 != 0 && (int)uVar84 <= (int)uVar90) {
                                    iVar89 = uVar84 + iVar78;
                                    do {
                                      uVar83 = (ulong)(uint)((int)((long)iVar89 % (long)iVar71) >>
                                                            0x1f) << 0x20 |
                                               (long)iVar89 % (long)iVar71 & 0xffffffffU;
                                      iVar70 = (int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                               auVar133._8_4_ + (iVar89 / iVar71) * iVar79 +
                                               (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                               iVar58;
                                      (*pauVar120)[0] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)(iVar70 + iVar117));
                                      (*pauVar120)[1] =
                                           *(undefined1 *)
                                            ((long)local_3c8.data + (long)(iVar70 + iVar88));
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 2);
                                      iVar89 = iVar89 + 1;
                                      iVar52 = iVar52 + -1;
                                      uVar84 = uVar90;
                                    } while (iVar52 != 0);
                                  }
                                }
                                if ((local_3c8.elempack == 8) &&
                                   (iVar52 = iVar53 - uVar84, iVar52 != 0 && (int)uVar84 <= iVar53))
                                {
                                  iVar89 = uVar84 + iVar108;
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar89 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar89 % (long)iVar71 & 0xffffffffU;
                                    iVar70 = (int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                             auVar133._8_4_ + (iVar89 / iVar71) * iVar79 +
                                             (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                             iVar58;
                                    auVar134._8_8_ = 0;
                                    auVar134._0_8_ =
                                         *(ulong *)((long)local_3c8.data +
                                                   (long)(iVar70 + iVar117) * 8);
                                    auVar131._8_8_ = 0;
                                    auVar131._0_8_ =
                                         *(ulong *)((long)local_3c8.data +
                                                   (long)(iVar70 + iVar88) * 8);
                                    auVar127 = vpunpcklwd_avx(auVar134,auVar131);
                                    *pauVar120 = auVar127;
                                    pauVar120 = pauVar120 + 1;
                                    iVar89 = iVar89 + 1;
                                    iVar52 = iVar52 + -1;
                                  } while (iVar52 != 0);
                                }
                              }
                              uVar84 = uVar55 + 2;
                              iVar52 = uVar55 + 3;
                              uVar55 = uVar84;
                            } while (iVar52 < (int)uVar54);
                          }
                          if ((int)uVar84 < (int)uVar54) {
                            iVar58 = local_3c8.w * auVar133._12_4_;
                            uVar55 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar55 = uVar90;
                            }
                            iVar108 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar108 = iVar78;
                            }
                            do {
                              iVar53 = ((int)(iVar57 + uVar84) / (int)uVar94) * local_3c8.w * iVar59
                                       + ((int)(iVar57 + uVar84) % (int)uVar94) * uVar119;
                              if (local_3c8.elempack == 1) {
                                lVar63 = 0;
                                if (1 < (int)uVar90) {
                                  lVar63 = 0;
                                  do {
                                    iVar52 = (int)lVar63;
                                    uVar83 = (long)(iVar78 + iVar52) % (long)iVar71;
                                    iVar88 = iVar78 + iVar52 + 1;
                                    uVar73 = (long)iVar88 % (long)iVar71;
                                    uVar83 = (ulong)(uint)((int)uVar83 >> 0x1f) << 0x20 |
                                             uVar83 & 0xffffffff;
                                    uVar73 = (ulong)(uint)((int)uVar73 >> 0x1f) << 0x20 |
                                             uVar73 & 0xffffffff;
                                    (*pauVar120)[lVar63] =
                                         *(undefined1 *)
                                          ((long)local_3c8.data +
                                          (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                                 auVar133._8_4_ +
                                                 ((iVar78 + iVar52) / iVar71) * iVar79 + iVar53 +
                                                (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                iVar58));
                                    (*pauVar120)[lVar63 + 1] =
                                         *(undefined1 *)
                                          ((long)local_3c8.data +
                                          (long)((int)((long)uVar73 % (long)(int)auVar133._0_4_) *
                                                 auVar133._8_4_ +
                                                 (iVar88 / iVar71) * iVar79 + iVar53 +
                                                (int)((long)uVar73 / (long)(int)auVar133._0_4_) *
                                                iVar58));
                                    lVar63 = lVar63 + 2;
                                  } while (iVar52 + 3 < (int)uVar90);
                                  pauVar120 = (undefined1 (*) [16])(*pauVar120 + lVar63);
                                }
                                iVar52 = (int)lVar63;
                                iVar88 = uVar90 - iVar52;
                                if (iVar88 != 0 && iVar52 <= (int)uVar90) {
                                  iVar52 = iVar52 + iVar78;
                                  do {
                                    uVar83 = (ulong)(uint)((int)((long)iVar52 % (long)iVar71) >>
                                                          0x1f) << 0x20 |
                                             (long)iVar52 % (long)iVar71 & 0xffffffffU;
                                    (*pauVar120)[0] =
                                         *(undefined1 *)
                                          ((long)local_3c8.data +
                                          (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                                 auVar133._8_4_ +
                                                 (iVar52 / iVar71) * iVar79 + iVar53 +
                                                (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                iVar58));
                                    pauVar120 = (undefined1 (*) [16])(*pauVar120 + 1);
                                    iVar52 = iVar52 + 1;
                                    iVar88 = iVar88 + -1;
                                  } while (iVar88 != 0);
                                }
                              }
                              iVar52 = (int)uVar55 >> 3;
                              iVar88 = iVar108 >> 3;
                              if (7 < (int)uVar90 && local_3c8.elempack == 8) {
                                do {
                                  uVar83 = (ulong)(uint)((int)((long)iVar88 % (long)iVar71) >> 0x1f)
                                           << 0x20 | (long)iVar88 % (long)iVar71 & 0xffffffffU;
                                  *(undefined8 *)*pauVar120 =
                                       *(undefined8 *)
                                        ((long)local_3c8.data +
                                        (long)((int)((long)uVar83 % (long)(int)auVar133._0_4_) *
                                               auVar133._8_4_ + (iVar88 / iVar71) * iVar79 + iVar53
                                              + (int)((long)uVar83 / (long)(int)auVar133._0_4_) *
                                                iVar58) * 8);
                                  pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                  iVar52 = iVar52 + -1;
                                  iVar88 = iVar88 + 1;
                                } while (iVar52 != 0);
                              }
                              uVar84 = uVar84 + 1;
                            } while (uVar84 != uVar54);
                          }
                        }
                        else {
                          uVar83 = 0;
                          lVar63 = (long)iVar78;
                          local_348 = (long)iVar57;
                          pauVar120 = (undefined1 (*) [16])local_228.data;
                          if (7 < (int)uVar54) {
                            iVar57 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar57 = iVar78;
                            }
                            uVar84 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar84 = uVar90;
                            }
                            lVar65 = local_348 + iVar79;
                            uVar73 = 0;
                            lVar93 = local_348;
                            do {
                              if (local_3c8.elempack == 8) {
                                if (7 < (int)uVar90) {
                                  pauVar74 = (undefined1 (*) [16])
                                             ((long)local_3c8.data +
                                             (uVar73 + local_348) * 8 +
                                             local_3c8.cstep * (long)(iVar57 >> 3) *
                                             local_3c8.elemsize);
                                  iVar58 = (int)uVar84 >> 3;
                                  do {
                                    auVar131 = vpunpcklwd_avx(*pauVar74,pauVar74[1]);
                                    auVar127 = vpunpckhwd_avx(*pauVar74,pauVar74[1]);
                                    auVar124 = vpunpcklwd_avx(pauVar74[2],pauVar74[3]);
                                    auVar134 = vpunpckhwd_avx(pauVar74[2],pauVar74[3]);
                                    auVar160 = vpunpcklwd_avx(auVar131,auVar127);
                                    auVar127 = vpunpckhwd_avx(auVar131,auVar127);
                                    auVar131 = vpunpcklwd_avx(auVar124,auVar134);
                                    auVar134 = vpunpckhwd_avx(auVar124,auVar134);
                                    auVar124 = vpunpcklqdq_avx(auVar160,auVar131);
                                    auVar131 = vpunpckhqdq_avx(auVar160,auVar131);
                                    auVar160 = vpunpcklqdq_avx(auVar127,auVar134);
                                    auVar127 = vpunpckhqdq_avx(auVar127,auVar134);
                                    *pauVar120 = auVar124;
                                    pauVar120[1] = auVar131;
                                    pauVar120[2] = auVar160;
                                    pauVar120[3] = auVar127;
                                    pauVar120 = pauVar120 + 4;
                                    pauVar74 = (undefined1 (*) [16])(*pauVar74 + iVar79 * 8);
                                    iVar58 = iVar58 + -1;
                                  } while (iVar58 != 0);
                                  goto LAB_002049a5;
                                }
                              }
                              else {
LAB_002049a5:
                                if (local_3c8.elempack == 1) {
                                  lVar60 = local_3c8.cstep * lVar63 * local_3c8.elemsize;
                                  if ((int)uVar90 < 2) {
                                    lVar61 = (long)local_3c8.data + local_348 + uVar73;
                                    uVar94 = 0;
                                  }
                                  else {
                                    lVar61 = (long)local_3c8.data + lVar93;
                                    lVar80 = (long)local_3c8.data + lVar65;
                                    iVar58 = 1;
                                    do {
                                      auVar124._8_8_ = 0;
                                      auVar124._0_8_ = *(ulong *)(lVar61 + lVar60);
                                      auVar129._8_8_ = 0;
                                      auVar129._0_8_ = *(ulong *)(lVar80 + lVar60);
                                      auVar127 = vpunpcklbw_avx(auVar124,auVar129);
                                      *pauVar120 = auVar127;
                                      pauVar120 = pauVar120 + 1;
                                      lVar61 = lVar61 + iVar79 * 2;
                                      lVar80 = lVar80 + iVar79 * 2;
                                      iVar58 = iVar58 + 2;
                                      uVar94 = uVar90 & 0xfffffffe;
                                    } while (iVar58 < (int)uVar90);
                                  }
                                  puVar91 = (undefined8 *)(lVar61 + lVar60);
                                  iVar58 = uVar90 - uVar94;
                                  if (iVar58 != 0 && (int)uVar94 <= (int)uVar90) {
                                    do {
                                      *(undefined8 *)*pauVar120 = *puVar91;
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                      puVar91 = (undefined8 *)((long)puVar91 + (long)iVar79);
                                      iVar58 = iVar58 + -1;
                                    } while (iVar58 != 0);
                                  }
                                }
                              }
                              uVar83 = uVar73 + 8;
                              uVar112 = uVar73 + 0xf;
                              lVar93 = lVar93 + 8;
                              lVar65 = lVar65 + 8;
                              uVar73 = uVar83;
                            } while (uVar112 < uVar54);
                          }
                          lVar65 = (long)(int)uVar54;
                          if ((int)((uint)uVar83 | 3) < (int)uVar54) {
                            iVar57 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar57 = iVar78;
                            }
                            uVar84 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar84 = uVar90;
                            }
                            local_330 = (void *)(long)(iVar57 >> 3);
                            local_350 = CONCAT44(local_350._4_4_,(int)uVar84 >> 3);
                            local_2c8 = (long)(iVar79 * 8);
                            lVar60 = local_3c8.cstep << 0x20;
                            local_320 = (long)iVar79;
                            lVar93 = (long)(iVar79 * 2);
                            local_420 = local_348 + (uVar83 & 0xffffffff);
                            local_438 = local_420 * 8 + 0x10;
                            lVar61 = (lVar60 + 0x300000000 >> 0x20) + local_420;
                            local_468 = local_320 + local_420;
                            local_430 = (lVar60 + 0x200000000 >> 0x20) + local_420;
                            lVar60 = (lVar60 + 0x100000000 >> 0x20) + local_420;
                            uVar73 = uVar83 & 0xffffffff;
                            do {
                              if (local_3c8.elempack == 8) {
                                if (7 < (int)uVar90) {
                                  lVar80 = local_3c8.cstep * (long)local_330 * local_3c8.elemsize;
                                  lVar86 = (long)local_3c8.data + local_438;
                                  iVar57 = (int)uVar84 >> 3;
                                  do {
                                    auVar127 = *(undefined1 (*) [16])(lVar86 + -0x10 + lVar80);
                                    auVar134 = *(undefined1 (*) [16])(lVar86 + lVar80);
                                    auVar131 = vpunpcklwd_avx(auVar127,auVar134);
                                    auVar127 = vpunpckhwd_avx(auVar127,auVar134);
                                    auVar134 = vpunpcklwd_avx(auVar131,auVar127);
                                    auVar127 = vpunpckhwd_avx(auVar131,auVar127);
                                    *pauVar120 = auVar134;
                                    pauVar120[1] = auVar127;
                                    pauVar120 = pauVar120 + 2;
                                    lVar86 = lVar86 + local_2c8;
                                    iVar57 = iVar57 + -1;
                                  } while (iVar57 != 0);
                                  goto LAB_00204bf3;
                                }
                              }
                              else {
LAB_00204bf3:
                                if (local_3c8.elempack == 1) {
                                  lVar80 = local_3c8.cstep * lVar63 * local_3c8.elemsize;
                                  if ((int)uVar90 < 2) {
                                    lVar86 = (long)local_3c8.data + local_348 + uVar73;
                                    uVar94 = 0;
                                  }
                                  else {
                                    lVar86 = (long)local_3c8.data + local_420;
                                    lVar98 = (long)local_3c8.data + lVar61;
                                    lVar101 = (long)local_3c8.data + local_468;
                                    lVar103 = (long)local_3c8.data + local_430;
                                    lVar105 = (long)local_3c8.data + lVar60;
                                    iVar57 = 1;
                                    do {
                                      (*pauVar120)[0] = *(undefined1 *)(lVar86 + lVar80);
                                      (*pauVar120)[1] = *(undefined1 *)(lVar101 + lVar80);
                                      (*pauVar120)[2] = *(undefined1 *)(lVar86 + 1 + lVar80);
                                      (*pauVar120)[3] = *(undefined1 *)(lVar105 + lVar80);
                                      (*pauVar120)[4] = *(undefined1 *)(lVar86 + 2 + lVar80);
                                      (*pauVar120)[5] = *(undefined1 *)(lVar103 + lVar80);
                                      (*pauVar120)[6] = *(undefined1 *)(lVar86 + 3 + lVar80);
                                      (*pauVar120)[7] = *(undefined1 *)(lVar98 + lVar80);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                      iVar57 = iVar57 + 2;
                                      lVar86 = lVar86 + lVar93;
                                      lVar98 = lVar98 + lVar93;
                                      lVar101 = lVar101 + lVar93;
                                      lVar103 = lVar103 + lVar93;
                                      lVar105 = lVar105 + lVar93;
                                      uVar94 = uVar90 & 0xfffffffe;
                                    } while (iVar57 < (int)uVar90);
                                  }
                                  iVar57 = uVar90 - uVar94;
                                  if (iVar57 != 0 && (int)uVar94 <= (int)uVar90) {
                                    puVar92 = (undefined1 *)(lVar86 + lVar80 + 3);
                                    do {
                                      (*pauVar120)[0] = puVar92[-3];
                                      (*pauVar120)[1] = puVar92[-2];
                                      (*pauVar120)[2] = puVar92[-1];
                                      (*pauVar120)[3] = *puVar92;
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                      puVar92 = puVar92 + local_320;
                                      iVar57 = iVar57 + -1;
                                    } while (iVar57 != 0);
                                  }
                                }
                              }
                              uVar83 = uVar73 + 4;
                              lVar80 = uVar73 + 7;
                              local_438 = local_438 + 0x20;
                              local_420 = local_420 + 4;
                              lVar61 = lVar61 + 4;
                              local_468 = local_468 + 4;
                              local_430 = local_430 + 4;
                              lVar60 = lVar60 + 4;
                              uVar73 = uVar83;
                            } while (lVar80 < lVar65);
                          }
                          if ((int)((uint)uVar83 | 1) < (int)uVar54) {
                            iVar57 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar57 = iVar78;
                            }
                            uVar84 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar84 = uVar90;
                            }
                            lVar61 = (long)(iVar79 * 2);
                            local_350 = CONCAT44(local_350._4_4_,uVar90) & 0xfffffffffffffffe;
                            lVar93 = local_348 + (uVar83 & 0xffffffff);
                            local_430 = lVar93 * 8 + 8;
                            lVar80 = ((long)((local_3c8.cstep << 0x20) + 0x100000000) >> 0x20) +
                                     lVar93;
                            lVar60 = lVar93 + iVar79;
                            uVar73 = uVar83 & 0xffffffff;
                            do {
                              if (local_3c8.elempack == 8) {
                                if (7 < (int)uVar90) {
                                  lVar86 = local_3c8.cstep * (long)(iVar57 >> 3) *
                                           local_3c8.elemsize;
                                  lVar98 = (long)local_3c8.data + local_430;
                                  iVar58 = (int)uVar84 >> 3;
                                  do {
                                    auVar125._8_8_ = 0;
                                    auVar125._0_8_ = *(ulong *)(lVar98 + -8 + lVar86);
                                    auVar130._8_8_ = 0;
                                    auVar130._0_8_ = *(ulong *)(lVar98 + lVar86);
                                    auVar127 = vpunpcklwd_avx(auVar125,auVar130);
                                    *pauVar120 = auVar127;
                                    pauVar120 = pauVar120 + 1;
                                    lVar98 = lVar98 + iVar79 * 8;
                                    iVar58 = iVar58 + -1;
                                  } while (iVar58 != 0);
                                  goto LAB_00204e92;
                                }
                              }
                              else {
LAB_00204e92:
                                if (local_3c8.elempack == 1) {
                                  lVar86 = local_3c8.cstep * lVar63 * local_3c8.elemsize;
                                  if ((int)uVar90 < 2) {
                                    lVar98 = (long)local_3c8.data + local_348 + uVar73;
                                    uVar94 = 0;
                                  }
                                  else {
                                    lVar98 = (long)local_3c8.data + lVar93;
                                    lVar101 = (long)local_3c8.data + lVar80;
                                    lVar103 = (long)local_3c8.data + lVar60;
                                    iVar58 = 1;
                                    do {
                                      (*pauVar120)[0] = *(undefined1 *)(lVar98 + lVar86);
                                      (*pauVar120)[1] = *(undefined1 *)(lVar103 + lVar86);
                                      (*pauVar120)[2] = *(undefined1 *)(lVar98 + 1 + lVar86);
                                      (*pauVar120)[3] = *(undefined1 *)(lVar101 + lVar86);
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                      iVar58 = iVar58 + 2;
                                      lVar98 = lVar98 + lVar61;
                                      lVar101 = lVar101 + lVar61;
                                      lVar103 = lVar103 + lVar61;
                                    } while (iVar58 < (int)uVar90);
                                    uVar94 = uVar90 & 0xfffffffe;
                                  }
                                  iVar58 = uVar90 - uVar94;
                                  if (iVar58 != 0 && (int)uVar94 <= (int)uVar90) {
                                    puVar92 = (undefined1 *)(lVar98 + lVar86 + 1);
                                    do {
                                      (*pauVar120)[0] = puVar92[-1];
                                      (*pauVar120)[1] = *puVar92;
                                      pauVar120 = (undefined1 (*) [16])(*pauVar120 + 2);
                                      puVar92 = puVar92 + iVar79;
                                      iVar58 = iVar58 + -1;
                                    } while (iVar58 != 0);
                                  }
                                }
                              }
                              uVar83 = uVar73 + 2;
                              lVar86 = uVar73 + 3;
                              local_430 = local_430 + 0x10;
                              lVar93 = lVar93 + 2;
                              lVar80 = lVar80 + 2;
                              lVar60 = lVar60 + 2;
                              uVar73 = uVar83;
                            } while (lVar86 < lVar65);
                          }
                          if ((int)uVar83 < (int)uVar54) {
                            iVar57 = iVar78 + 7;
                            if (-1 < iVar78) {
                              iVar57 = iVar78;
                            }
                            uVar54 = uVar90 + 7;
                            if (-1 < (int)uVar90) {
                              uVar54 = uVar90;
                            }
                            lVar93 = (long)(int)uVar83;
                            do {
                              if (local_3c8.elempack == 8) {
                                if (7 < (int)uVar90) {
                                  puVar91 = (undefined8 *)
                                            ((long)local_3c8.data +
                                            (lVar93 + local_348) * 8 +
                                            local_3c8.cstep * (long)(iVar57 >> 3) *
                                            local_3c8.elemsize);
                                  iVar78 = (int)uVar54 >> 3;
                                  do {
                                    *(undefined8 *)*pauVar120 = *puVar91;
                                    pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                    puVar91 = (undefined8 *)((long)puVar91 + (long)(iVar79 * 8));
                                    iVar78 = iVar78 + -1;
                                  } while (iVar78 != 0);
                                  goto LAB_00205044;
                                }
                              }
                              else {
LAB_00205044:
                                if (local_3c8.elempack == 1 && 0 < (int)uVar90) {
                                  puVar92 = (undefined1 *)
                                            ((long)local_3c8.data +
                                            local_348 +
                                            lVar93 + local_3c8.cstep * lVar63 * local_3c8.elemsize);
                                  uVar84 = uVar90;
                                  do {
                                    (*pauVar120)[0] = *puVar92;
                                    pauVar120 = (undefined1 (*) [16])(*pauVar120 + 1);
                                    puVar92 = puVar92 + iVar79;
                                    uVar84 = uVar84 - 1;
                                  } while (uVar84 != 0);
                                }
                              }
                              lVar93 = lVar93 + 1;
                            } while (lVar93 != lVar65);
                          }
                        }
                      }
                      else {
                        convolution_im2col_input_tile_int8_avx2
                                  (&local_3c8,&local_228,iVar57,uVar54,iVar78,uVar90,auVar133._0_4_,
                                   auVar133._4_4_,auVar133._8_4_,auVar133._12_4_,uVar119,iVar59);
                      }
                    }
                    else {
                      convolution_im2col_input_tile_int8_avxvnni
                                (&local_3c8,&local_228,iVar57,uVar54,iVar78,uVar90,auVar133._0_4_,
                                 auVar133._4_4_,auVar133._8_4_,auVar133._12_4_,uVar119,iVar59);
                    }
                  }
                  else {
                    convolution_im2col_input_tile_int8_avxvnniint8
                              (&local_3c8,&local_228,iVar57,uVar54,iVar78,uVar90,auVar133._0_4_,
                               auVar133._4_4_,auVar133._8_4_,auVar133._12_4_,uVar119,iVar59);
                  }
                  piVar106 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                  if (piVar106 != (int *)0x0) {
                    LOCK();
                    *piVar106 = *piVar106 + -1;
                    UNLOCK();
                    if (*piVar106 == 0) {
                      if (local_228.allocator == (Allocator *)0x0) {
                        if ((undefined1 (*) [16])local_228.data != (undefined1 (*) [16])0x0) {
                          free(local_228.data);
                        }
                      }
                      else {
                        (*(local_228.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  iVar100 = iVar100 + 1;
                  iVar78 = TILE_N;
                  iVar57 = TILE_K;
                } while (iVar100 != iVar96);
              }
              local_228.cstep = 0;
              local_228.data = (void *)0x0;
              local_228.refcount._0_4_ = 0;
              local_228.refcount._4_4_ = 0;
              local_228.elemsize = 0;
              local_228.elempack = 0;
              local_228.allocator = (Allocator *)0x0;
              local_228.dims = 0;
              local_228.w = 0;
              local_228.h = 0;
              local_228.d = 0;
              local_228.c = 0;
              Mat::create(&local_228,iVar78 * iVar57,1,(int)local_378,4,
                          local_340->workspace_allocator);
              iVar100 = -100;
              if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
                if (0 < iVar116) {
                  iVar100 = 0;
                  do {
                    iVar59 = TILE_N * iVar100;
                    uVar119 = iVar111 - iVar59;
                    if (TILE_N < iVar111 - iVar59) {
                      uVar119 = TILE_N;
                    }
                    iVar57 = get_omp_thread_num();
                    m.data = (void *)((long)iVar57 * local_228.cstep * local_228.elemsize +
                                     (long)local_228.data);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize = local_228.elemsize;
                    m.elempack = local_228.elempack;
                    m.allocator = local_228.allocator;
                    m.w = local_228.w;
                    m.h = local_228.h;
                    m.d = 1;
                    m.c = local_228.d;
                    m.dims = local_228.dims + -1;
                    m.cstep = (local_228.elemsize * (long)local_228.h * (long)local_228.w + 0xf &
                              0xfffffffffffffff0) / local_228.elemsize;
                    if (local_228.dims == 4) {
                      m.cstep = (long)local_228.h * (long)local_228.w;
                    }
                    if (0 < iVar118) {
                      lVar65 = (long)iVar59;
                      lVar63 = (long)(int)uVar119;
                      iVar57 = 0;
                      do {
                        uVar54 = iVar118 - iVar57;
                        if (TILE_K < iVar118 - iVar57) {
                          uVar54 = TILE_K;
                        }
                        if (0 < iVar97) {
                          iVar78 = 0;
                          do {
                            iVar96 = iVar97 - iVar78;
                            if (TILE_K_1 < iVar97 - iVar78) {
                              iVar96 = TILE_K_1;
                            }
                            local_160.w = (this->weight_sgemm_data).w;
                            local_160.cstep = (size_t)local_160.w;
                            local_160.elemsize = (this->weight_sgemm_data).elemsize;
                            local_160.elempack = (this->weight_sgemm_data).elempack;
                            local_160.allocator = (this->weight_sgemm_data).allocator;
                            local_160.data =
                                 (void *)((long)(this->weight_sgemm_data).data +
                                         local_160.elemsize * local_160.cstep *
                                         (long)(iVar78 / TILE_K_1) +
                                         (long)(iVar59 / TILE_N) * (this->weight_sgemm_data).cstep *
                                         local_160.elemsize);
                            local_160.refcount = (int *)0x0;
                            local_160.dims = 2;
                            local_160.h = 1;
                            local_160.d = 1;
                            local_160.c = 1;
                            local_b0 = (size_t)(int)opt_q._44_4_;
                            _TILE_M = (void *)(local_b0 * (long)opt_q.workspace_allocator *
                                               (long)(iVar78 / TILE_K_1) +
                                              (long)(iVar57 / TILE_K) * local_278._0_8_ *
                                              (long)opt_q.workspace_allocator + opt_q._0_8_);
                            local_e8 = (int *)0x0;
                            local_e0 = opt_q.workspace_allocator;
                            local_d8 = opt_q.openmp_blocktime;
                            local_d0 = (Allocator *)opt_q._32_8_;
                            local_c8 = 2;
                            local_c4._0_1_ = opt_q.use_reserved_1;
                            local_c4._1_1_ = opt_q.use_image_storage;
                            local_c4._2_1_ = opt_q.use_tensor_storage;
                            local_c4._3_1_ = opt_q.use_reserved_2;
                            local_c0._0_4_ = 1;
                            local_c0._4_4_ = 1;
                            local_b8 = 1;
                            Gemm_x86_avx_utility::gemm_transB_packed_tile_int8
                                      (&local_160,(Mat *)&TILE_M,&m,iVar59,uVar119,iVar57,uVar54,
                                       iVar78,iVar96);
                            if (local_e8 != (int *)0x0) {
                              LOCK();
                              *local_e8 = *local_e8 + -1;
                              UNLOCK();
                              if (*local_e8 == 0) {
                                if (local_d0 == (Allocator *)0x0) {
                                  if (_TILE_M != (void *)0x0) {
                                    free(_TILE_M);
                                  }
                                }
                                else {
                                  (*local_d0->_vptr_Allocator[3])();
                                }
                              }
                            }
                            if (local_160.refcount != (int *)0x0) {
                              LOCK();
                              *local_160.refcount = *local_160.refcount + -1;
                              UNLOCK();
                              if (*local_160.refcount == 0) {
                                if (local_160.allocator == (Allocator *)0x0) {
                                  if (local_160.data != (void *)0x0) {
                                    free(local_160.data);
                                  }
                                }
                                else {
                                  (*(local_160.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                            iVar78 = iVar78 + TILE_K_1;
                          } while (iVar78 < iVar97);
                        }
                        iVar78 = cpu_support_x86_avx2();
                        if (iVar78 == 0) {
                          uVar83 = 0;
                          iVar78 = (int)local_318.cstep;
                          pauVar66 = (undefined1 (*) [32])m.data;
                          if (7 < (int)uVar119) {
                            lVar101 = (long)(iVar78 * 2);
                            lVar80 = (long)(local_318.cstep * 0x300000000) >> 0x20;
                            lVar105 = (long)(iVar78 * 4);
                            lVar60 = (long)((local_318.cstep << 0x20) * 5) >> 0x20;
                            lVar61 = (long)(local_318.cstep * 0x600000000) >> 0x20;
                            lVar103 = (long)(local_318.cstep * 0x700000000) >> 0x20;
                            lVar86 = (long)(iVar78 * 7 + 1);
                            local_368._0_8_ = lVar86;
                            lVar98 = (long)iVar78;
                            lVar93 = (long)(int)(uVar54 * 4) * 4;
                            uVar73 = 0;
                            do {
                              pauVar99 = (undefined1 (*) [32])
                                         ((long)local_318.data +
                                         (long)(local_318.elempack * iVar57) * 4 +
                                         (lVar65 + uVar73) * lVar98 * 4);
                              if ((int)uVar54 < 8) {
                                uVar90 = 0;
                                pauVar81 = (undefined1 (*) [32])
                                           (*pauVar66 + (long)(int)(uVar54 * 4) * 4);
                              }
                              else {
                                iVar96 = 7;
                                do {
                                  pauVar81 = pauVar66;
                                  auVar175._16_16_ =
                                       SUB3216(*(undefined1 (*) [32])(*pauVar81 + lVar93),0);
                                  auVar175._0_16_ = SUB3216(*pauVar81,0);
                                  auVar183._16_16_ =
                                       SUB3216(*(undefined1 (*) [32])(pauVar81[1] + lVar93),0);
                                  auVar183._0_16_ = SUB3216(pauVar81[1],0);
                                  auVar188._16_16_ =
                                       SUB3216(*(undefined1 (*) [32])(pauVar81[2] + lVar93),0);
                                  auVar188._0_16_ = SUB3216(pauVar81[2],0);
                                  auVar188 = vshufps_avx(auVar188,auVar188,0x93);
                                  auVar192._16_16_ =
                                       SUB3216(*(undefined1 (*) [32])(pauVar81[3] + lVar93),0);
                                  auVar192._0_16_ = SUB3216(pauVar81[3],0);
                                  auVar192 = vshufps_avx(auVar192,auVar192,0x93);
                                  auVar149 = vperm2f128_avx(*pauVar81,
                                                            *(undefined1 (*) [32])
                                                             (*pauVar81 + lVar93),0x31);
                                  auVar137 = vperm2f128_avx(pauVar81[1],
                                                            *(undefined1 (*) [32])
                                                             (pauVar81[1] + lVar93),0x31);
                                  auVar148 = vperm2f128_avx(pauVar81[2],
                                                            *(undefined1 (*) [32])
                                                             (pauVar81[2] + lVar93),0x31);
                                  auVar148 = vshufps_avx(auVar148,auVar148,0x93);
                                  auVar157 = vperm2f128_avx(pauVar81[3],
                                                            *(undefined1 (*) [32])
                                                             (pauVar81[3] + lVar93),0x31);
                                  auVar157 = vshufps_avx(auVar157,auVar157,0x93);
                                  auVar190 = vunpcklps_avx(auVar175,auVar192);
                                  auVar194 = vunpcklps_avx(auVar183,auVar188);
                                  auVar183 = vunpckhps_avx(auVar183,auVar188);
                                  auVar192 = vunpckhps_avx(auVar175,auVar192);
                                  auVar176 = vunpcklps_avx(auVar149,auVar157);
                                  auVar184 = vunpcklps_avx(auVar137,auVar148);
                                  auVar137 = vunpckhps_avx(auVar137,auVar148);
                                  auVar157 = vunpckhps_avx(auVar149,auVar157);
                                  auVar149 = vunpcklpd_avx(auVar190,auVar194);
                                  auVar175 = vunpcklpd_avx(auVar183,auVar192);
                                  auVar158 = vunpcklpd_avx(auVar176,auVar184);
                                  auVar185 = vunpcklpd_avx(auVar137,auVar157);
                                  auVar188 = vshufps_avx(auVar190,auVar194,0xbe);
                                  auVar188 = vshufps_avx(auVar188,auVar188,0xd2);
                                  auVar192 = vshufps_avx(auVar183,auVar192,0xbe);
                                  auVar192 = vshufps_avx(auVar192,auVar192,0xd2);
                                  auVar148 = vshufps_avx(auVar176,auVar184,0xbe);
                                  auVar148 = vshufps_avx(auVar148,auVar148,0xd2);
                                  auVar157 = vshufps_avx(auVar137,auVar157,0xbe);
                                  auVar157 = vshufps_avx(auVar157,auVar157,0xd2);
                                  if (local_318.elempack == 1) {
                                    auVar190 = vunpcklps_avx(auVar149,auVar188);
                                    auVar183 = vunpckhps_avx(auVar149,auVar188);
                                    auVar188 = vunpcklps_avx(auVar175,auVar192);
                                    auVar192 = vunpckhps_avx(auVar175,auVar192);
                                    auVar194 = vunpcklps_avx(auVar158,auVar148);
                                    auVar137 = vunpckhps_avx(auVar158,auVar148);
                                    auVar148 = vunpcklps_avx(auVar185,auVar157);
                                    auVar157 = vunpckhps_avx(auVar185,auVar157);
                                    auVar149 = vunpcklpd_avx(auVar190,auVar188);
                                    auVar188 = vunpckhpd_avx(auVar190,auVar188);
                                    auVar175 = vunpcklpd_avx(auVar183,auVar192);
                                    auVar192 = vunpckhpd_avx(auVar183,auVar192);
                                    auVar183 = vunpcklpd_avx(auVar194,auVar148);
                                    auVar148 = vunpckhpd_avx(auVar194,auVar148);
                                    auVar158 = vunpcklpd_avx(auVar137,auVar157);
                                    auVar157 = vunpckhpd_avx(auVar137,auVar157);
                                    auVar137._16_16_ = auVar183._0_16_;
                                    auVar137._0_16_ = auVar149._0_16_;
                                    auVar185._16_16_ = auVar148._0_16_;
                                    auVar185._0_16_ = auVar188._0_16_;
                                    auVar190._16_16_ = auVar158._0_16_;
                                    auVar190._0_16_ = auVar175._0_16_;
                                    auVar194._16_16_ = auVar157._0_16_;
                                    auVar194._0_16_ = auVar192._0_16_;
                                    auVar183 = vperm2f128_avx(auVar149,auVar183,0x31);
                                    auVar188 = vperm2f128_avx(auVar188,auVar148,0x31);
                                    auVar148 = vperm2f128_avx(auVar175,auVar158,0x31);
                                    auVar192 = vperm2f128_avx(auVar192,auVar157,0x31);
                                    *pauVar99 = auVar137;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar98 * 4) = auVar185;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar101 * 4) = auVar190;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar80 * 4) = auVar194;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar105 * 4) = auVar183;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar60 * 4) = auVar188;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar61 * 4) = auVar148;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar103 * 4) = auVar192;
                                    pauVar99 = pauVar99 + 1;
                                  }
                                  else if (local_318.elempack == 4) {
                                    auVar176._16_16_ = auVar188._0_16_;
                                    auVar176._0_16_ = auVar149._0_16_;
                                    auVar184._16_16_ = auVar192._0_16_;
                                    auVar184._0_16_ = auVar175._0_16_;
                                    auVar189._16_16_ = auVar148._0_16_;
                                    auVar189._0_16_ = auVar158._0_16_;
                                    auVar193._16_16_ = auVar157._0_16_;
                                    auVar193._0_16_ = auVar185._0_16_;
                                    auVar188 = vperm2f128_avx(auVar149,auVar188,0x31);
                                    auVar192 = vperm2f128_avx(auVar175,auVar192,0x31);
                                    auVar148 = vperm2f128_avx(auVar158,auVar148,0x31);
                                    auVar157 = vperm2f128_avx(auVar185,auVar157,0x31);
                                    *pauVar99 = auVar176;
                                    pauVar99[1] = auVar184;
                                    pauVar99[2] = auVar189;
                                    pauVar99[3] = auVar193;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar105 * 4) = auVar188;
                                    *(undefined1 (*) [32])(pauVar99[1] + lVar105 * 4) = auVar192;
                                    *(undefined1 (*) [32])(pauVar99[2] + lVar105 * 4) = auVar148;
                                    *(undefined1 (*) [32])(pauVar99[3] + lVar105 * 4) = auVar157;
                                    pauVar99 = pauVar99 + 4;
                                  }
                                  else if (local_318.elempack == 8) {
                                    *pauVar99 = auVar149;
                                    pauVar99[1] = auVar188;
                                    pauVar99[2] = auVar175;
                                    pauVar99[3] = auVar192;
                                    pauVar99[4] = auVar158;
                                    pauVar99[5] = auVar148;
                                    pauVar99[6] = auVar185;
                                    pauVar99[7] = auVar157;
                                    pauVar99 = pauVar99 + 8;
                                  }
                                  iVar96 = iVar96 + 8;
                                  pauVar66 = pauVar81 + 4;
                                } while (iVar96 < (int)uVar54);
                                pauVar66 = pauVar81 + 4;
                                pauVar81 = (undefined1 (*) [32])(*pauVar66 + lVar93);
                                uVar90 = uVar54 & 0xfffffff8;
                              }
                              uVar84 = uVar90;
                              if ((int)(uVar90 | 3) < (int)uVar54) {
                                do {
                                  pauVar82 = pauVar81;
                                  pauVar122 = pauVar66;
                                  auVar148._16_16_ = SUB3216(*pauVar82,0);
                                  auVar148._0_16_ = SUB3216(*pauVar122,0);
                                  auVar157._16_16_ = SUB3216(pauVar82[1],0);
                                  auVar157._0_16_ = SUB3216(pauVar122[1],0);
                                  auVar188 = vperm2f128_avx(*pauVar122,*pauVar82,0x31);
                                  auVar188 = vshufps_avx(auVar188,auVar188,0x93);
                                  auVar192 = vperm2f128_avx(pauVar122[1],pauVar82[1],0x31);
                                  auVar192 = vshufps_avx(auVar192,auVar192,0x93);
                                  auVar137 = vunpcklps_avx(auVar148,auVar192);
                                  auVar192 = vunpckhps_avx(auVar148,auVar192);
                                  auVar149 = vunpcklps_avx(auVar157,auVar188);
                                  auVar148 = vunpckhps_avx(auVar157,auVar188);
                                  auVar157 = vunpcklpd_avx(auVar137,auVar149);
                                  auVar183 = vunpcklpd_avx(auVar148,auVar192);
                                  auVar188 = vshufps_avx(auVar137,auVar149,0xbe);
                                  auVar188 = vshufps_avx(auVar188,auVar188,0xd2);
                                  auVar192 = vshufps_avx(auVar148,auVar192,0xbe);
                                  auVar192 = vshufps_avx(auVar192,auVar192,0xd2);
                                  if (local_318.elempack == 1) {
                                    auVar137 = vunpcklps_avx(auVar157,auVar188);
                                    auVar148 = vunpckhps_avx(auVar157,auVar188);
                                    auVar188 = vunpcklps_avx(auVar183,auVar192);
                                    auVar192 = vunpckhps_avx(auVar183,auVar192);
                                    auVar157 = vunpcklpd_avx(auVar137,auVar188);
                                    auVar188 = vunpckhpd_avx(auVar137,auVar188);
                                    auVar183 = vunpcklpd_avx(auVar148,auVar192);
                                    auVar192 = vunpckhpd_avx(auVar148,auVar192);
                                    *(undefined1 (*) [16])*pauVar99 = auVar157._0_16_;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar98 * 4) = auVar188._0_16_
                                    ;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar101 * 4) =
                                         auVar183._0_16_;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar80 * 4) = auVar192._0_16_
                                    ;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar105 * 4) =
                                         auVar157._16_16_;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar60 * 4) =
                                         auVar188._16_16_;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar61 * 4) =
                                         auVar183._16_16_;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar103 * 4) =
                                         auVar192._16_16_;
                                    pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
                                  }
                                  else if (local_318.elempack == 4) {
                                    auVar149._16_16_ = auVar188._0_16_;
                                    auVar149._0_16_ = auVar157._0_16_;
                                    auVar158._16_16_ = auVar192._0_16_;
                                    auVar158._0_16_ = auVar183._0_16_;
                                    auVar188 = vperm2f128_avx(auVar157,auVar188,0x31);
                                    auVar192 = vperm2f128_avx(auVar183,auVar192,0x31);
                                    *pauVar99 = auVar149;
                                    pauVar99[1] = auVar158;
                                    *(undefined1 (*) [32])(*pauVar99 + lVar105 * 4) = auVar188;
                                    *(undefined1 (*) [32])(pauVar99[1] + lVar105 * 4) = auVar192;
                                    pauVar99 = pauVar99 + 2;
                                  }
                                  else if (local_318.elempack == 8) {
                                    *pauVar99 = auVar157;
                                    pauVar99[1] = auVar188;
                                    pauVar99[2] = auVar183;
                                    pauVar99[3] = auVar192;
                                    pauVar99 = pauVar99 + 4;
                                  }
                                  uVar90 = uVar84 + 4;
                                  iVar96 = uVar84 + 7;
                                  pauVar66 = pauVar122 + 2;
                                  pauVar81 = pauVar82 + 2;
                                  uVar84 = uVar90;
                                } while (iVar96 < (int)uVar54);
                                pauVar66 = pauVar122 + 2;
                                pauVar81 = pauVar82 + 2;
                              }
                              uVar84 = uVar90 | 1;
                              pauVar122 = pauVar66;
                              pauVar66 = pauVar81;
                              while ((int)uVar84 < (int)uVar54) {
                                auVar141._16_16_ = SUB3216(*pauVar66,0);
                                auVar141._0_16_ = SUB3216(*pauVar122,0);
                                auVar192 = vperm2f128_avx(*pauVar122,*pauVar66,0x31);
                                auVar188 = vblendps_avx(auVar141,auVar192,0xaa);
                                auVar192 = vblendps_avx(auVar192,auVar141,0xaa);
                                auVar127 = auVar188._0_16_;
                                auVar133 = auVar188._16_16_;
                                auVar134 = auVar192._0_16_;
                                if (local_318.elempack == 1) {
                                  auVar131 = vunpcklps_avx(auVar127,auVar134);
                                  uVar2 = vmovlps_avx(auVar131);
                                  *(undefined8 *)*pauVar99 = uVar2;
                                  uVar69 = vextractps_avx(auVar127,1);
                                  *(undefined4 *)(*pauVar99 + lVar98 * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar134,1);
                                  *(undefined4 *)
                                   (*pauVar99 +
                                   ((long)((local_318.cstep << 0x20) + 0x100000000) >> 0x20) * 4) =
                                       uVar69;
                                  uVar69 = vextractps_avx(auVar127,2);
                                  *(undefined4 *)(*pauVar99 + lVar101 * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar134,2);
                                  *(undefined4 *)(*pauVar99 + (long)(iVar78 * 2 + 1) * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar127,3);
                                  *(undefined4 *)(*pauVar99 + (long)(iVar78 * 3) * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar134,3);
                                  *(undefined4 *)(*pauVar99 + (long)(iVar78 * 3 + 1) * 4) = uVar69;
                                  auVar134 = auVar192._16_16_;
                                  auVar127 = vunpcklps_avx(auVar133,auVar134);
                                  uVar2 = vmovlps_avx(auVar127);
                                  *(undefined8 *)(*pauVar99 + lVar105 * 4) = uVar2;
                                  uVar69 = vextractps_avx(auVar133,1);
                                  *(undefined4 *)(*pauVar99 + (long)(iVar78 * 5) * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar134,1);
                                  *(undefined4 *)(*pauVar99 + (long)(iVar78 * 5 + 1) * 4) = uVar69;
                                  auVar127 = vunpckhps_avx(auVar133,auVar134);
                                  uVar2 = vmovlps_avx(auVar127);
                                  *(undefined8 *)(*pauVar99 + lVar61 * 4) = uVar2;
                                  uVar69 = vextractps_avx(auVar133,3);
                                  *(undefined4 *)(*pauVar99 + (long)(iVar78 * 7) * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar134,3);
                                  *(undefined4 *)(*pauVar99 + lVar86 * 4) = uVar69;
                                  pauVar99 = (undefined1 (*) [32])(*pauVar99 + 8);
                                }
                                else if (local_318.elempack == 4) {
                                  auVar142._16_16_ = auVar134;
                                  auVar142._0_16_ = auVar127;
                                  auVar188 = vperm2f128_avx(auVar188,auVar192,0x31);
                                  *pauVar99 = auVar142;
                                  *(undefined1 (*) [32])(*pauVar99 + lVar105 * 4) = auVar188;
                                  pauVar99 = pauVar99 + 1;
                                }
                                else if (local_318.elempack == 8) {
                                  *pauVar99 = auVar188;
                                  pauVar99[1] = auVar192;
                                  pauVar99 = pauVar99 + 2;
                                }
                                pauVar122 = pauVar122 + 1;
                                pauVar66 = pauVar66 + 1;
                                uVar84 = uVar90 + 3;
                                uVar90 = uVar90 + 2;
                              }
                              iVar96 = uVar54 - uVar90;
                              if (iVar96 != 0 && (int)uVar90 <= (int)uVar54) {
                                do {
                                  auVar127 = *(undefined1 (*) [16])*pauVar122;
                                  auVar133 = *(undefined1 (*) [16])*pauVar66;
                                  if (local_318.elempack == 1) {
                                    *(int *)*pauVar99 = auVar127._0_4_;
                                    uVar69 = vextractps_avx(auVar127,1);
                                    *(undefined4 *)(*pauVar99 + lVar98 * 4) = uVar69;
                                    uVar69 = vextractps_avx(auVar127,2);
                                    *(undefined4 *)(*pauVar99 + lVar101 * 4) = uVar69;
                                    uVar69 = vextractps_avx(auVar127,3);
                                    *(undefined4 *)(*pauVar99 + lVar80 * 4) = uVar69;
                                    *(int *)(*pauVar99 + lVar105 * 4) = auVar133._0_4_;
                                    uVar69 = vextractps_avx(auVar133,1);
                                    *(undefined4 *)(*pauVar99 + lVar60 * 4) = uVar69;
                                    uVar69 = vextractps_avx(auVar133,2);
                                    *(undefined4 *)(*pauVar99 + lVar61 * 4) = uVar69;
                                    uVar69 = vextractps_avx(auVar133,3);
                                    *(undefined4 *)(*pauVar99 + lVar103 * 4) = uVar69;
                                    pauVar99 = (undefined1 (*) [32])(*pauVar99 + 4);
                                  }
                                  else if (local_318.elempack == 4) {
                                    *(undefined1 (*) [16])*pauVar99 = auVar127;
                                    *(undefined1 (*) [16])(*pauVar99 + lVar105 * 4) = auVar133;
                                    pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
                                  }
                                  else if (local_318.elempack == 8) {
                                    *(undefined1 (*) [16])(*pauVar99 + 0x10) = auVar133;
                                    *(undefined1 (*) [16])*pauVar99 = auVar127;
                                    pauVar99 = pauVar99 + 1;
                                  }
                                  pauVar122 = (undefined1 (*) [32])(*pauVar122 + 0x10);
                                  pauVar66 = (undefined1 (*) [32])(*pauVar66 + 0x10);
                                  iVar96 = iVar96 + -1;
                                } while (iVar96 != 0);
                              }
                              uVar83 = uVar73 + 8;
                              uVar112 = uVar73 + 0xf;
                              uVar73 = uVar83;
                            } while (uVar112 < uVar119);
                          }
                          if ((int)((uint)uVar83 | 3) < (int)uVar119) {
                            lVar93 = (long)iVar78;
                            lVar60 = (long)(iVar78 * 2);
                            lVar61 = (long)(local_318.cstep * 0x300000000) >> 0x20;
                            uVar73 = uVar83 & 0xffffffff;
                            do {
                              pauVar120 = (undefined1 (*) [16])
                                          ((long)local_318.data +
                                          (long)(local_318.elempack * iVar57) * 4 +
                                          (lVar65 + uVar73) * lVar93 * 4);
                              uVar90 = 0;
                              if (7 < (int)uVar54) {
                                iVar96 = 7;
                                do {
                                  auVar127 = vpermilps_avx(*(undefined1 (*) [16])pauVar66[2],0x93);
                                  auVar133 = vpermilps_avx(*(undefined1 (*) [16])
                                                            (pauVar66[2] + 0x10),0x93);
                                  auVar134 = vpermilps_avx(*(undefined1 (*) [16])pauVar66[3],0x93);
                                  auVar131 = vpermilps_avx(*(undefined1 (*) [16])
                                                            (pauVar66[3] + 0x10),0x93);
                                  auVar124 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar66,auVar134)
                                  ;
                                  auVar160 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar66,auVar134)
                                  ;
                                  auVar172 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar66 + 0x10),
                                                           auVar131);
                                  auVar167 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar66 + 0x10),
                                                           auVar131);
                                  auVar173 = vunpcklps_avx(*(undefined1 (*) [16])pauVar66[1],
                                                           auVar127);
                                  auVar171 = vunpckhps_avx(*(undefined1 (*) [16])pauVar66[1],
                                                           auVar127);
                                  auVar179 = vunpcklps_avx(*(undefined1 (*) [16])
                                                            (pauVar66[1] + 0x10),auVar133);
                                  auVar178 = vunpckhps_avx(*(undefined1 (*) [16])
                                                            (pauVar66[1] + 0x10),auVar133);
                                  auVar127 = vmovlhps_avx(auVar124,auVar173);
                                  auVar133 = vmovlhps_avx(auVar171,auVar160);
                                  auVar134 = vmovlhps_avx(auVar172,auVar179);
                                  auVar131 = vmovlhps_avx(auVar178,auVar167);
                                  auVar124 = vunpckhps_avx(auVar124,auVar173);
                                  auVar124 = vshufps_avx(auVar124,auVar124,99);
                                  auVar160 = vunpckhps_avx(auVar171,auVar160);
                                  auVar160 = vshufps_avx(auVar160,auVar160,99);
                                  auVar171 = vunpckhps_avx(auVar172,auVar179);
                                  auVar171 = vshufps_avx(auVar171,auVar171,99);
                                  auVar167 = vunpckhps_avx(auVar178,auVar167);
                                  auVar167 = vshufps_avx(auVar167,auVar167,99);
                                  if (local_318.elempack == 1) {
                                    auVar172 = vunpcklps_avx(auVar127,auVar124);
                                    auVar178 = vunpckhps_avx(auVar127,auVar124);
                                    auVar124 = vunpcklps_avx(auVar133,auVar160);
                                    auVar160 = vunpckhps_avx(auVar133,auVar160);
                                    auVar127 = vmovlhps_avx(auVar172,auVar124);
                                    auVar124 = vunpckhpd_avx(auVar172,auVar124);
                                    auVar133 = vmovlhps_avx(auVar178,auVar160);
                                    auVar160 = vunpckhpd_avx(auVar178,auVar160);
                                    auVar172 = vunpcklps_avx(auVar134,auVar171);
                                    auVar178 = vunpckhps_avx(auVar134,auVar171);
                                    auVar171 = vunpcklps_avx(auVar131,auVar167);
                                    auVar167 = vunpckhps_avx(auVar131,auVar167);
                                    auVar134 = vmovlhps_avx(auVar172,auVar171);
                                    auVar171 = vunpckhpd_avx(auVar172,auVar171);
                                    auVar131 = vmovlhps_avx(auVar178,auVar167);
                                    auVar167 = vunpckhpd_avx(auVar178,auVar167);
                                    *pauVar120 = auVar127;
                                    pauVar120[1] = auVar134;
                                    *(undefined1 (*) [16])(*pauVar120 + lVar93 * 4) = auVar124;
                                    *(undefined1 (*) [16])(pauVar120[1] + lVar93 * 4) = auVar171;
                                    *(undefined1 (*) [16])(*pauVar120 + lVar60 * 4) = auVar133;
                                    *(undefined1 (*) [16])(pauVar120[1] + lVar60 * 4) = auVar131;
                                    *(undefined1 (*) [16])(*pauVar120 + lVar61 * 4) = auVar160;
                                    *(undefined1 (*) [16])(pauVar120[1] + lVar61 * 4) = auVar167;
                                    pauVar120 = pauVar120 + 2;
                                  }
                                  else if (local_318.elempack == 4) {
                                    *pauVar120 = auVar127;
                                    pauVar120[1] = auVar124;
                                    pauVar120[2] = auVar133;
                                    pauVar120[3] = auVar160;
                                    pauVar120[4] = auVar134;
                                    pauVar120[5] = auVar171;
                                    pauVar120[6] = auVar131;
                                    pauVar120[7] = auVar167;
                                    pauVar120 = pauVar120 + 8;
                                  }
                                  pauVar66 = pauVar66 + 4;
                                  iVar96 = iVar96 + 8;
                                  uVar90 = uVar54 & 0xfffffff8;
                                } while (iVar96 < (int)uVar54);
                              }
                              uVar84 = uVar90 | 3;
                              while ((int)uVar84 < (int)uVar54) {
                                auVar127 = vpermilps_avx(*(undefined1 (*) [16])(*pauVar66 + 0x10),
                                                         0x93);
                                auVar133 = vpermilps_avx(*(undefined1 (*) [16])(pauVar66[1] + 0x10),
                                                         0x93);
                                auVar134 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar66,auVar133);
                                auVar131 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar66,auVar133);
                                auVar160 = vunpcklps_avx(*(undefined1 (*) [16])pauVar66[1],auVar127)
                                ;
                                auVar124 = vunpckhps_avx(*(undefined1 (*) [16])pauVar66[1],auVar127)
                                ;
                                auVar127 = vmovlhps_avx(auVar134,auVar160);
                                auVar133 = vmovlhps_avx(auVar124,auVar131);
                                auVar134 = vunpckhps_avx(auVar134,auVar160);
                                auVar134 = vshufps_avx(auVar134,auVar134,99);
                                auVar131 = vunpckhps_avx(auVar124,auVar131);
                                auVar131 = vshufps_avx(auVar131,auVar131,99);
                                if (local_318.elempack == 1) {
                                  auVar160 = vunpcklps_avx(auVar127,auVar134);
                                  auVar124 = vunpckhps_avx(auVar127,auVar134);
                                  auVar134 = vunpcklps_avx(auVar133,auVar131);
                                  auVar131 = vunpckhps_avx(auVar133,auVar131);
                                  auVar127 = vmovlhps_avx(auVar160,auVar134);
                                  auVar134 = vunpckhpd_avx(auVar160,auVar134);
                                  auVar133 = vmovlhps_avx(auVar124,auVar131);
                                  auVar131 = vunpckhpd_avx(auVar124,auVar131);
                                  *pauVar120 = auVar127;
                                  *(undefined1 (*) [16])(*pauVar120 + lVar93 * 4) = auVar134;
                                  *(undefined1 (*) [16])(*pauVar120 + lVar60 * 4) = auVar133;
                                  *(undefined1 (*) [16])(*pauVar120 + lVar61 * 4) = auVar131;
                                  pauVar120 = pauVar120 + 1;
                                }
                                else if (local_318.elempack == 4) {
                                  *pauVar120 = auVar127;
                                  pauVar120[1] = auVar134;
                                  pauVar120[2] = auVar133;
                                  pauVar120[3] = auVar131;
                                  pauVar120 = pauVar120 + 4;
                                }
                                pauVar66 = pauVar66 + 2;
                                uVar84 = uVar90 + 7;
                                uVar90 = uVar90 + 4;
                              }
                              uVar84 = uVar90 | 1;
                              while ((int)uVar84 < (int)uVar54) {
                                auVar127 = *(undefined1 (*) [16])*pauVar66;
                                auVar133 = *(undefined1 (*) [16])(*pauVar66 + 0x10);
                                if (local_318.elempack == 1) {
                                  auVar134 = vunpcklps_avx(auVar127,auVar133);
                                  uVar2 = vmovlps_avx(auVar134);
                                  *(undefined8 *)*pauVar120 = uVar2;
                                  uVar69 = vextractps_avx(auVar133,1);
                                  *(undefined4 *)(*pauVar120 + lVar93 * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar127,1);
                                  *(undefined4 *)
                                   (*pauVar120 +
                                   ((long)((local_318.cstep << 0x20) + 0x100000000) >> 0x20) * 4) =
                                       uVar69;
                                  auVar134 = vunpckhps_avx(auVar127,auVar133);
                                  uVar2 = vmovlps_avx(auVar134);
                                  *(undefined8 *)(*pauVar120 + lVar60 * 4) = uVar2;
                                  uVar69 = vextractps_avx(auVar133,3);
                                  *(undefined4 *)(*pauVar120 + (long)(iVar78 * 3) * 4) = uVar69;
                                  uVar69 = vextractps_avx(auVar127,3);
                                  *(undefined4 *)(*pauVar120 + (long)(iVar78 * 3 + 1) * 4) = uVar69;
                                  pauVar120 = (undefined1 (*) [16])(*pauVar120 + 8);
                                }
                                else if (local_318.elempack == 4) {
                                  auVar134 = vblendps_avx(auVar133,auVar127,10);
                                  auVar127 = vblendps_avx(auVar127,auVar133,10);
                                  *pauVar120 = auVar127;
                                  pauVar120[1] = auVar134;
                                  pauVar120 = pauVar120 + 2;
                                }
                                pauVar66 = pauVar66 + 1;
                                uVar84 = uVar90 + 3;
                                uVar90 = uVar90 + 2;
                              }
                              iVar96 = uVar54 - uVar90;
                              if (iVar96 != 0 && (int)uVar90 <= (int)uVar54) {
                                do {
                                  auVar127 = *(undefined1 (*) [16])*pauVar66;
                                  if (local_318.elempack == 1) {
                                    *(int *)*pauVar120 = auVar127._0_4_;
                                    uVar69 = vextractps_avx(auVar127,1);
                                    *(undefined4 *)(*pauVar120 + lVar93 * 4) = uVar69;
                                    uVar69 = vextractps_avx(auVar127,2);
                                    *(undefined4 *)(*pauVar120 + lVar60 * 4) = uVar69;
                                    uVar69 = vextractps_avx(auVar127,3);
                                    *(undefined4 *)(*pauVar120 + lVar61 * 4) = uVar69;
                                    pauVar120 = (undefined1 (*) [16])(*pauVar120 + 4);
                                  }
                                  else if (local_318.elempack == 4) {
                                    *pauVar120 = auVar127;
                                    pauVar120 = pauVar120 + 1;
                                  }
                                  pauVar66 = (undefined1 (*) [32])(*pauVar66 + 0x10);
                                  iVar96 = iVar96 + -1;
                                } while (iVar96 != 0);
                              }
                              uVar83 = uVar73 + 4;
                              lVar80 = uVar73 + 7;
                              uVar73 = uVar83;
                            } while (lVar80 < lVar63);
                          }
                          if ((int)((uint)uVar83 | 1) < (int)uVar119) {
                            lVar80 = (long)iVar57;
                            lVar61 = (long)iVar78;
                            lVar60 = lVar65 + (uVar83 & 0xffffffff);
                            lVar93 = lVar60 * 4 * lVar61 + lVar80 * 4;
                            lVar60 = (lVar60 * 4 + 4) * lVar61 + lVar80 * 4 + 0x10;
                            uVar73 = uVar83 & 0xffffffff;
                            do {
                              if ((int)uVar54 < 8) {
                                uVar90 = 0;
                                lVar86 = lVar80 * 4 + (lVar65 + uVar73) * lVar61 * 4;
                              }
                              else {
                                iVar96 = 7;
                                lVar86 = 0;
                                pauVar99 = pauVar66;
                                do {
                                  pauVar81 = pauVar99;
                                  pauVar120 = (undefined1 (*) [16])(*pauVar66 + lVar86 * 2);
                                  auVar127 = vpermilps_avx(pauVar120[2],0xb1);
                                  auVar133 = vpermilps_avx(pauVar120[3],0xb1);
                                  auVar124 = vunpcklps_avx(*pauVar120,auVar127);
                                  auVar134 = vunpckhps_avx(*pauVar120,auVar127);
                                  auVar160 = vunpcklps_avx(pauVar120[1],auVar133);
                                  auVar131 = vunpckhps_avx(pauVar120[1],auVar133);
                                  auVar127 = vmovlhps_avx(auVar124,auVar134);
                                  auVar133 = vmovlhps_avx(auVar160,auVar131);
                                  auVar134 = vshufps_avx(auVar124,auVar134,0xbb);
                                  auVar131 = vshufps_avx(auVar160,auVar131,0xbb);
                                  *(undefined1 (*) [16])((long)local_318.data + lVar86 + lVar93) =
                                       auVar127;
                                  *(undefined1 (*) [16])
                                   ((long)local_318.data + lVar86 + lVar93 + 0x10) = auVar133;
                                  *(undefined1 (*) [16])
                                   ((long)local_318.data + lVar86 + lVar60 + -0x10) = auVar134;
                                  *(undefined1 (*) [16])((long)local_318.data + lVar86 + lVar60) =
                                       auVar131;
                                  lVar86 = lVar86 + 0x20;
                                  iVar96 = iVar96 + 8;
                                  pauVar99 = (undefined1 (*) [32])(pauVar120 + 4);
                                } while (iVar96 < (int)uVar54);
                                pauVar66 = pauVar81 + 2;
                                lVar86 = lVar86 + lVar93;
                                uVar90 = uVar54 & 0xfffffff8;
                              }
                              pauVar120 = (undefined1 (*) [16])((long)local_318.data + lVar86);
                              uVar84 = uVar90 | 3;
                              while ((int)uVar84 < (int)uVar54) {
                                auVar134 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar66,
                                                         *(undefined1 (*) [16])(*pauVar66 + 0x10));
                                auVar133 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar66,
                                                         *(undefined1 (*) [16])(*pauVar66 + 0x10));
                                auVar127 = vmovlhps_avx(auVar134,auVar133);
                                auVar133 = vunpckhps_avx(auVar133,auVar134);
                                auVar133 = vshufps_avx(auVar133,auVar133,0x36);
                                *pauVar120 = auVar127;
                                *(undefined1 (*) [16])(*pauVar120 + lVar61 * 4) = auVar133;
                                pauVar120 = pauVar120 + 1;
                                pauVar66 = pauVar66 + 1;
                                uVar84 = uVar90 + 7;
                                uVar90 = uVar90 + 4;
                              }
                              if ((int)(uVar90 | 1) < (int)uVar54) {
                                lVar86 = 0;
                                lVar98 = 0;
                                lVar101 = 0;
                                do {
                                  uVar69 = *(undefined4 *)(*pauVar66 + lVar101 * 8 + 8);
                                  uVar16 = *(undefined4 *)(*pauVar66 + lVar101 * 8 + 0xc);
                                  *(undefined8 *)(*pauVar120 + lVar101 * 4) =
                                       *(undefined8 *)(*pauVar66 + lVar101 * 8);
                                  *(undefined4 *)(*pauVar120 + lVar101 * 4 + lVar61 * 4) = uVar69;
                                  *(undefined4 *)
                                   (*pauVar120 +
                                   lVar101 * 4 +
                                   ((long)((local_318.cstep << 0x20) + 0x100000000) >> 0x20) * 4) =
                                       uVar16;
                                  lVar101 = lVar101 + 2;
                                  lVar98 = lVar98 + 0x10;
                                  lVar86 = lVar86 + 8;
                                } while ((int)(uVar90 + (int)lVar101 + 1) < (int)uVar54);
                                pauVar66 = (undefined1 (*) [32])(*pauVar66 + lVar98);
                                pauVar120 = (undefined1 (*) [16])(*pauVar120 + lVar86);
                                uVar90 = uVar90 + (int)lVar101;
                              }
                              if ((int)uVar90 < (int)uVar54) {
                                lVar86 = 0;
                                do {
                                  uVar69 = *(undefined4 *)(*pauVar66 + 4);
                                  *(undefined4 *)(*pauVar120 + lVar86 * 4) =
                                       *(undefined4 *)*pauVar66;
                                  *(undefined4 *)(*pauVar120 + lVar86 * 4 + lVar61 * 4) = uVar69;
                                  pauVar66 = (undefined1 (*) [32])(*pauVar66 + 8);
                                  lVar86 = lVar86 + 1;
                                } while (uVar54 - uVar90 != (int)lVar86);
                              }
                              uVar83 = uVar73 + 2;
                              lVar86 = uVar73 + 3;
                              lVar93 = lVar93 + lVar61 * 8;
                              lVar60 = lVar60 + lVar61 * 8;
                              uVar73 = uVar83;
                            } while (lVar86 < lVar63);
                          }
                          if ((int)uVar83 < (int)uVar119) {
                            lVar93 = (long)(int)uVar83;
                            do {
                              pauVar99 = (undefined1 (*) [32])
                                         ((long)local_318.data +
                                         (long)iVar57 * 4 + (lVar65 + lVar93) * (long)iVar78 * 4);
                              uVar90 = 0;
                              if (7 < (int)uVar54) {
                                iVar96 = 7;
                                do {
                                  *pauVar99 = *pauVar66;
                                  pauVar99 = pauVar99 + 1;
                                  pauVar66 = pauVar66 + 1;
                                  iVar96 = iVar96 + 8;
                                  uVar90 = uVar54 & 0xfffffff8;
                                } while (iVar96 < (int)uVar54);
                              }
                              uVar84 = uVar90 | 3;
                              while ((int)uVar84 < (int)uVar54) {
                                *(undefined1 (*) [16])*pauVar99 = *(undefined1 (*) [16])*pauVar66;
                                pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
                                pauVar66 = (undefined1 (*) [32])(*pauVar66 + 0x10);
                                uVar84 = uVar90 + 7;
                                uVar90 = uVar90 + 4;
                              }
                              uVar84 = uVar90 | 1;
                              while ((int)uVar84 < (int)uVar54) {
                                *(undefined8 *)*pauVar99 = *(undefined8 *)*pauVar66;
                                pauVar99 = (undefined1 (*) [32])(*pauVar99 + 8);
                                pauVar66 = (undefined1 (*) [32])(*pauVar66 + 8);
                                uVar84 = uVar90 + 3;
                                uVar90 = uVar90 + 2;
                              }
                              if ((int)uVar90 < (int)uVar54) {
                                lVar60 = 0;
                                do {
                                  *(undefined4 *)(*pauVar99 + lVar60 * 4) = *(undefined4 *)*pauVar66
                                  ;
                                  pauVar66 = (undefined1 (*) [32])(*pauVar66 + 4);
                                  lVar60 = lVar60 + 1;
                                } while (uVar54 - uVar90 != (int)lVar60);
                              }
                              lVar93 = lVar93 + 1;
                            } while (lVar93 != lVar63);
                          }
                        }
                        else {
                          unpack_output_tile_int32_avx2(&m,&local_318,iVar59,uVar119,iVar57,uVar54);
                        }
                        iVar57 = iVar57 + TILE_K;
                      } while (iVar57 < iVar118);
                      piVar106 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                      if (piVar106 != (int *)0x0) {
                        LOCK();
                        *piVar106 = *piVar106 + -1;
                        UNLOCK();
                        if (*piVar106 == 0) {
                          if (m.allocator == (Allocator *)0x0) {
                            if (m.data != (void *)0x0) {
                              free(m.data);
                            }
                          }
                          else {
                            (*(m.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    iVar100 = iVar100 + 1;
                  } while (iVar100 != iVar116);
                }
                iVar100 = 0;
              }
              piVar106 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
              if (piVar106 != (int *)0x0) {
                LOCK();
                *piVar106 = *piVar106 + -1;
                UNLOCK();
                if (*piVar106 == 0) {
                  if (local_228.allocator == (Allocator *)0x0) {
                    if (local_228.data != (void *)0x0) {
                      free(local_228.data);
                    }
                  }
                  else {
                    (*(local_228.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar106 != (int *)0x0) {
              LOCK();
              *piVar106 = *piVar106 + -1;
              UNLOCK();
              if (*piVar106 == 0) {
                pvVar87 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) {
joined_r0x0020bbec:
                  if (pvVar87 != (void *)0x0) {
                    free(pvVar87);
                  }
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            goto LAB_00207a7d;
          }
          iVar100 = cpu_support_x86_avx2();
          if (iVar100 == 0) {
            iVar96 = cpu_support_x86_xop();
            iVar116 = local_318.h;
            iVar78 = local_318.elempack;
            iVar57 = local_3c8.w;
            iVar100 = local_3c8.elempack;
            if (iVar96 == 0) {
              uVar90 = local_3c8.c * local_3c8.elempack;
              iVar96 = (int)local_3c8.cstep * local_3c8.elempack;
              local_348 = CONCAT44(local_348._4_4_,local_318.w);
              uVar84 = local_318.c * local_318.elempack;
              uVar54 = auVar133._4_4_ * auVar133._0_4_;
              uVar83 = (ulong)uVar54;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar54,
                         (allocator_type *)&local_228);
              if (0 < (int)auVar133._4_4_) {
                iVar107 = 0;
                iVar111 = 0;
                iVar118 = 0;
                do {
                  if (0 < (int)auVar133._0_4_) {
                    iVar71 = iVar100 * iVar111;
                    lVar63 = 0;
                    do {
                      *(int *)(opt_q._0_8_ + (long)iVar107 * 4 + lVar63 * 4) = iVar71;
                      iVar111 = iVar111 + auVar133._8_4_;
                      lVar63 = lVar63 + 1;
                      iVar71 = iVar71 + auVar133._8_4_ * iVar100;
                    } while (auVar133._0_4_ != (int)lVar63);
                    iVar107 = iVar107 + (int)lVar63;
                  }
                  iVar111 = iVar111 + (iVar57 * auVar133._12_4_ - auVar133._8_4_ * auVar133._0_4_);
                  iVar118 = iVar118 + 1;
                } while (iVar118 != auVar133._4_4_);
              }
              uVar94 = uVar84 + 3;
              if (-1 < (int)uVar84) {
                uVar94 = uVar84;
              }
              uVar94 = (int)uVar94 >> 2;
              if (3 < (int)uVar84) {
                iVar57 = iVar100 * uVar119;
                local_328 = CONCAT44(local_328._4_4_,iVar57);
                local_238 = CONCAT44(local_238._4_4_,uVar90) & 0xfffffffffffffff8;
                local_60 = (ulong)uVar94;
                lVar93 = uVar83 * 0x20;
                lVar63 = uVar83 * 8;
                lVar65 = uVar83 * 4;
                uVar73 = 0;
                do {
                  iVar107 = (int)local_3c8.cstep * iVar100;
                  local_408 = (undefined1 (*) [16])
                              ((long)(((int)uVar73 * 4) / iVar78) * local_318.cstep *
                               local_318.elemsize + (long)local_318.data);
                  uVar64 = iVar78 * (int)local_318.cstep;
                  local_f8 = (ulong)uVar64;
                  uVar55 = local_318.h * local_318.w;
                  if ((int)uVar55 < 4) {
                    uVar56 = 0;
                  }
                  else {
                    lVar98 = (long)iVar107;
                    lVar60 = lVar98 * 3;
                    lVar61 = lVar98 * 5;
                    lVar80 = lVar98 * 6;
                    local_368._0_8_ = lVar80;
                    lVar86 = lVar98 * 7;
                    local_110 = (long)(int)(uVar64 + 2);
                    local_118 = (ulong)(int)(uVar64 + 3);
                    local_38 = (long)(int)(uVar64 * 2 + 2);
                    local_40 = (long)(int)(uVar64 * 3);
                    local_48 = (long)(int)(uVar64 * 3 + 1);
                    local_50 = (long)(int)(uVar64 * 3 + 2);
                    local_58 = (long)(int)(uVar64 * 3 + 3);
                    pvVar87 = (void *)0x0;
                    do {
                      local_378 = pvVar87;
                      uVar95 = (uint)local_378;
                      iVar108 = (int)uVar95 / local_318.w;
                      iVar79 = (int)uVar95 % local_318.w;
                      uVar112 = CONCAT44((int)(uVar95 | 1) >> 0x1f,uVar95) | 1;
                      iVar97 = (int)((long)uVar112 % (long)local_318.w);
                      uVar68 = CONCAT44((int)(uVar95 | 2) >> 0x1f,uVar95) | 2;
                      iVar71 = (int)((long)uVar68 % (long)local_318.w);
                      uVar104 = CONCAT44((int)(uVar95 | 3) >> 0x1f,uVar95) | 3;
                      iVar111 = (int)((long)uVar104 / (long)local_318.w);
                      pvVar87 = (void *)((this->weight_data_tm).cstep * uVar73 *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                      auVar138 = ZEXT1664((undefined1  [16])0x0);
                      iVar53 = (int)((long)uVar68 / (long)local_318.w);
                      local_2c8 = CONCAT44(local_2c8._4_4_,iVar53);
                      iVar58 = (int)((long)uVar112 / (long)local_318.w);
                      iVar118 = (int)((long)uVar104 % (long)local_318.w);
                      local_350 = CONCAT44(local_350._4_4_,iVar71);
                      local_330 = (void *)CONCAT44(local_330._4_4_,iVar111);
                      local_320 = CONCAT44(local_320._4_4_,iVar97);
                      local_2d0 = CONCAT44(local_2d0._4_4_,iVar108);
                      if ((int)uVar90 < 8) {
                        uVar112 = 0;
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                      }
                      else {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        iVar52 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar105 = (long)(iVar52 / iVar100) *
                                      local_3c8.cstep * local_3c8.elemsize;
                            lVar103 = 0;
                            do {
                              lVar113 = (long)*(int *)(opt_q._0_8_ + lVar103);
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  lVar113 + lVar105 + (iVar108 * iVar59) * lVar101 +
                                                                      (long)(iVar79 * iVar57));
                              puVar75 = (ulong *)((long)local_3c8.data +
                                                 lVar113 + lVar105 + (iVar58 * iVar59) * lVar101 +
                                                                     (long)(iVar97 * iVar57));
                              puVar1 = (ulong *)((long)local_3c8.data +
                                                lVar113 + lVar105 + (iVar53 * iVar59) * lVar101 +
                                                                    (long)(iVar71 * iVar57));
                              puVar114 = (ulong *)((long)local_3c8.data +
                                                  lVar113 + lVar105 + (iVar111 * iVar59) * lVar101 +
                                                                      (long)(iVar118 * iVar57));
                              if (iVar100 == 8) {
                                auVar152._8_8_ = 0;
                                auVar152._0_8_ = *puVar109;
                                auVar162._8_8_ = 0;
                                auVar162._0_8_ = *puVar75;
                                auVar181._8_8_ = 0;
                                auVar181._0_8_ = *puVar1;
                                auVar186._8_8_ = 0;
                                auVar186._0_8_ = *puVar114;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80),6);
                                auVar152 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar75),
                                                       (uint)*(byte *)((long)puVar75 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80),6);
                                auVar162 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar1),
                                                       (uint)*(byte *)((long)puVar1 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar80),6);
                                auVar181 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar114),
                                                       (uint)*(byte *)((long)puVar114 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar80),6);
                                auVar186 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar86),7);
                              }
                              auVar172 = vpmovsxbw_avx(auVar152);
                              auVar173 = vpmovsxbw_avx(auVar162);
                              auVar179 = vpmovsxbw_avx(auVar181);
                              auVar195 = vpmovsxbw_avx(auVar186);
                              auVar127 = *(undefined1 (*) [16])((long)pvVar87 + lVar103 * 8);
                              auVar133 = *(undefined1 (*) [16])((long)pvVar87 + lVar103 * 8 + 0x10);
                              auVar134 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                              auVar131 = vpcmpgtb_avx((undefined1  [16])0x0,auVar133);
                              auVar124 = vpunpcklbw_avx(auVar127,auVar134);
                              auVar178 = vpunpckhbw_avx(auVar127,auVar134);
                              auVar198 = vpunpcklbw_avx(auVar133,auVar131);
                              auVar196 = vpunpckhbw_avx(auVar133,auVar131);
                              auVar127 = vpshufd_avx(auVar172,0);
                              auVar127 = vpmaddwd_avx(auVar127,auVar124);
                              auVar127 = vpaddd_avx(auVar127,auVar150._0_16_);
                              auVar133 = vpshufd_avx(auVar173,0);
                              auVar133 = vpmaddwd_avx(auVar133,auVar124);
                              auVar133 = vpaddd_avx(auVar133,auVar146._0_16_);
                              auVar134 = vpshufd_avx(auVar179,0);
                              auVar134 = vpmaddwd_avx(auVar134,auVar124);
                              auVar134 = vpaddd_avx(auVar134,auVar143._0_16_);
                              auVar131 = vpshufd_avx(auVar195,0);
                              auVar131 = vpmaddwd_avx(auVar131,auVar124);
                              auVar131 = vpaddd_avx(auVar131,auVar138._0_16_);
                              auVar124 = vpshufd_avx(auVar172,0x55);
                              auVar124 = vpmaddwd_avx(auVar124,auVar178);
                              auVar160 = vpshufd_avx(auVar173,0x55);
                              auVar160 = vpmaddwd_avx(auVar160,auVar178);
                              auVar171 = vpshufd_avx(auVar179,0x55);
                              auVar171 = vpmaddwd_avx(auVar171,auVar178);
                              auVar167 = vpshufd_avx(auVar195,0x55);
                              auVar167 = vpmaddwd_avx(auVar167,auVar178);
                              auVar178 = vpshufd_avx(auVar172,0xaa);
                              auVar178 = vpmaddwd_avx(auVar178,auVar198);
                              auVar124 = vpaddd_avx(auVar124,auVar178);
                              auVar127 = vpaddd_avx(auVar124,auVar127);
                              auVar124 = vpshufd_avx(auVar173,0xaa);
                              auVar124 = vpmaddwd_avx(auVar124,auVar198);
                              auVar124 = vpaddd_avx(auVar160,auVar124);
                              auVar133 = vpaddd_avx(auVar124,auVar133);
                              auVar124 = vpshufd_avx(auVar179,0xaa);
                              auVar124 = vpmaddwd_avx(auVar124,auVar198);
                              auVar124 = vpaddd_avx(auVar171,auVar124);
                              auVar134 = vpaddd_avx(auVar124,auVar134);
                              auVar124 = vpshufd_avx(auVar195,0xaa);
                              auVar124 = vpmaddwd_avx(auVar124,auVar198);
                              auVar124 = vpaddd_avx(auVar167,auVar124);
                              auVar131 = vpaddd_avx(auVar124,auVar131);
                              auVar124 = vpshufd_avx(auVar172,0xff);
                              auVar124 = vpmaddwd_avx(auVar124,auVar196);
                              auVar127 = vpaddd_avx(auVar124,auVar127);
                              auVar150 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar173,0xff);
                              auVar127 = vpmaddwd_avx(auVar196,auVar127);
                              auVar127 = vpaddd_avx(auVar133,auVar127);
                              auVar146 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar179,0xff);
                              auVar127 = vpmaddwd_avx(auVar196,auVar127);
                              auVar127 = vpaddd_avx(auVar134,auVar127);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar195,0xff);
                              auVar127 = vpmaddwd_avx(auVar196,auVar127);
                              auVar127 = vpaddd_avx(auVar131,auVar127);
                              auVar138 = ZEXT1664(auVar127);
                              lVar103 = lVar103 + 4;
                            } while (lVar65 != lVar103);
                            pvVar87 = (void *)((long)pvVar87 + lVar93);
                          }
                          iVar88 = iVar52 + 0xf;
                          iVar52 = iVar52 + 8;
                        } while (iVar88 < (int)uVar90);
                        uVar112 = (ulong)uVar90 & 0xfffffff8;
                      }
                      if ((int)((uint)uVar112 | 1) < (int)uVar90) {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        do {
                          if (0 < (int)uVar54) {
                            lVar72 = local_3c8.cstep * local_3c8.elemsize * uVar112;
                            lVar103 = lVar72 + (iVar108 * iVar59) * lVar101 +
                                               (long)(int)(iVar79 * uVar119);
                            lVar105 = lVar72 + (iVar58 * iVar59) * lVar101 +
                                               (long)(int)(iVar97 * uVar119);
                            lVar113 = lVar72 + (iVar53 * iVar59) * lVar101 +
                                               (long)(int)(iVar71 * uVar119);
                            lVar72 = lVar72 + (iVar111 * iVar59) * lVar101 +
                                              (long)(int)(iVar118 * uVar119);
                            uVar68 = 0;
                            do {
                              lVar67 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar67 + lVar103)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar98 + lVar67 + lVar103),1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar134 = vpshufd_avx(auVar127,0);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar67 + lVar105)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar98 + lVar67 + lVar105),1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar131 = vpshufd_avx(auVar127,0);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar67 + lVar113)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar98 + lVar67 + lVar113),1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar124 = vpshufd_avx(auVar127,0);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar67 + lVar72)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar98 + lVar67 + lVar72),1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar160 = vpshufd_avx(auVar127,0);
                              auVar7._8_8_ = 0;
                              auVar7._0_8_ = *(ulong *)((long)pvVar87 + uVar68 * 8);
                              auVar133 = vpmovsxbw_avx(auVar7);
                              auVar127 = vpmaddwd_avx(auVar133,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar150._0_16_);
                              auVar150 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar133,auVar131);
                              auVar127 = vpaddd_avx(auVar127,auVar146._0_16_);
                              auVar146 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar133,auVar124);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar160,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          uVar112 = uVar112 + 2;
                        } while ((int)((uint)uVar112 | 1) < (int)uVar90);
                      }
                      auVar127 = auVar138._0_16_;
                      auVar133 = auVar143._0_16_;
                      auVar134 = auVar146._0_16_;
                      auVar131 = auVar150._0_16_;
                      if ((int)uVar112 < (int)uVar90) {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        uVar112 = uVar112 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = local_3c8.cstep * local_3c8.elemsize * uVar112;
                            uVar68 = 0;
                            do {
                              lVar105 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar127 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  lVar105 + lVar103 
                                                  + (iVar108 * iVar59) * lVar101 +
                                                    (long)(int)(iVar79 * uVar119))),0);
                              auVar127 = vpshufd_avx(auVar127,0);
                              auVar133 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  lVar105 + lVar103 
                                                  + (iVar58 * iVar59) * lVar101 +
                                                    (long)(int)(iVar97 * uVar119))),0);
                              auVar131 = vpshufd_avx(auVar133,0);
                              auVar133 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  lVar105 + lVar103 
                                                  + (iVar53 * iVar59) * lVar101 +
                                                    (long)(int)(iVar71 * uVar119))),0);
                              auVar124 = vpshufd_avx(auVar133,0);
                              auVar133 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  lVar105 + lVar103 
                                                  + (iVar111 * iVar59) * lVar101 +
                                                    (long)(int)(iVar118 * uVar119))),0);
                              auVar160 = vpshufd_avx(auVar133,0);
                              auVar8._8_8_ = 0;
                              auVar8._0_8_ = *(ulong *)((long)pvVar87 + uVar68 * 4);
                              auVar133 = vpmovsxbw_avx(auVar8);
                              auVar134 = vpmullw_avx(auVar133,auVar127);
                              auVar127 = vpmulhw_avx(auVar133,auVar127);
                              auVar127 = vpunpcklwd_avx(auVar134,auVar127);
                              auVar127 = vpaddd_avx(auVar150._0_16_,auVar127);
                              auVar150 = ZEXT1664(auVar127);
                              auVar134 = vpmullw_avx(auVar133,auVar131);
                              auVar127 = vpmulhw_avx(auVar133,auVar131);
                              auVar127 = vpunpcklwd_avx(auVar134,auVar127);
                              auVar127 = vpaddd_avx(auVar146._0_16_,auVar127);
                              auVar146 = ZEXT1664(auVar127);
                              auVar134 = vpmullw_avx(auVar133,auVar124);
                              auVar127 = vpmulhw_avx(auVar133,auVar124);
                              auVar127 = vpunpcklwd_avx(auVar134,auVar127);
                              auVar127 = vpaddd_avx(auVar143._0_16_,auVar127);
                              auVar143 = ZEXT1664(auVar127);
                              auVar134 = vpmullw_avx(auVar160,auVar133);
                              auVar127 = vpmulhw_avx(auVar160,auVar133);
                              auVar127 = vpunpcklwd_avx(auVar134,auVar127);
                              auVar127 = vpaddd_avx(auVar138._0_16_,auVar127);
                              auVar138 = ZEXT1664(auVar127);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar65);
                          }
                          auVar127 = auVar138._0_16_;
                          auVar133 = auVar143._0_16_;
                          auVar134 = auVar146._0_16_;
                          auVar131 = auVar150._0_16_;
                          uVar112 = uVar112 + 1;
                        } while ((int)uVar112 < (int)uVar90);
                      }
                      if (iVar78 == 1) {
                        auVar124 = vpunpckldq_avx(auVar131,auVar134);
                        auVar160 = vpunpcklqdq_avx(auVar124,auVar133);
                        auVar124 = vpshufd_avx(auVar127,0);
                        auVar124 = vpblendw_avx(auVar160,auVar124,0xc0);
                        *local_408 = auVar124;
                        *(int *)(*local_408 + (long)(int)uVar64 * 4) = auVar131._4_4_;
                        *(int *)(*local_408 + (long)(int)(uVar64 + 1) * 4) = auVar134._4_4_;
                        *(int *)(*local_408 + local_110 * 4) = auVar133._4_4_;
                        *(int *)(*local_408 + local_118 * 4) = auVar127._4_4_;
                        auVar124 = vpunpckhdq_avx(auVar131,auVar134);
                        *(long *)(*local_408 + (long)(int)(uVar64 * 2) * 4) = auVar124._0_8_;
                        auVar124 = vpunpckhdq_avx(auVar133,auVar127);
                        *(long *)(*local_408 + local_38 * 4) = auVar124._0_8_;
                        *(int *)(*local_408 + local_40 * 4) = auVar131._12_4_;
                        *(int *)(*local_408 + local_48 * 4) = auVar134._12_4_;
                        *(int *)(*local_408 + local_50 * 4) = auVar133._12_4_;
                        *(int *)(*local_408 + local_58 * 4) = auVar127._12_4_;
                        local_408 = local_408 + 1;
                      }
                      else if (iVar78 == 4) {
                        *local_408 = auVar131;
                        local_408[1] = auVar134;
                        local_408[2] = auVar133;
                        local_408[3] = auVar127;
                        local_408 = local_408 + 4;
                      }
                      uVar56 = uVar95 + 4;
                      pvVar87 = (void *)(ulong)uVar56;
                    } while ((int)(uVar95 + 7) < (int)uVar55);
                  }
                  uVar95 = uVar56 | 1;
                  if ((int)uVar95 < (int)uVar55) {
                    lVar60 = (long)iVar107;
                    local_378 = (void *)(long)(int)(uVar64 * 3);
                    local_350 = (ulong)(int)(uVar64 * 3 + 1);
                    uVar102 = uVar56;
                    do {
                      auVar127 = local_368;
                      local_368._4_4_ = 0;
                      local_368._0_4_ = uVar102;
                      local_368._8_8_ = auVar127._8_8_;
                      iVar97 = (int)uVar102 / local_318.w;
                      iVar71 = (int)uVar102 % local_318.w;
                      iVar111 = (int)uVar95 / local_318.w;
                      iVar118 = (int)uVar95 % local_318.w;
                      pvVar87 = (void *)((this->weight_data_tm).cstep * uVar73 *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                      if ((int)uVar90 < 8) {
                        uVar112 = 0;
                        auVar127 = (undefined1  [16])0x0;
                        auVar133 = (undefined1  [16])0x0;
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                      }
                      else {
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        iVar79 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar61 = (long)(iVar79 / iVar100) * local_3c8.cstep * local_3c8.elemsize
                            ;
                            lVar80 = 0;
                            do {
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  (long)*(int *)(opt_q._0_8_ + lVar80) +
                                                  lVar61 + (long)(iVar97 * iVar59) *
                                                           (long)local_3c8.w * local_3c8.elemsize +
                                                           (long)(iVar71 * iVar57));
                              puVar75 = (ulong *)((long)local_3c8.data +
                                                 (long)*(int *)(opt_q._0_8_ + lVar80) +
                                                 lVar61 + (long)(iVar111 * iVar59) *
                                                          (long)local_3c8.w * local_3c8.elemsize +
                                                          (long)(iVar118 * iVar57));
                              if (iVar100 == 8) {
                                auVar153._8_8_ = 0;
                                auVar153._0_8_ = *puVar109;
                                auVar163._8_8_ = 0;
                                auVar163._0_8_ = *puVar75;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar60),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 3),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 5),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 6),6);
                                auVar153 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 7),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar75),
                                                       (uint)*(byte *)((long)puVar75 + lVar60),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60 * 3),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60 * 5),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60 * 6),6);
                                auVar163 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60 * 7),7);
                              }
                              auVar160 = vpmovsxbw_avx(auVar153);
                              auVar171 = vpmovsxbw_avx(auVar163);
                              auVar127 = *(undefined1 (*) [16])((long)pvVar87 + lVar80 * 8);
                              auVar133 = *(undefined1 (*) [16])((long)pvVar87 + lVar80 * 8 + 0x10);
                              auVar134 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                              auVar131 = vpcmpgtb_avx((undefined1  [16])0x0,auVar133);
                              auVar178 = vpunpcklbw_avx(auVar127,auVar134);
                              auVar124 = vpunpckhbw_avx(auVar127,auVar134);
                              auVar172 = vpunpcklbw_avx(auVar133,auVar131);
                              auVar167 = vpunpckhbw_avx(auVar133,auVar131);
                              auVar127 = vpshufd_avx(auVar160,0);
                              auVar127 = vpmaddwd_avx(auVar127,auVar178);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar133 = vpshufd_avx(auVar171,0);
                              auVar133 = vpmaddwd_avx(auVar133,auVar178);
                              auVar133 = vpaddd_avx(auVar133,auVar143._0_16_);
                              auVar134 = vpshufd_avx(auVar160,0x55);
                              auVar134 = vpmaddwd_avx(auVar134,auVar124);
                              auVar134 = vpaddd_avx(auVar134,auVar150._0_16_);
                              auVar131 = vpshufd_avx(auVar171,0x55);
                              auVar131 = vpmaddwd_avx(auVar131,auVar124);
                              auVar131 = vpaddd_avx(auVar131,auVar146._0_16_);
                              auVar124 = vpshufd_avx(auVar160,0xaa);
                              auVar124 = vpmaddwd_avx(auVar172,auVar124);
                              auVar127 = vpaddd_avx(auVar127,auVar124);
                              auVar138 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar171,0xaa);
                              auVar127 = vpmaddwd_avx(auVar172,auVar127);
                              auVar127 = vpaddd_avx(auVar133,auVar127);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar160,0xff);
                              auVar127 = vpmaddwd_avx(auVar167,auVar127);
                              auVar127 = vpaddd_avx(auVar134,auVar127);
                              auVar150 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar171,0xff);
                              auVar127 = vpmaddwd_avx(auVar167,auVar127);
                              auVar127 = vpaddd_avx(auVar131,auVar127);
                              auVar146 = ZEXT1664(auVar127);
                              lVar80 = lVar80 + 4;
                            } while (lVar65 != lVar80);
                            pvVar87 = (void *)((long)pvVar87 + lVar93);
                          }
                          auVar133 = auVar150._0_16_;
                          auVar127 = auVar146._0_16_;
                          iVar58 = iVar79 + 0xf;
                          iVar79 = iVar79 + 8;
                        } while (iVar58 < (int)uVar90);
                        uVar112 = (ulong)uVar90 & 0xfffffff8;
                      }
                      if ((int)((uint)uVar112 | 1) < (int)uVar90) {
                        do {
                          if (0 < (int)uVar54) {
                            lVar80 = local_3c8.cstep * local_3c8.elemsize * uVar112;
                            lVar61 = lVar80 + (long)(iVar97 * iVar59) *
                                              (long)local_3c8.w * local_3c8.elemsize +
                                              (long)(int)(iVar71 * uVar119);
                            lVar80 = lVar80 + (long)(iVar111 * iVar59) *
                                              (long)local_3c8.w * local_3c8.elemsize +
                                              (long)(int)(iVar118 * uVar119);
                            uVar68 = 0;
                            do {
                              lVar86 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar134 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar86 + lVar61)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar60 + lVar86 + lVar61),1);
                              auVar134 = vpmovsxbw_avx(auVar134);
                              auVar124 = vpshufd_avx(auVar134,0);
                              auVar134 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar86 + lVar80)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar60 + lVar86 + lVar80),1);
                              auVar134 = vpmovsxbw_avx(auVar134);
                              auVar160 = vpshufd_avx(auVar134,0);
                              auVar9._8_8_ = 0;
                              auVar9._0_8_ = *(ulong *)((long)pvVar87 + uVar68 * 8);
                              auVar131 = vpmovsxbw_avx(auVar9);
                              auVar134 = vpmaddwd_avx(auVar124,auVar131);
                              auVar134 = vpaddd_avx(auVar134,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar134);
                              auVar134 = vpmaddwd_avx(auVar160,auVar131);
                              auVar134 = vpaddd_avx(auVar134,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar134);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          uVar112 = uVar112 + 2;
                        } while ((int)((uint)uVar112 | 1) < (int)uVar90);
                      }
                      auVar131 = auVar143._0_16_;
                      auVar134 = auVar138._0_16_;
                      if ((int)uVar112 < (int)uVar90) {
                        uVar112 = uVar112 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            lVar61 = local_3c8.cstep * local_3c8.elemsize * uVar112;
                            uVar68 = 0;
                            do {
                              lVar80 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar134 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  lVar80 + lVar61 + 
                                                  (long)(iVar97 * iVar59) *
                                                  (long)local_3c8.w * local_3c8.elemsize +
                                                  (long)(int)(iVar71 * uVar119))),0);
                              auVar134 = vpshufd_avx(auVar134,0);
                              auVar131 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  lVar80 + lVar61 + 
                                                  (long)(iVar111 * iVar59) *
                                                  (long)local_3c8.w * local_3c8.elemsize +
                                                  (long)(int)(iVar118 * uVar119))),0);
                              auVar160 = vpshufd_avx(auVar131,0);
                              auVar10._8_8_ = 0;
                              auVar10._0_8_ = *(ulong *)((long)pvVar87 + uVar68 * 4);
                              auVar131 = vpmovsxbw_avx(auVar10);
                              auVar124 = vpmullw_avx(auVar134,auVar131);
                              auVar134 = vpmulhw_avx(auVar134,auVar131);
                              auVar134 = vpunpcklwd_avx(auVar124,auVar134);
                              auVar134 = vpaddd_avx(auVar138._0_16_,auVar134);
                              auVar138 = ZEXT1664(auVar134);
                              auVar124 = vpmullw_avx(auVar160,auVar131);
                              auVar134 = vpmulhw_avx(auVar160,auVar131);
                              auVar134 = vpunpcklwd_avx(auVar124,auVar134);
                              auVar134 = vpaddd_avx(auVar143._0_16_,auVar134);
                              auVar143 = ZEXT1664(auVar134);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar65);
                          }
                          auVar131 = auVar143._0_16_;
                          auVar134 = auVar138._0_16_;
                          uVar112 = uVar112 + 1;
                        } while ((int)uVar112 < (int)uVar90);
                      }
                      auVar127 = vpaddd_avx(auVar131,auVar127);
                      auVar133 = vpaddd_avx(auVar134,auVar133);
                      if (iVar78 == 1) {
                        auVar134 = vpunpckldq_avx(auVar133,auVar127);
                        *(long *)*local_408 = auVar134._0_8_;
                        *(int *)(*local_408 + (long)(int)uVar64 * 4) = auVar133._4_4_;
                        *(int *)(*local_408 + (long)(int)(uVar64 + 1) * 4) = auVar127._4_4_;
                        auVar134 = vpunpckhdq_avx(auVar133,auVar127);
                        *(long *)(*local_408 + (long)(int)(uVar64 * 2) * 4) = auVar134._0_8_;
                        *(int *)(*local_408 + (long)local_378 * 4) = auVar133._12_4_;
                        *(int *)(*local_408 + local_350 * 4) = auVar127._12_4_;
                        local_408 = (undefined1 (*) [16])(*local_408 + 8);
                      }
                      else if (iVar78 == 4) {
                        *local_408 = auVar133;
                        local_408[1] = auVar127;
                        local_408 = local_408 + 2;
                      }
                      uVar56 = uVar102 + 2;
                      uVar95 = uVar102 + 3;
                      uVar102 = uVar56;
                    } while ((int)uVar95 < (int)uVar55);
                  }
                  if ((int)uVar56 < (int)uVar55) {
                    lVar60 = (long)iVar107;
                    local_368._0_8_ = (long)(int)uVar64;
                    do {
                      iVar107 = (int)uVar56 / local_318.w;
                      iVar111 = (int)uVar56 % local_318.w;
                      pvVar87 = (void *)((this->weight_data_tm).cstep * uVar73 *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                      if ((int)uVar90 < 8) {
                        uVar112 = 0;
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                      }
                      else {
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                        iVar118 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar61 = 0;
                            do {
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  (long)*(int *)(opt_q._0_8_ + lVar61) +
                                                  (long)(iVar118 / iVar100) *
                                                  local_3c8.cstep * local_3c8.elemsize +
                                                  (long)(iVar111 * iVar57) +
                                                  (long)local_3c8.w * local_3c8.elemsize *
                                                  (long)(iVar107 * iVar59));
                              if (iVar100 == 8) {
                                auVar154._8_8_ = 0;
                                auVar154._0_8_ = *puVar109;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar60),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 3),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 5),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 6),6);
                                auVar154 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60 * 7),7);
                              }
                              auVar124 = vpmovsxbw_avx(auVar154);
                              auVar127 = *(undefined1 (*) [16])((long)pvVar87 + lVar61 * 8);
                              auVar133 = *(undefined1 (*) [16])((long)pvVar87 + lVar61 * 8 + 0x10);
                              auVar134 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                              auVar131 = vpcmpgtb_avx((undefined1  [16])0x0,auVar133);
                              auVar160 = vpunpcklbw_avx(auVar127,auVar134);
                              auVar134 = vpunpckhbw_avx(auVar127,auVar134);
                              auVar171 = vpunpcklbw_avx(auVar133,auVar131);
                              auVar133 = vpunpckhbw_avx(auVar133,auVar131);
                              auVar127 = vpshufd_avx(auVar124,0);
                              auVar127 = vpmaddwd_avx(auVar127,auVar160);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar124,0x55);
                              auVar127 = vpmaddwd_avx(auVar127,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar124,0xaa);
                              auVar127 = vpmaddwd_avx(auVar171,auVar127);
                              auVar127 = vpaddd_avx(auVar127,auVar146._0_16_);
                              auVar146 = ZEXT1664(auVar127);
                              auVar127 = vpshufd_avx(auVar124,0xff);
                              auVar127 = vpmaddwd_avx(auVar127,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar150._0_16_);
                              auVar150 = ZEXT1664(auVar127);
                              lVar61 = lVar61 + 4;
                            } while (lVar65 != lVar61);
                            pvVar87 = (void *)((long)pvVar87 + lVar93);
                          }
                          iVar71 = iVar118 + 0xf;
                          iVar118 = iVar118 + 8;
                        } while (iVar71 < (int)uVar90);
                        auVar127 = vpaddd_avx(auVar146._0_16_,auVar150._0_16_);
                        auVar133 = vpaddd_avx(auVar143._0_16_,auVar138._0_16_);
                        auVar127 = vpaddd_avx(auVar127,auVar133);
                        auVar138 = ZEXT1664(auVar127);
                        uVar112 = (ulong)uVar90 & 0xfffffff8;
                      }
                      if ((int)((uint)uVar112 | 1) < (int)uVar90) {
                        do {
                          if (0 < (int)uVar54) {
                            lVar61 = local_3c8.cstep * local_3c8.elemsize * uVar112 +
                                     (long)(int)(iVar111 * uVar119) +
                                     (long)local_3c8.w * local_3c8.elemsize *
                                     (long)(iVar107 * iVar59);
                            uVar68 = 0;
                            do {
                              lVar80 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar80 + lVar61)),
                                                     (uint)*(byte *)((long)local_3c8.data +
                                                                    lVar60 + lVar80 + lVar61),1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar133 = vpshufd_avx(auVar127,0);
                              auVar11._8_8_ = 0;
                              auVar11._0_8_ = *(ulong *)((long)pvVar87 + uVar68 * 8);
                              auVar127 = vpmovsxbw_avx(auVar11);
                              auVar127 = vpmaddwd_avx(auVar133,auVar127);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          uVar112 = uVar112 + 2;
                        } while ((int)((uint)uVar112 | 1) < (int)uVar90);
                      }
                      auVar127 = auVar138._0_16_;
                      if ((int)uVar112 < (int)uVar90) {
                        uVar112 = uVar112 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            uVar68 = 0;
                            do {
                              auVar127 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                         data +
                                                                                  (long)*(int *)(
                                                  opt_q._0_8_ + uVar68 * 4) +
                                                  local_3c8.cstep * local_3c8.elemsize * uVar112 +
                                                  (long)(int)(iVar111 * uVar119) +
                                                  (long)(iVar107 * iVar59) * (long)local_3c8.w *
                                                  local_3c8.elemsize)),0);
                              auVar134 = vpshufd_avx(auVar127,0);
                              auVar12._8_8_ = 0;
                              auVar12._0_8_ = *(ulong *)((long)pvVar87 + uVar68 * 4);
                              auVar127 = vpmovsxbw_avx(auVar12);
                              auVar133 = vpmullw_avx(auVar134,auVar127);
                              auVar127 = vpmulhw_avx(auVar134,auVar127);
                              auVar127 = vpunpcklwd_avx(auVar133,auVar127);
                              auVar127 = vpaddd_avx(auVar138._0_16_,auVar127);
                              auVar138 = ZEXT1664(auVar127);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar65);
                          }
                          auVar127 = auVar138._0_16_;
                          uVar112 = uVar112 + 1;
                        } while ((int)uVar112 < (int)uVar90);
                      }
                      if (iVar78 == 1) {
                        *(int *)*local_408 = auVar127._0_4_;
                        *(int *)(*local_408 + (long)(int)uVar64 * 4) = auVar127._4_4_;
                        *(int *)(*local_408 + (long)(int)(uVar64 * 2) * 4) = auVar127._8_4_;
                        *(int *)(*local_408 + (long)(int)(uVar64 * 3) * 4) = auVar127._12_4_;
                        local_408 = (undefined1 (*) [16])(*local_408 + 4);
                      }
                      else if (iVar78 == 4) {
                        *local_408 = auVar127;
                        local_408 = local_408 + 1;
                      }
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar55);
                  }
                  uVar73 = uVar73 + 1;
                } while (uVar73 != local_60);
              }
              iVar57 = uVar84 + uVar94 * -4;
              uVar55 = iVar57 / 2;
              if (1 < iVar57) {
                iVar57 = iVar100 * uVar119;
                local_2d0 = CONCAT44(local_2d0._4_4_,iVar57);
                local_328 = CONCAT44(local_328._4_4_,uVar90) & 0xfffffffffffffff8;
                local_110 = (long)(int)(uVar94 * 4);
                lVar93 = uVar83 * 0x10;
                lVar63 = uVar83 * 4;
                lVar65 = uVar83 * 2;
                uVar73 = 0;
                do {
                  lVar60 = local_110 + uVar73 * 2;
                  iVar78 = (int)local_3c8.cstep * iVar100;
                  local_400 = (undefined1 (*) [16])
                              (local_318.elemsize * local_318.cstep * lVar60 + (long)local_318.data)
                  ;
                  local_408 = (undefined1 (*) [16])
                              ((local_110 + uVar73 * 2 + 1) * local_318.elemsize * local_318.cstep +
                              (long)local_318.data);
                  uVar56 = local_318.h * local_318.w;
                  uVar64 = (uint)lVar60;
                  if ((int)uVar56 < 4) {
                    uVar95 = 0;
                  }
                  else {
                    uVar95 = uVar64 + 3;
                    if (-1 < (int)uVar64) {
                      uVar95 = uVar64;
                    }
                    local_238 = (ulong)(((int)(uVar64 - (uVar95 & 0xfffffffc)) >> 1) +
                                       ((int)uVar95 >> 2));
                    lVar98 = (long)iVar78;
                    lVar60 = lVar98 * 3;
                    lVar61 = lVar98 * 5;
                    lVar80 = lVar98 * 6;
                    local_368._0_8_ = lVar80;
                    lVar86 = lVar98 * 7;
                    uVar102 = 0;
                    do {
                      iVar108 = (int)uVar102 / local_318.w;
                      iVar79 = (int)uVar102 % local_318.w;
                      uVar112 = CONCAT44((int)(uVar102 | 1) >> 0x1f,uVar102) | 1;
                      uVar68 = CONCAT44((int)(uVar102 | 2) >> 0x1f,uVar102) | 2;
                      iVar71 = (int)((long)uVar68 / (long)local_318.w);
                      uVar104 = CONCAT44((int)(uVar102 | 3) >> 0x1f,uVar102) | 3;
                      iVar107 = (int)((long)uVar104 / (long)local_318.w);
                      pvVar87 = (void *)((this->weight_data_tm).cstep * local_238 *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                      auVar138 = ZEXT1664((undefined1  [16])0x0);
                      auVar127 = (undefined1  [16])0x0;
                      iVar58 = (int)((long)uVar112 / (long)local_318.w);
                      iVar111 = (int)((long)uVar104 % (long)local_318.w);
                      local_378 = (void *)CONCAT44(local_378._4_4_,iVar111);
                      iVar118 = (int)((long)uVar68 % (long)local_318.w);
                      local_350 = CONCAT44(local_350._4_4_,iVar118);
                      local_330 = (void *)CONCAT44(local_330._4_4_,iVar107);
                      iVar97 = (int)((long)uVar112 % (long)local_318.w);
                      local_320 = CONCAT44(local_320._4_4_,iVar97);
                      local_2c8 = CONCAT44(local_2c8._4_4_,iVar71);
                      if ((int)uVar90 < 8) {
                        auVar171 = (undefined1  [16])0x0;
                        auVar133 = (undefined1  [16])0x0;
                        auVar160 = (undefined1  [16])0x0;
                        auVar124 = (undefined1  [16])0x0;
                        auVar167 = (undefined1  [16])0x0;
                        auVar131 = (undefined1  [16])0x0;
                        auVar134 = (undefined1  [16])0x0;
                        uVar112 = 0;
                      }
                      else {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                        auVar177 = ZEXT1664((undefined1  [16])0x0);
                        auVar159 = ZEXT1664((undefined1  [16])0x0);
                        auVar166 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar170 = ZEXT1664((undefined1  [16])0x0);
                        iVar53 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = (long)(iVar53 / iVar100) *
                                      local_3c8.cstep * local_3c8.elemsize;
                            lVar105 = 0;
                            do {
                              lVar113 = (long)*(int *)(opt_q._0_8_ + lVar105);
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  lVar113 + lVar103 + (iVar108 * iVar59) * lVar101 +
                                                                      (long)(iVar79 * iVar57));
                              puVar75 = (ulong *)((long)local_3c8.data +
                                                 lVar113 + lVar103 + (iVar58 * iVar59) * lVar101 +
                                                                     (long)(iVar97 * iVar57));
                              puVar1 = (ulong *)((long)local_3c8.data +
                                                lVar113 + lVar103 + (iVar71 * iVar59) * lVar101 +
                                                                    (long)(iVar118 * iVar57));
                              puVar114 = (ulong *)((long)local_3c8.data +
                                                  lVar113 + lVar103 + (iVar107 * iVar59) * lVar101 +
                                                                      (long)(iVar111 * iVar57));
                              if (iVar100 == 8) {
                                auVar182._8_8_ = 0;
                                auVar182._0_8_ = *puVar109;
                                auVar187._8_8_ = 0;
                                auVar187._0_8_ = *puVar75;
                                auVar191._8_8_ = 0;
                                auVar191._0_8_ = *puVar1;
                                auVar197._8_8_ = 0;
                                auVar197._0_8_ = *puVar114;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80),6);
                                auVar182 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar75),
                                                       (uint)*(byte *)((long)puVar75 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80),6);
                                auVar187 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar1),
                                                       (uint)*(byte *)((long)puVar1 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar80),6);
                                auVar191 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar114),
                                                       (uint)*(byte *)((long)puVar114 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar80),6);
                                auVar197 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar86),7);
                              }
                              auVar134 = vpmovsxbw_avx(auVar182);
                              auVar131 = vpmovsxbw_avx(auVar187);
                              auVar124 = vpmovsxbw_avx(auVar191);
                              auVar160 = vpmovsxbw_avx(auVar197);
                              auVar127 = *(undefined1 (*) [16])((long)pvVar87 + lVar105 * 4);
                              auVar133 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                              auVar171 = vpunpcklbw_avx(auVar127,auVar133);
                              auVar133 = vpunpckhbw_avx(auVar127,auVar133);
                              auVar127 = vpmaddwd_avx(auVar134,auVar171);
                              auVar127 = vpaddd_avx(auVar127,auVar146._0_16_);
                              auVar146 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar134,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar150._0_16_);
                              auVar150 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar131,auVar171);
                              auVar127 = vpaddd_avx(auVar127,auVar177._0_16_);
                              auVar177 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar131,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar159._0_16_);
                              auVar159 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar124,auVar171);
                              auVar127 = vpaddd_avx(auVar127,auVar166._0_16_);
                              auVar166 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar124,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar160,auVar171);
                              auVar127 = vpaddd_avx(auVar127,auVar170._0_16_);
                              auVar170 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar160,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              lVar105 = lVar105 + 4;
                            } while (lVar63 != lVar105);
                            pvVar87 = (void *)((long)pvVar87 + lVar93);
                          }
                          auVar133 = auVar143._0_16_;
                          auVar127 = auVar138._0_16_;
                          auVar124 = auVar159._0_16_;
                          auVar131 = auVar150._0_16_;
                          auVar171 = auVar170._0_16_;
                          auVar160 = auVar166._0_16_;
                          auVar167 = auVar177._0_16_;
                          auVar134 = auVar146._0_16_;
                          iVar52 = iVar53 + 0xf;
                          iVar53 = iVar53 + 8;
                        } while (iVar52 < (int)uVar90);
                        uVar112 = (ulong)uVar90 & 0xfffffff8;
                      }
                      auVar178 = vpunpckldq_avx(auVar134,auVar167);
                      auVar172 = vpunpckldq_avx(auVar160,auVar171);
                      auVar134 = vpunpckhdq_avx(auVar134,auVar167);
                      auVar160 = vpunpckhdq_avx(auVar160,auVar171);
                      auVar171 = vpunpckldq_avx(auVar131,auVar124);
                      auVar167 = vpunpckldq_avx(auVar133,auVar127);
                      auVar131 = vpunpckhdq_avx(auVar131,auVar124);
                      auVar124 = vpunpckhdq_avx(auVar133,auVar127);
                      auVar133 = vpunpcklqdq_avx(auVar178,auVar172);
                      auVar127 = vpunpckhqdq_avx(auVar178,auVar172);
                      auVar127 = vpaddd_avx(auVar133,auVar127);
                      auVar178 = vpunpcklqdq_avx(auVar134,auVar160);
                      auVar133 = vpunpckhqdq_avx(auVar134,auVar160);
                      auVar133 = vpaddd_avx(auVar133,auVar178);
                      auVar127 = vpaddd_avx(auVar127,auVar133);
                      auVar138 = ZEXT1664(auVar127);
                      auVar133 = vpunpcklqdq_avx(auVar171,auVar167);
                      auVar127 = vpunpckhqdq_avx(auVar171,auVar167);
                      auVar127 = vpaddd_avx(auVar133,auVar127);
                      auVar134 = vpunpcklqdq_avx(auVar131,auVar124);
                      auVar133 = vpunpckhqdq_avx(auVar131,auVar124);
                      auVar133 = vpaddd_avx(auVar133,auVar134);
                      auVar127 = vpaddd_avx(auVar127,auVar133);
                      auVar143 = ZEXT1664(auVar127);
                      if ((int)((uint)uVar112 | 1) < (int)uVar90) {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        do {
                          if (0 < (int)uVar54) {
                            lVar72 = local_3c8.cstep * local_3c8.elemsize * uVar112;
                            lVar103 = lVar72 + (iVar108 * iVar59) * lVar101 +
                                               (long)(int)(iVar79 * uVar119);
                            lVar105 = lVar72 + (iVar58 * iVar59) * lVar101 +
                                               (long)(int)(iVar97 * uVar119);
                            lVar113 = lVar72 + (iVar71 * iVar59) * lVar101 +
                                               (long)(int)(iVar118 * uVar119);
                            lVar72 = lVar72 + (iVar107 * iVar59) * lVar101 +
                                              (long)(int)(iVar111 * uVar119);
                            uVar68 = 0;
                            do {
                              lVar67 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar127 = vpinsrw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                        data +
                                                                                 lVar67 + lVar103)),
                                                     (int)*(char *)((long)local_3c8.data +
                                                                   lVar98 + lVar67 + lVar103),1);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar67 + lVar105),2);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar98 + lVar67 + 
                                                  lVar105),3);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar67 + lVar113),4);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar98 + lVar67 + 
                                                  lVar113),5);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar67 + lVar72),6);
                              auVar133 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar98 + lVar67 + lVar72
                                                                            ),7);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)pvVar87 + uVar68 * 4)),
                                                     (uint)*(byte *)((long)pvVar87 + uVar68 * 4 + 2)
                                                     ,1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar134 = vpshufd_avx(auVar127,0);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)pvVar87 +
                                                                      uVar68 * 4 + 1)),
                                                     (uint)*(byte *)((long)pvVar87 + uVar68 * 4 + 3)
                                                     ,1);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar131 = vpshufd_avx(auVar127,0);
                              auVar127 = vpmaddwd_avx(auVar133,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar133,auVar131);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          uVar112 = uVar112 + 2;
                        } while ((int)((uint)uVar112 | 1) < (int)uVar90);
                      }
                      auVar133 = auVar143._0_16_;
                      auVar127 = auVar138._0_16_;
                      if ((int)uVar112 < (int)uVar90) {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        uVar112 = uVar112 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = local_3c8.cstep * local_3c8.elemsize * uVar112;
                            uVar68 = 0;
                            do {
                              lVar105 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              auVar127 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_3c8.data +
                                                                      lVar105 + lVar103 + (iVar108 *
                                                                                          iVar59) * 
                                                  lVar101 + (long)(int)(iVar79 * uVar119))),
                                                  (uint)*(byte *)((long)local_3c8.data +
                                                                 lVar105 + lVar103 + (iVar58 * 
                                                  iVar59) * lVar101 + (long)(int)(iVar97 * uVar119))
                                                  ,1);
                              auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)local_3c8.data +
                                                                             lVar105 + lVar103 + (
                                                  iVar71 * iVar59) * lVar101 +
                                                  (long)(int)(iVar118 * uVar119)),2);
                              auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)local_3c8.data +
                                                                             lVar105 + lVar103 + (
                                                  iVar107 * iVar59) * lVar101 +
                                                  (long)(int)(iVar111 * uVar119)),3);
                              auVar127 = vpmovsxbw_avx(auVar127);
                              auVar133 = vpshufd_avx(auVar127,0x44);
                              auVar127 = vpmovsxbw_avx(ZEXT216(*(ushort *)
                                                                ((long)pvVar87 + uVar68 * 2)));
                              auVar127 = vpshuflw_avx(auVar127,0x50);
                              auVar127 = vpshufd_avx(auVar127,0x50);
                              auVar134 = vpmullw_avx(auVar127,auVar133);
                              auVar133 = vpmulhw_avx(auVar133,auVar127);
                              auVar127 = vpunpcklwd_avx(auVar134,auVar133);
                              auVar127 = vpaddd_avx(auVar138._0_16_,auVar127);
                              auVar138 = ZEXT1664(auVar127);
                              auVar127 = vpunpckhwd_avx(auVar134,auVar133);
                              auVar127 = vpaddd_avx(auVar143._0_16_,auVar127);
                              auVar143 = ZEXT1664(auVar127);
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar65);
                          }
                          auVar133 = auVar143._0_16_;
                          auVar127 = auVar138._0_16_;
                          uVar112 = uVar112 + 1;
                        } while ((int)uVar112 < (int)uVar90);
                      }
                      *local_400 = auVar127;
                      *local_408 = auVar133;
                      local_400 = local_400 + 1;
                      local_408 = local_408 + 1;
                      uVar95 = uVar102 + 4;
                      iVar107 = uVar102 + 7;
                      uVar102 = uVar95;
                    } while (iVar107 < (int)uVar56);
                  }
                  uVar102 = uVar95 | 1;
                  if ((int)uVar102 < (int)uVar56) {
                    uVar85 = uVar64 + 3;
                    if (-1 < (int)uVar64) {
                      uVar85 = uVar64;
                    }
                    local_330 = (void *)((long)(((int)(uVar64 - (uVar85 & 0xfffffffc)) >> 1) +
                                               ((int)uVar85 >> 2)) * (this->weight_data_tm).cstep *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                    local_378 = local_3c8.data;
                    local_350 = local_3c8.elemsize;
                    lVar61 = local_3c8.cstep * local_3c8.elemsize;
                    lVar80 = (long)iVar78;
                    lVar60 = lVar80 * 3;
                    local_368._0_8_ = lVar60;
                    uVar85 = uVar95;
                    do {
                      iVar118 = (int)uVar85 / local_318.w;
                      iVar71 = (int)uVar85 % local_318.w;
                      iVar107 = (int)uVar102 / local_318.w;
                      iVar111 = (int)uVar102 % local_318.w;
                      pvVar87 = local_330;
                      if ((int)uVar90 < 8) {
                        uVar112 = 0;
                        auVar127 = (undefined1  [16])0x0;
                        auVar133 = (undefined1  [16])0x0;
                        auVar131 = (undefined1  [16])0x0;
                        auVar134 = (undefined1  [16])0x0;
                      }
                      else {
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                        iVar97 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar86 = (iVar97 / iVar100) * lVar61;
                            lVar98 = 0;
                            do {
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  (long)*(int *)(opt_q._0_8_ + lVar98) +
                                                  lVar86 + (long)(iVar118 * iVar59) *
                                                           (long)local_3c8.w * local_3c8.elemsize +
                                                           (long)(iVar71 * iVar57));
                              puVar75 = (ulong *)((long)local_3c8.data +
                                                 (long)*(int *)(opt_q._0_8_ + lVar98) +
                                                 lVar86 + (long)(iVar107 * iVar59) *
                                                          (long)local_3c8.w * local_3c8.elemsize +
                                                          (long)(iVar111 * iVar57));
                              if (iVar100 == 8) {
                                auVar155._8_8_ = 0;
                                auVar155._0_8_ = *puVar109;
                                auVar164._8_8_ = 0;
                                auVar164._0_8_ = *puVar75;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar80),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80 * 5),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80 * 6),6);
                                auVar155 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80 * 7),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar75),
                                                       (uint)*(byte *)((long)puVar75 + lVar80),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80 * 5),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80 * 6),6);
                                auVar164 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80 * 7),7);
                              }
                              auVar134 = vpmovsxbw_avx(auVar155);
                              auVar131 = vpmovsxbw_avx(auVar164);
                              auVar127 = *(undefined1 (*) [16])((long)pvVar87 + lVar98 * 4);
                              auVar133 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                              auVar124 = vpunpcklbw_avx(auVar127,auVar133);
                              auVar133 = vpunpckhbw_avx(auVar127,auVar133);
                              auVar127 = vpmaddwd_avx(auVar124,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar146._0_16_);
                              auVar146 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar134,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar150._0_16_);
                              auVar150 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar124,auVar131);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar131,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              lVar98 = lVar98 + 4;
                            } while (lVar63 != lVar98);
                            pvVar87 = (void *)((long)pvVar87 + lVar93);
                          }
                          auVar127 = auVar138._0_16_;
                          auVar133 = auVar143._0_16_;
                          auVar131 = auVar150._0_16_;
                          auVar134 = auVar146._0_16_;
                          iVar79 = iVar97 + 0xf;
                          iVar97 = iVar97 + 8;
                        } while (iVar79 < (int)uVar90);
                        uVar112 = (ulong)uVar90 & 0xfffffff8;
                      }
                      auVar134 = vphaddd_avx(auVar134,auVar134);
                      auVar134 = vphaddd_avx(auVar134,auVar134);
                      auVar131 = vphaddd_avx(auVar131,auVar131);
                      auVar131 = vphaddd_avx(auVar131,auVar131);
                      auVar133 = vphaddd_avx(auVar133,auVar133);
                      iVar58 = auVar134._0_4_;
                      auVar133 = vphaddd_avx(auVar133,auVar133);
                      iVar97 = auVar131._0_4_;
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar108 = auVar133._0_4_;
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar79 = auVar127._0_4_;
                      if ((int)((uint)uVar112 | 1) < (int)uVar90) {
                        do {
                          if (0 < (int)uVar54) {
                            lVar86 = uVar112 * lVar61 +
                                     (long)(iVar118 * iVar59) *
                                     (long)local_3c8.w * local_3c8.elemsize +
                                     (long)(int)(iVar71 * uVar119);
                            lVar98 = uVar112 * lVar61 +
                                     (long)(iVar107 * iVar59) *
                                     (long)local_3c8.w * local_3c8.elemsize +
                                     (long)(int)(iVar111 * uVar119);
                            uVar68 = 0;
                            do {
                              lVar101 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              iVar88 = (int)*(char *)((long)local_3c8.data + lVar101 + lVar86);
                              iVar52 = (int)*(char *)((long)pvVar87 + uVar68 * 4);
                              iVar70 = (int)*(char *)((long)pvVar87 + uVar68 * 4 + 1);
                              iVar53 = (int)*(char *)((long)local_3c8.data +
                                                     lVar80 + lVar101 + lVar86);
                              iVar117 = (int)*(char *)((long)local_3c8.data + lVar101 + lVar98);
                              iVar89 = (int)*(char *)((long)pvVar87 + uVar68 * 4 + 2);
                              iVar58 = iVar89 * iVar53 + iVar52 * iVar88 + iVar58;
                              iVar110 = (int)*(char *)((long)pvVar87 + uVar68 * 4 + 3);
                              iVar97 = iVar53 * iVar110 + iVar88 * iVar70 + iVar97;
                              iVar53 = (int)*(char *)((long)local_3c8.data +
                                                     lVar80 + lVar101 + lVar98);
                              iVar108 = iVar89 * iVar53 + iVar52 * iVar117 + iVar108;
                              iVar79 = iVar53 * iVar110 + iVar117 * iVar70 + iVar79;
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          uVar112 = uVar112 + 2;
                        } while ((int)((uint)uVar112 | 1) < (int)uVar90);
                      }
                      if ((int)uVar112 < (int)uVar90) {
                        uVar112 = uVar112 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            uVar68 = 0;
                            do {
                              lVar86 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              iVar53 = (int)*(char *)((long)local_3c8.data +
                                                     lVar86 + uVar112 * lVar61 +
                                                              (long)(iVar118 * iVar59) *
                                                              (long)local_3c8.w * local_3c8.elemsize
                                                              + (long)(int)(iVar71 * uVar119));
                              iVar52 = (int)*(char *)((long)pvVar87 + uVar68 * 2);
                              iVar58 = iVar58 + iVar52 * iVar53;
                              iVar88 = (int)*(char *)((long)pvVar87 + uVar68 * 2 + 1);
                              iVar97 = iVar97 + iVar53 * iVar88;
                              iVar53 = (int)*(char *)((long)local_3c8.data +
                                                     lVar86 + uVar112 * lVar61 +
                                                              (long)(iVar107 * iVar59) *
                                                              (long)local_3c8.w * local_3c8.elemsize
                                                              + (long)(int)(iVar111 * uVar119));
                              iVar108 = iVar108 + iVar52 * iVar53;
                              iVar79 = iVar79 + iVar53 * iVar88;
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar87 = (void *)((long)pvVar87 + lVar65);
                          }
                          uVar112 = uVar112 + 1;
                        } while ((int)uVar112 < (int)uVar90);
                      }
                      *(int *)*local_400 = iVar58;
                      *(int *)(*local_400 + 4) = iVar108;
                      *(int *)*local_408 = iVar97;
                      *(int *)(*local_408 + 4) = iVar79;
                      local_400 = (undefined1 (*) [16])(*local_400 + 8);
                      local_408 = (undefined1 (*) [16])(*local_408 + 8);
                      uVar95 = uVar85 + 2;
                      uVar102 = uVar85 + 3;
                      uVar85 = uVar95;
                    } while ((int)uVar102 < (int)uVar56);
                  }
                  if ((int)uVar95 < (int)uVar56) {
                    uVar102 = uVar64 + 3;
                    if (-1 < (int)uVar64) {
                      uVar102 = uVar64;
                    }
                    pvVar87 = (void *)((long)(((int)(uVar64 - (uVar102 & 0xfffffffc)) >> 1) +
                                             ((int)uVar102 >> 2)) * (this->weight_data_tm).cstep *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    lVar60 = local_3c8.cstep * local_3c8.elemsize;
                    lVar61 = (long)iVar78;
                    do {
                      local_368._0_4_ = uVar95;
                      iVar78 = (int)uVar95 / local_318.w;
                      iVar107 = (int)uVar95 % local_318.w;
                      pvVar123 = pvVar87;
                      if ((int)uVar90 < 8) {
                        uVar112 = 0;
                        auVar133 = (undefined1  [16])0x0;
                        auVar127 = (undefined1  [16])0x0;
                      }
                      else {
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        iVar111 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar80 = 0;
                            do {
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  (long)*(int *)(opt_q._0_8_ + lVar80) +
                                                  (iVar111 / iVar100) * lVar60 +
                                                  (long)local_3c8.w * local_3c8.elemsize *
                                                  (long)(iVar78 * iVar59) + (long)(iVar107 * iVar57)
                                                  );
                              if (iVar100 == 8) {
                                auVar144._8_8_ = 0;
                                auVar144._0_8_ = *puVar109;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar61),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61 * 3),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61 * 5),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61 * 6),6);
                                auVar144 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61 * 7),7);
                              }
                              auVar134 = vpmovsxbw_avx(auVar144);
                              auVar127 = *(undefined1 (*) [16])((long)pvVar123 + lVar80 * 4);
                              auVar133 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                              auVar131 = vpunpcklbw_avx(auVar127,auVar133);
                              auVar133 = vpunpckhbw_avx(auVar127,auVar133);
                              auVar127 = vpmaddwd_avx(auVar134,auVar131);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar134,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              lVar80 = lVar80 + 4;
                            } while (lVar63 != lVar80);
                            pvVar123 = (void *)((long)pvVar123 + lVar93);
                          }
                          auVar127 = auVar138._0_16_;
                          auVar133 = auVar143._0_16_;
                          iVar118 = iVar111 + 0xf;
                          iVar111 = iVar111 + 8;
                        } while (iVar118 < (int)uVar90);
                        uVar112 = (ulong)uVar90 & 0xfffffff8;
                      }
                      auVar133 = vphaddd_avx(auVar133,auVar133);
                      auVar133 = vphaddd_avx(auVar133,auVar133);
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar111 = auVar133._0_4_;
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar118 = auVar127._0_4_;
                      if ((int)((uint)uVar112 | 1) < (int)uVar90) {
                        do {
                          if (0 < (int)uVar54) {
                            lVar80 = uVar112 * lVar60 +
                                     (long)local_3c8.w * local_3c8.elemsize *
                                     (long)(iVar78 * iVar59) + (long)(int)(iVar107 * uVar119);
                            uVar68 = 0;
                            do {
                              lVar86 = (long)*(int *)(opt_q._0_8_ + uVar68 * 4);
                              iVar71 = (int)*(char *)((long)local_3c8.data + lVar86 + lVar80);
                              iVar97 = (int)*(char *)((long)local_3c8.data +
                                                     lVar61 + lVar86 + lVar80);
                              iVar111 = *(char *)((long)pvVar123 + uVar68 * 4 + 2) * iVar97 +
                                        *(char *)((long)pvVar123 + uVar68 * 4) * iVar71 + iVar111;
                              iVar118 = *(char *)((long)pvVar123 + uVar68 * 4 + 3) * iVar97 +
                                        *(char *)((long)pvVar123 + uVar68 * 4 + 1) * iVar71 +
                                        iVar118;
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar123 = (void *)((long)pvVar123 + lVar63);
                          }
                          uVar112 = uVar112 + 2;
                        } while ((int)((uint)uVar112 | 1) < (int)uVar90);
                      }
                      if ((int)uVar112 < (int)uVar90) {
                        uVar112 = uVar112 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            uVar68 = 0;
                            do {
                              iVar71 = (int)*(char *)((long)local_3c8.data +
                                                     (long)*(int *)(opt_q._0_8_ + uVar68 * 4) +
                                                     uVar112 * lVar60 +
                                                     (long)(iVar78 * iVar59) * local_3c8.elemsize *
                                                     (long)local_3c8.w +
                                                     (long)(int)(iVar107 * uVar119));
                              iVar111 = iVar111 + *(char *)((long)pvVar123 + uVar68 * 2) * iVar71;
                              iVar118 = iVar118 + *(char *)((long)pvVar123 + uVar68 * 2 + 1) *
                                                  iVar71;
                              uVar68 = uVar68 + 1;
                            } while (uVar83 != uVar68);
                            pvVar123 = (void *)((long)pvVar123 + lVar65);
                          }
                          uVar112 = uVar112 + 1;
                        } while ((int)uVar112 < (int)uVar90);
                      }
                      *(int *)*local_400 = iVar111;
                      *(int *)*local_408 = iVar118;
                      local_400 = (undefined1 (*) [16])(*local_400 + 4);
                      local_408 = (undefined1 (*) [16])(*local_408 + 4);
                      uVar95 = uVar95 + 1;
                    } while (uVar95 != uVar56);
                  }
                  uVar73 = uVar73 + 1;
                  local_118 = (ulong)uVar55;
                } while (uVar73 != uVar55);
              }
              iVar57 = uVar94 * 4 + uVar55 * 2;
              if (iVar57 < (int)uVar84) {
                uVar94 = iVar116 * (int)local_348;
                iVar78 = iVar100 * uVar119;
                lVar98 = (long)iVar96;
                lVar60 = lVar98 * 3;
                lVar61 = lVar98 * 5;
                lVar80 = lVar98 * 6;
                lVar86 = lVar98 * 7;
                uVar55 = uVar90 & 0xfffffff8;
                uVar73 = (ulong)(uVar54 - 1);
                lVar63 = uVar73 + 1;
                lVar65 = uVar73 * 8 + 8;
                lVar93 = uVar73 * 2 + 2;
                local_238 = (ulong)(int)uVar84;
                uVar73 = (long)iVar57;
                do {
                  local_328 = uVar73;
                  local_400 = (undefined1 (*) [16])
                              (local_318.cstep * local_328 * local_318.elemsize +
                              (long)local_318.data);
                  cVar20 = (char)local_328;
                  iVar57 = (int)local_328;
                  if ((int)uVar94 < 4) {
                    uVar64 = 0;
                  }
                  else {
                    iVar116 = iVar57 + 3;
                    if (-1 < iVar57) {
                      iVar116 = iVar57;
                    }
                    local_2d0 = (ulong)(int)((iVar57 - (((uint)(local_328 >> 0x1f) & 1) + iVar57 &
                                                       0xfffffffe)) + (iVar116 >> 2) +
                                            (int)((char)(cVar20 - ((byte)iVar116 & 0xfc)) / '\x02'))
                    ;
                    uVar56 = 0;
                    do {
                      iVar97 = (int)uVar56 / (int)local_348;
                      iVar71 = (int)uVar56 % (int)local_348;
                      uVar73 = CONCAT44((int)(uVar56 | 1) >> 0x1f,uVar56) | 1;
                      uVar112 = CONCAT44((int)(uVar56 | 2) >> 0x1f,uVar56) | 2;
                      uVar68 = CONCAT44((int)(uVar56 | 3) >> 0x1f,uVar56) | 3;
                      iVar116 = (int)((long)uVar68 % (long)(int)local_348);
                      pvVar87 = (void *)((this->weight_data_tm).cstep * local_2d0 *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                      auVar138 = ZEXT1664((undefined1  [16])0x0);
                      auVar127 = (undefined1  [16])0x0;
                      iVar58 = (int)((long)uVar68 / (long)(int)local_348);
                      iVar111 = (int)((long)uVar73 % (long)(int)local_348);
                      local_378 = (void *)CONCAT44(local_378._4_4_,iVar111);
                      iVar79 = (int)((long)uVar112 / (long)(int)local_348);
                      local_350 = CONCAT44(local_350._4_4_,iVar79);
                      local_330 = (void *)CONCAT44(local_330._4_4_,iVar71);
                      iVar107 = (int)((long)uVar73 / (long)(int)local_348);
                      local_320 = CONCAT44(local_320._4_4_,iVar107);
                      iVar118 = (int)((long)uVar112 % (long)(int)local_348);
                      local_2c8 = CONCAT44(local_2c8._4_4_,iVar97);
                      if ((int)uVar90 < 8) {
                        uVar73 = 0;
                        auVar134 = (undefined1  [16])0x0;
                        auVar131 = (undefined1  [16])0x0;
                        auVar133 = (undefined1  [16])0x0;
                      }
                      else {
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        uVar73 = 0;
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        auVar150 = ZEXT1664((undefined1  [16])0x0);
                        auVar146 = ZEXT1664((undefined1  [16])0x0);
                        do {
                          iVar108 = (int)uVar73;
                          if (0 < (int)uVar54) {
                            local_368._0_8_ = uVar73;
                            lVar103 = (long)(iVar108 / iVar100) *
                                      local_3c8.cstep * local_3c8.elemsize;
                            uVar73 = 0;
                            do {
                              lVar105 = (long)*(int *)(opt_q._0_8_ + uVar73 * 4);
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  lVar105 + lVar103 + (iVar97 * iVar59) * lVar101 +
                                                                      (long)(iVar71 * iVar78));
                              puVar75 = (ulong *)((long)local_3c8.data +
                                                 lVar105 + lVar103 + (iVar107 * iVar59) * lVar101 +
                                                                     (long)(iVar111 * iVar78));
                              puVar1 = (ulong *)((long)local_3c8.data +
                                                lVar105 + lVar103 + (iVar79 * iVar59) * lVar101 +
                                                                    (long)(iVar118 * iVar78));
                              puVar114 = (ulong *)((long)local_3c8.data +
                                                  lVar105 + lVar103 + (iVar58 * iVar59) * lVar101 +
                                                                      (long)(iVar116 * iVar78));
                              if (iVar100 == 8) {
                                auVar147._8_8_ = 0;
                                auVar147._0_8_ = *puVar109;
                                auVar156._8_8_ = 0;
                                auVar156._0_8_ = *puVar75;
                                auVar165._8_8_ = 0;
                                auVar165._0_8_ = *puVar1;
                                auVar169._8_8_ = 0;
                                auVar169._0_8_ = *puVar114;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80),6);
                                auVar147 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar75),
                                                       (uint)*(byte *)((long)puVar75 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80),6);
                                auVar156 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar1),
                                                       (uint)*(byte *)((long)puVar1 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar80),6);
                                auVar165 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar1 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar114),
                                                       (uint)*(byte *)((long)puVar114 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar80),6);
                                auVar169 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar114 +
                                                                               lVar86),7);
                              }
                              auVar127 = vpmovsxbw_avx(auVar147);
                              auVar133 = vpmovsxbw_avx(auVar156);
                              auVar134 = vpmovsxbw_avx(auVar165);
                              auVar131 = vpmovsxbw_avx(auVar169);
                              auVar13._8_8_ = 0;
                              auVar13._0_8_ = *(ulong *)((long)pvVar87 + uVar73 * 8);
                              auVar124 = vpmovsxbw_avx(auVar13);
                              auVar127 = vpmaddwd_avx(auVar124,auVar127);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar124,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar146._0_16_);
                              auVar146 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar124,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar150._0_16_);
                              auVar150 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar124,auVar131);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              uVar73 = uVar73 + 1;
                            } while (uVar83 != uVar73);
                            pvVar87 = (void *)((long)pvVar87 + uVar83 * 8);
                          }
                          auVar134 = auVar146._0_16_;
                          auVar131 = auVar150._0_16_;
                          auVar127 = auVar138._0_16_;
                          auVar133 = auVar143._0_16_;
                          uVar73 = (ulong)(iVar108 + 8);
                        } while (iVar108 + 0xf < (int)uVar90);
                        uVar73 = (ulong)uVar55;
                      }
                      auVar133 = vphaddd_avx(auVar131,auVar133);
                      auVar127 = vphaddd_avx(auVar127,auVar134);
                      auVar127 = vphaddd_avx(auVar127,auVar133);
                      auVar138 = ZEXT1664(auVar127);
                      if ((int)((uint)uVar73 | 1) < (int)uVar90) {
                        local_368._0_8_ = local_3c8.cstep * local_3c8.elemsize;
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        do {
                          if (0 < (int)uVar54) {
                            lVar72 = local_3c8.cstep * local_3c8.elemsize * uVar73;
                            lVar103 = lVar72 + (iVar97 * iVar59) * lVar101 +
                                               (long)(int)(iVar71 * uVar119);
                            lVar105 = lVar72 + (iVar107 * iVar59) * lVar101 +
                                               (long)(int)(iVar111 * uVar119);
                            lVar113 = lVar72 + (iVar79 * iVar59) * lVar101 +
                                               (long)(int)(iVar118 * uVar119);
                            lVar72 = lVar72 + (iVar58 * iVar59) * lVar101 +
                                              (long)(int)(iVar116 * uVar119);
                            uVar112 = 0;
                            do {
                              lVar67 = (long)*(int *)(opt_q._0_8_ + uVar112 * 4);
                              auVar127 = vpinsrw_avx(ZEXT416((uint)(int)*(char *)((long)local_3c8.
                                                                                        data +
                                                                                 lVar67 + lVar103)),
                                                     (int)*(char *)((long)local_3c8.data +
                                                                   lVar98 + lVar67 + lVar103),1);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar67 + lVar105),2);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar98 + lVar67 + 
                                                  lVar105),3);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar67 + lVar113),4);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar98 + lVar67 + 
                                                  lVar113),5);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar67 + lVar72),6);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar98 + lVar67 + lVar72
                                                                            ),7);
                              auVar133 = vpmovsxbw_avx(ZEXT216(*(ushort *)
                                                                ((long)pvVar87 + uVar112 * 2)));
                              auVar133 = vpshufd_avx(auVar133,0);
                              auVar127 = vpmaddwd_avx(auVar127,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              uVar112 = uVar112 + 1;
                            } while (uVar83 != uVar112);
                            pvVar87 = (void *)((long)pvVar87 + uVar83 * 2);
                          }
                          uVar73 = uVar73 + 2;
                        } while ((int)((uint)uVar73 | 1) < (int)uVar90);
                      }
                      auVar127 = auVar138._0_16_;
                      if ((int)uVar73 < (int)uVar90) {
                        local_368._0_8_ = local_3c8.cstep * local_3c8.elemsize;
                        lVar101 = (long)local_3c8.w * local_3c8.elemsize;
                        uVar73 = uVar73 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = local_3c8.cstep * local_3c8.elemsize * uVar73;
                            uVar112 = 0;
                            do {
                              lVar105 = (long)*(int *)(opt_q._0_8_ + uVar112 * 4);
                              auVar127 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)pvVar87 +
                                                                                  uVar112)),0);
                              auVar134 = vpshufd_avx(auVar127,0);
                              auVar127 = vpinsrw_avx(ZEXT416((int)*(char *)((long)local_3c8.data +
                                                                           lVar105 + lVar103 + (
                                                  iVar97 * iVar59) * lVar101 +
                                                  (long)(int)(iVar71 * uVar119)) & 0xffff),
                                                  (int)*(char *)((long)local_3c8.data +
                                                                lVar105 + lVar103 + (iVar107 *
                                                                                    iVar59) * 
                                                  lVar101 + (long)(int)(iVar111 * uVar119)),1);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar105 + lVar103 + (
                                                  iVar79 * iVar59) * lVar101 +
                                                  (long)(int)(iVar118 * uVar119)),2);
                              auVar127 = vpinsrw_avx(auVar127,(int)*(char *)((long)local_3c8.data +
                                                                            lVar105 + lVar103 + (
                                                  iVar58 * iVar59) * lVar101 +
                                                  (long)(int)(iVar116 * uVar119)),3);
                              auVar133 = vpmullw_avx(auVar127,auVar134);
                              auVar127 = vpmulhw_avx(auVar127,auVar134);
                              auVar127 = vpunpcklwd_avx(auVar133,auVar127);
                              auVar127 = vpaddd_avx(auVar138._0_16_,auVar127);
                              auVar138 = ZEXT1664(auVar127);
                              uVar112 = uVar112 + 1;
                            } while (uVar83 != uVar112);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          auVar127 = auVar138._0_16_;
                          uVar73 = uVar73 + 1;
                        } while ((int)uVar73 < (int)uVar90);
                      }
                      *local_400 = auVar127;
                      local_400 = local_400 + 1;
                      uVar64 = uVar56 + 4;
                      iVar116 = uVar56 + 7;
                      uVar56 = uVar64;
                    } while (iVar116 < (int)uVar94);
                  }
                  uVar56 = uVar64 | 1;
                  if ((int)uVar56 < (int)uVar94) {
                    iVar116 = iVar57 + 3;
                    if (-1 < iVar57) {
                      iVar116 = iVar57;
                    }
                    local_378 = (void *)((long)(int)((iVar57 - (((uint)(local_328 >> 0x1f) & 1) +
                                                                iVar57 & 0xfffffffe)) +
                                                     (iVar116 >> 2) +
                                                    (int)((char)(cVar20 - ((byte)iVar116 & 0xfc)) /
                                                         '\x02')) * (this->weight_data_tm).cstep *
                                         (this->weight_data_tm).elemsize +
                                        (long)(this->weight_data_tm).data);
                    lVar101 = local_3c8.cstep * local_3c8.elemsize;
                    local_368._0_8_ = lVar101;
                    uVar95 = uVar64;
                    do {
                      iVar107 = (int)uVar95 / (int)local_348;
                      iVar111 = (int)uVar95 % (int)local_348;
                      uVar73 = (long)(int)uVar56 / (long)(int)local_348;
                      iVar116 = (int)uVar56 % (int)local_348;
                      pvVar87 = local_378;
                      if ((int)uVar90 < 8) {
                        uVar68 = 0;
                        auVar133 = (undefined1  [16])0x0;
                        auVar127 = (undefined1  [16])0x0;
                        uVar112 = uVar73;
                      }
                      else {
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                        auVar143 = ZEXT1664((undefined1  [16])0x0);
                        iVar118 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = (iVar118 / iVar100) * lVar101;
                            uVar112 = 0;
                            do {
                              lVar105 = (long)*(int *)(opt_q._0_8_ + uVar112 * 4);
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  lVar105 + lVar103 + (long)(iVar107 * iVar59) *
                                                                      (long)local_3c8.w *
                                                                      local_3c8.elemsize +
                                                                      (long)(iVar111 * iVar78));
                              puVar75 = (ulong *)((long)local_3c8.data +
                                                 lVar105 + lVar103 + (long)((int)uVar73 * iVar59) *
                                                                     (long)local_3c8.w *
                                                                     local_3c8.elemsize +
                                                                     (long)(iVar116 * iVar78));
                              if (iVar100 == 8) {
                                auVar139._8_8_ = 0;
                                auVar139._0_8_ = *puVar109;
                                auVar145._8_8_ = 0;
                                auVar145._0_8_ = *puVar75;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80),6);
                                auVar139 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar86),7);
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar75),
                                                       (uint)*(byte *)((long)puVar75 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar80),6);
                                auVar145 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar75 +
                                                                               lVar86),7);
                              }
                              auVar127 = vpmovsxbw_avx(auVar139);
                              auVar133 = vpmovsxbw_avx(auVar145);
                              auVar14._8_8_ = 0;
                              auVar14._0_8_ = *(ulong *)((long)pvVar87 + uVar112 * 8);
                              auVar134 = vpmovsxbw_avx(auVar14);
                              auVar127 = vpmaddwd_avx(auVar127,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar143._0_16_);
                              auVar143 = ZEXT1664(auVar127);
                              auVar127 = vpmaddwd_avx(auVar133,auVar134);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              uVar112 = uVar112 + 1;
                            } while (uVar83 != uVar112);
                            pvVar87 = (void *)((long)pvVar87 + lVar65);
                          }
                          auVar127 = auVar138._0_16_;
                          auVar133 = auVar143._0_16_;
                          iVar71 = iVar118 + 0xf;
                          iVar118 = iVar118 + 8;
                        } while (iVar71 < (int)uVar90);
                        uVar68 = (ulong)uVar55;
                        uVar112 = uVar73 & 0xffffffff;
                      }
                      uVar104 = uVar112 & 0xffffffff;
                      iVar97 = (int)uVar112;
                      auVar133 = vphaddd_avx(auVar133,auVar133);
                      auVar133 = vphaddd_avx(auVar133,auVar133);
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar71 = auVar133._0_4_;
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar118 = auVar127._0_4_;
                      if ((int)((uint)uVar68 | 1) < (int)uVar90) {
                        iVar79 = iVar97 * iVar59;
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = uVar68 * lVar101 +
                                      (long)(iVar107 * iVar59) *
                                      (long)local_3c8.w * local_3c8.elemsize +
                                      (long)(int)(iVar111 * uVar119);
                            lVar105 = uVar68 * lVar101 +
                                      (long)iVar79 * (long)local_3c8.w * local_3c8.elemsize +
                                      (long)(int)(iVar116 * uVar119);
                            uVar112 = 0;
                            do {
                              lVar113 = (long)*(int *)(opt_q._0_8_ + uVar112 * 4);
                              iVar97 = (int)*(char *)((long)pvVar87 + uVar112 * 2);
                              iVar58 = (int)*(char *)((long)pvVar87 + uVar112 * 2 + 1);
                              iVar71 = *(char *)((long)local_3c8.data + lVar98 + lVar113 + lVar103)
                                       * iVar58 +
                                       *(char *)((long)local_3c8.data + lVar113 + lVar103) * iVar97
                                       + iVar71;
                              iVar118 = *(char *)((long)local_3c8.data + lVar98 + lVar113 + lVar105)
                                        * iVar58 +
                                        *(char *)((long)local_3c8.data + lVar113 + lVar105) * iVar97
                                        + iVar118;
                              uVar112 = uVar112 + 1;
                            } while (uVar83 != uVar112);
                            pvVar87 = (void *)((long)pvVar87 + lVar93);
                            uVar104 = uVar73 & 0xffffffff;
                          }
                          iVar97 = (int)uVar104;
                          uVar68 = uVar68 + 2;
                        } while ((int)((uint)uVar68 | 1) < (int)uVar90);
                      }
                      if ((int)uVar68 < (int)uVar90) {
                        uVar68 = uVar68 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            uVar73 = 0;
                            do {
                              lVar103 = (long)*(int *)(opt_q._0_8_ + uVar73 * 4);
                              iVar71 = iVar71 + (int)*(char *)((long)local_3c8.data +
                                                              lVar103 + uVar68 * lVar101 +
                                                                        (long)(iVar107 * iVar59) *
                                                                        (long)local_3c8.w *
                                                                        local_3c8.elemsize +
                                                                        (long)(int)(iVar111 *
                                                                                   uVar119)) *
                                                (int)*(char *)((long)pvVar87 + uVar73);
                              iVar118 = iVar118 + (int)*(char *)((long)local_3c8.data +
                                                                lVar103 + uVar68 * lVar101 +
                                                                          (long)(iVar97 * iVar59) *
                                                                          (long)local_3c8.w *
                                                                          local_3c8.elemsize +
                                                                          (long)(int)(iVar116 *
                                                                                     uVar119)) *
                                                  (int)*(char *)((long)pvVar87 + uVar73);
                              uVar73 = uVar73 + 1;
                            } while (uVar83 != uVar73);
                            pvVar87 = (void *)((long)pvVar87 + lVar63);
                          }
                          uVar68 = uVar68 + 1;
                        } while ((int)uVar68 < (int)uVar90);
                      }
                      *(int *)*local_400 = iVar71;
                      *(int *)(*local_400 + 4) = iVar118;
                      local_400 = (undefined1 (*) [16])(*local_400 + 8);
                      uVar64 = uVar95 + 2;
                      uVar56 = uVar95 + 3;
                      uVar95 = uVar64;
                    } while ((int)uVar56 < (int)uVar94);
                  }
                  if ((int)uVar64 < (int)uVar94) {
                    iVar116 = iVar57 + 3;
                    if (-1 < iVar57) {
                      iVar116 = iVar57;
                    }
                    pvVar87 = (void *)((long)(int)((iVar57 - (((uint)(local_328 >> 0x1f) & 1) +
                                                              iVar57 & 0xfffffffe)) + (iVar116 >> 2)
                                                  + (int)((char)(cVar20 - ((byte)iVar116 & 0xfc)) /
                                                         '\x02')) * (this->weight_data_tm).cstep *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    lVar101 = local_3c8.cstep * local_3c8.elemsize;
                    do {
                      iVar116 = (int)uVar64 / (int)local_348;
                      iVar57 = (int)uVar64 % (int)local_348;
                      local_368._0_4_ = iVar57;
                      pvVar123 = pvVar87;
                      if ((int)uVar90 < 8) {
                        uVar73 = 0;
                        auVar127 = (undefined1  [16])0x0;
                      }
                      else {
                        auVar138 = ZEXT1664((undefined1  [16])0x0);
                        iVar107 = 0;
                        do {
                          if (0 < (int)uVar54) {
                            uVar73 = 0;
                            do {
                              puVar109 = (ulong *)((long)local_3c8.data +
                                                  (long)*(int *)(opt_q._0_8_ + uVar73 * 4) +
                                                  (iVar107 / iVar100) * lVar101 +
                                                  (long)local_3c8.w * local_3c8.elemsize *
                                                  (long)(iVar116 * iVar59) + (long)(iVar57 * iVar78)
                                                  );
                              if (iVar100 == 8) {
                                auVar132._8_8_ = 0;
                                auVar132._0_8_ = *puVar109;
                              }
                              else {
                                auVar127 = vpinsrb_avx(ZEXT116((byte)*puVar109),
                                                       (uint)*(byte *)((long)puVar109 + lVar98),1);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 2),2);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar60),3);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar98 * 4),4);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar61),5);
                                auVar127 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar80),6);
                                auVar132 = vpinsrb_avx(auVar127,(uint)*(byte *)((long)puVar109 +
                                                                               lVar86),7);
                              }
                              auVar127 = vpmovsxbw_avx(auVar132);
                              auVar15._8_8_ = 0;
                              auVar15._0_8_ = *(ulong *)((long)pvVar123 + uVar73 * 8);
                              auVar133 = vpmovsxbw_avx(auVar15);
                              auVar127 = vpmaddwd_avx(auVar127,auVar133);
                              auVar127 = vpaddd_avx(auVar127,auVar138._0_16_);
                              auVar138 = ZEXT1664(auVar127);
                              uVar73 = uVar73 + 1;
                            } while (uVar83 != uVar73);
                            pvVar123 = (void *)((long)pvVar123 + lVar65);
                          }
                          auVar127 = auVar138._0_16_;
                          iVar111 = iVar107 + 0xf;
                          iVar107 = iVar107 + 8;
                        } while (iVar111 < (int)uVar90);
                        uVar73 = (ulong)uVar55;
                      }
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      auVar127 = vphaddd_avx(auVar127,auVar127);
                      iVar107 = auVar127._0_4_;
                      if ((int)((uint)uVar73 | 1) < (int)uVar90) {
                        do {
                          if (0 < (int)uVar54) {
                            lVar103 = uVar73 * lVar101 +
                                      (long)local_3c8.w * local_3c8.elemsize *
                                      (long)(iVar116 * iVar59) + (long)(int)(iVar57 * uVar119);
                            uVar112 = 0;
                            do {
                              lVar105 = (long)*(int *)(opt_q._0_8_ + uVar112 * 4);
                              iVar107 = (int)*(char *)((long)pvVar123 + uVar112 * 2 + 1) *
                                        (int)*(char *)((long)local_3c8.data +
                                                      lVar98 + lVar105 + lVar103) +
                                        (int)*(char *)((long)pvVar123 + uVar112 * 2) *
                                        (int)*(char *)((long)local_3c8.data + lVar105 + lVar103) +
                                        iVar107;
                              uVar112 = uVar112 + 1;
                            } while (uVar83 != uVar112);
                            pvVar123 = (void *)((long)pvVar123 + lVar93);
                          }
                          uVar73 = uVar73 + 2;
                        } while ((int)((uint)uVar73 | 1) < (int)uVar90);
                      }
                      if ((int)uVar73 < (int)uVar90) {
                        uVar73 = uVar73 & 0xffffffff;
                        do {
                          if (0 < (int)uVar54) {
                            uVar112 = 0;
                            do {
                              iVar107 = iVar107 + (int)*(char *)((long)pvVar123 + uVar112) *
                                                  (int)*(char *)((long)local_3c8.data +
                                                                (long)*(int *)(opt_q._0_8_ +
                                                                              uVar112 * 4) +
                                                                uVar73 * lVar101 +
                                                                (long)(iVar116 * iVar59) *
                                                                local_3c8.elemsize *
                                                                (long)local_3c8.w +
                                                                (long)(int)(iVar57 * uVar119));
                              uVar112 = uVar112 + 1;
                            } while (uVar83 != uVar112);
                            pvVar123 = (void *)((long)pvVar123 + lVar63);
                          }
                          uVar73 = uVar73 + 1;
                        } while ((int)uVar73 < (int)uVar90);
                      }
                      *(int *)*local_400 = iVar107;
                      local_400 = (undefined1 (*) [16])(*local_400 + 4);
                      uVar64 = uVar64 + 1;
                    } while (uVar64 != uVar94);
                  }
                  uVar73 = local_328 + 1;
                } while (local_328 + 1 != local_238);
              }
              local_104 = iVar96;
              local_100 = (ulong)uVar84;
              if (opt_q._0_8_ != 0) {
                operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
              }
            }
            else {
              convolution_packed_int8_xop
                        (&local_3c8,&local_318,&this->weight_data_tm,auVar133._0_4_,auVar133._4_4_,
                         auVar133._8_4_,auVar133._12_4_,uVar119,iVar59,local_340);
            }
          }
          else {
            convolution_packed_int8_avx2
                      (&local_3c8,&local_318,&this->weight_data_tm,auVar133._0_4_,auVar133._4_4_,
                       auVar133._8_4_,auVar133._12_4_,uVar119,iVar59,local_340);
          }
        }
        pOVar77 = local_340;
        uVar119 = local_318.c;
        sVar51 = local_318.cstep;
        if (local_340->use_packing_layout == true) {
          if (100 < local_22c) {
            if (local_318.elempack == 4) {
              if ((local_318.c & 0x80000001U) == 1) {
                local_278.lightmode = false;
                local_278.use_shader_pack8 = false;
                local_278.use_subgroup_ops = false;
                local_278.use_reserved_0 = false;
                local_278.num_threads = 0;
                opt_q.lightmode = false;
                opt_q.use_shader_pack8 = false;
                opt_q.use_subgroup_ops = false;
                opt_q.use_reserved_0 = false;
                opt_q.num_threads = 0;
                opt_q.blob_allocator._0_4_ = 0;
                opt_q.blob_allocator._4_4_ = 0;
                opt_q.workspace_allocator = (Allocator *)0x0;
                opt_q.openmp_blocktime = 0;
                opt_q.use_bf16_storage = false;
                opt_q.use_fp16_packed = false;
                opt_q.use_fp16_storage = false;
                opt_q.use_fp16_arithmetic = false;
                opt_q.use_int8_packed = false;
                opt_q.use_int8_storage = false;
                opt_q.use_int8_arithmetic = false;
                opt_q.use_packing_layout = false;
                opt_q.vulkan_device_index = 0;
                opt_q.use_reserved_1 = false;
                opt_q.use_image_storage = false;
                opt_q.use_tensor_storage = false;
                opt_q.use_reserved_2 = false;
                opt_q.flush_denormals = 0;
                opt_q.use_local_pool_allocator = false;
                opt_q.use_shader_local_memory = false;
                opt_q.use_cooperative_matrix = false;
                opt_q.use_winograd23_convolution = false;
                opt_q.use_winograd43_convolution = false;
                opt_q.use_winograd63_convolution = false;
                opt_q.use_a53_a55_optimized_kernel = false;
                opt_q.use_fp16_uniform = false;
                convert_packing(&local_318,(Mat *)&opt_q,1,local_340);
                piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                if (piVar106 != (int *)0x0) {
                  LOCK();
                  *piVar106 = *piVar106 + 1;
                  UNLOCK();
                }
                piVar106 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
                if (piVar106 != (int *)0x0) {
                  LOCK();
                  *piVar106 = *piVar106 + -1;
                  UNLOCK();
                  if (*piVar106 == 0) {
                    if (local_318.allocator == (Allocator *)0x0) {
                      if (local_318.data != (void *)0x0) {
                        free(local_318.data);
                      }
                    }
                    else {
                      (*(local_318.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                local_318.data = (void *)opt_q._0_8_;
                local_318.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                local_318.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                local_318.elemsize = (size_t)opt_q.workspace_allocator;
                local_318.elempack = opt_q.openmp_blocktime;
                local_318.allocator = (Allocator *)opt_q._32_8_;
                local_318.dims = opt_q.vulkan_device_index;
                local_318.w._0_1_ = opt_q.use_reserved_1;
                local_318.w._1_1_ = opt_q.use_image_storage;
                local_318.w._2_1_ = opt_q.use_tensor_storage;
                local_318.w._3_1_ = opt_q.use_reserved_2;
                local_318.h = opt_q.flush_denormals;
                local_318.d._0_1_ = opt_q.use_local_pool_allocator;
                local_318.d._1_1_ = opt_q.use_shader_local_memory;
                local_318.d._2_1_ = opt_q.use_cooperative_matrix;
                local_318.d._3_1_ = opt_q.use_winograd23_convolution;
                local_318.c._0_1_ = opt_q.use_winograd43_convolution;
                local_318.c._1_1_ = opt_q.use_winograd63_convolution;
                local_318.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                local_318.c._3_1_ = opt_q.use_fp16_uniform;
                local_318.cstep._0_1_ = local_278.lightmode;
                local_318.cstep._1_1_ = local_278.use_shader_pack8;
                local_318.cstep._2_1_ = local_278.use_subgroup_ops;
                local_318.cstep._3_1_ = local_278.use_reserved_0;
                local_318.cstep._4_4_ = local_278.num_threads;
                if (piVar106 != (int *)0x0) {
                  LOCK();
                  *piVar106 = *piVar106 + -1;
                  UNLOCK();
                  if (*piVar106 == 0) {
                    if (opt_q._32_8_ == 0) {
                      if (opt_q._0_8_ != 0) {
                        free((void *)opt_q._0_8_);
                      }
                    }
                    else {
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                    }
                  }
                }
                uVar119 = local_318.c;
                sVar51 = local_318.cstep;
                if (local_318.elempack != 4) goto LAB_00207b85;
              }
              uVar119 = local_318.c;
              sVar51 = local_318.cstep;
              if ((local_318.c & 1U) == 0) {
                local_278.lightmode = false;
                local_278.use_shader_pack8 = false;
                local_278.use_subgroup_ops = false;
                local_278.use_reserved_0 = false;
                local_278.num_threads = 0;
                opt_q.lightmode = false;
                opt_q.use_shader_pack8 = false;
                opt_q.use_subgroup_ops = false;
                opt_q.use_reserved_0 = false;
                opt_q.num_threads = 0;
                opt_q.blob_allocator._0_4_ = 0;
                opt_q.blob_allocator._4_4_ = 0;
                opt_q.workspace_allocator = (Allocator *)0x0;
                opt_q.openmp_blocktime = 0;
                opt_q.use_bf16_storage = false;
                opt_q.use_fp16_packed = false;
                opt_q.use_fp16_storage = false;
                opt_q.use_fp16_arithmetic = false;
                opt_q.use_int8_packed = false;
                opt_q.use_int8_storage = false;
                opt_q.use_int8_arithmetic = false;
                opt_q.use_packing_layout = false;
                opt_q.vulkan_device_index = 0;
                opt_q.use_reserved_1 = false;
                opt_q.use_image_storage = false;
                opt_q.use_tensor_storage = false;
                opt_q.use_reserved_2 = false;
                opt_q.flush_denormals = 0;
                opt_q.use_local_pool_allocator = false;
                opt_q.use_shader_local_memory = false;
                opt_q.use_cooperative_matrix = false;
                opt_q.use_winograd23_convolution = false;
                opt_q.use_winograd43_convolution = false;
                opt_q.use_winograd63_convolution = false;
                opt_q.use_a53_a55_optimized_kernel = false;
                opt_q.use_fp16_uniform = false;
                convert_packing(&local_318,(Mat *)&opt_q,8,pOVar77);
                piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                if (piVar106 != (int *)0x0) {
                  LOCK();
                  *piVar106 = *piVar106 + 1;
                  UNLOCK();
                }
                piVar106 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
                if (piVar106 != (int *)0x0) {
                  LOCK();
                  *piVar106 = *piVar106 + -1;
                  UNLOCK();
                  if (*piVar106 == 0) {
                    if (local_318.allocator == (Allocator *)0x0) {
                      if (local_318.data != (void *)0x0) {
                        free(local_318.data);
                      }
                    }
                    else {
                      (*(local_318.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                local_318.data = (void *)opt_q._0_8_;
                local_318.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                local_318.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                local_318.elemsize = (size_t)opt_q.workspace_allocator;
                local_318.elempack = opt_q.openmp_blocktime;
                local_318.allocator = (Allocator *)opt_q._32_8_;
                local_318.dims = opt_q.vulkan_device_index;
                local_318.w._0_1_ = opt_q.use_reserved_1;
                local_318.w._1_1_ = opt_q.use_image_storage;
                local_318.w._2_1_ = opt_q.use_tensor_storage;
                local_318.w._3_1_ = opt_q.use_reserved_2;
                local_318.h = opt_q.flush_denormals;
                local_318.d._0_1_ = opt_q.use_local_pool_allocator;
                local_318.d._1_1_ = opt_q.use_shader_local_memory;
                local_318.d._2_1_ = opt_q.use_cooperative_matrix;
                local_318.d._3_1_ = opt_q.use_winograd23_convolution;
                uVar119._0_1_ = opt_q.use_winograd43_convolution;
                uVar119._1_1_ = opt_q.use_winograd63_convolution;
                uVar119._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                uVar119._3_1_ = opt_q.use_fp16_uniform;
                local_318.c._0_1_ = opt_q.use_winograd43_convolution;
                local_318.c._1_1_ = opt_q.use_winograd63_convolution;
                local_318.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                local_318.c._3_1_ = opt_q.use_fp16_uniform;
                sVar51._0_1_ = local_278.lightmode;
                sVar51._1_1_ = local_278.use_shader_pack8;
                sVar51._2_1_ = local_278.use_subgroup_ops;
                sVar51._3_1_ = local_278.use_reserved_0;
                sVar51._4_4_ = local_278.num_threads;
                local_318.cstep._0_1_ = local_278.lightmode;
                local_318.cstep._1_1_ = local_278.use_shader_pack8;
                local_318.cstep._2_1_ = local_278.use_subgroup_ops;
                local_318.cstep._3_1_ = local_278.use_reserved_0;
                local_318.cstep._4_4_ = local_278.num_threads;
                if (piVar106 != (int *)0x0) {
                  LOCK();
                  *piVar106 = *piVar106 + -1;
                  UNLOCK();
                  uVar119 = local_318.c;
                  sVar51 = local_318.cstep;
                  if (*piVar106 == 0) {
                    if (opt_q._32_8_ == 0) {
                      if (opt_q._0_8_ != 0) {
                        free((void *)opt_q._0_8_);
                        uVar119 = local_318.c;
                        sVar51 = local_318.cstep;
                      }
                    }
                    else {
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      uVar119 = local_318.c;
                      sVar51 = local_318.cstep;
                    }
                  }
                }
              }
            }
LAB_00207b85:
            local_318.cstep = sVar51;
            local_318.c = uVar119;
            iVar100 = 0;
            requantize_from_int32_to_int8
                      (&local_318,top_blob,&this->scale_in_data,
                       &(this->super_Convolution).top_blob_int8_scales,
                       &(this->super_Convolution).bias_data,
                       (this->super_Convolution).activation_type,
                       &(this->super_Convolution).activation_params,pOVar77);
            goto LAB_0020c17f;
          }
          if ((local_318.elempack == 4) && ((local_318.c & 1U) == 0)) {
            local_278.lightmode = false;
            local_278.use_shader_pack8 = false;
            local_278.use_subgroup_ops = false;
            local_278.use_reserved_0 = false;
            local_278.num_threads = 0;
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.vulkan_device_index = 0;
            opt_q.use_reserved_1 = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_2 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_fp16_uniform = false;
            convert_packing(&local_318,(Mat *)&opt_q,8,local_340);
            piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar106 != (int *)0x0) {
              LOCK();
              *piVar106 = *piVar106 + 1;
              UNLOCK();
            }
            piVar106 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
            if (piVar106 != (int *)0x0) {
              LOCK();
              *piVar106 = *piVar106 + -1;
              UNLOCK();
              if (*piVar106 == 0) {
                if (local_318.allocator == (Allocator *)0x0) {
                  if (local_318.data != (void *)0x0) {
                    free(local_318.data);
                  }
                }
                else {
                  (*(local_318.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar106 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            local_318.data = (void *)opt_q._0_8_;
            local_318.refcount._0_4_ = opt_q.blob_allocator._0_4_;
            local_318.refcount._4_4_ = opt_q.blob_allocator._4_4_;
            local_318.elemsize = (size_t)opt_q.workspace_allocator;
            local_318.elempack = opt_q.openmp_blocktime;
            local_318.allocator = (Allocator *)opt_q._32_8_;
            local_318.dims = opt_q.vulkan_device_index;
            local_318.w._0_1_ = opt_q.use_reserved_1;
            local_318.w._1_1_ = opt_q.use_image_storage;
            local_318.w._2_1_ = opt_q.use_tensor_storage;
            local_318.w._3_1_ = opt_q.use_reserved_2;
            local_318.h = opt_q.flush_denormals;
            local_318.d._0_1_ = opt_q.use_local_pool_allocator;
            local_318.d._1_1_ = opt_q.use_shader_local_memory;
            local_318.d._2_1_ = opt_q.use_cooperative_matrix;
            local_318.d._3_1_ = opt_q.use_winograd23_convolution;
            local_318.c._0_1_ = opt_q.use_winograd43_convolution;
            local_318.c._1_1_ = opt_q.use_winograd63_convolution;
            local_318.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
            local_318.c._3_1_ = opt_q.use_fp16_uniform;
            local_318.cstep._0_1_ = local_278.lightmode;
            local_318.cstep._1_1_ = local_278.use_shader_pack8;
            local_318.cstep._2_1_ = local_278.use_subgroup_ops;
            local_318.cstep._3_1_ = local_278.use_reserved_0;
            local_318.cstep._4_4_ = local_278.num_threads;
            if (piVar106 != (int *)0x0) {
              LOCK();
              *piVar106 = *piVar106 + -1;
              UNLOCK();
              if (*piVar106 == 0) {
                if (opt_q._32_8_ == 0) {
                  if (opt_q._0_8_ != 0) {
                    free((void *)opt_q._0_8_);
                  }
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
          }
        }
        else if (100 < local_22c) goto LAB_00207b85;
        dequantize_from_int32
                  (&local_318,top_blob,&this->scale_in_data,&(this->super_Convolution).bias_data,
                   pOVar77);
        pLVar17 = this->activation;
        iVar100 = 0;
        if (pLVar17 != (Layer *)0x0) {
          (*pLVar17->_vptr_Layer[9])(pLVar17,top_blob,local_340);
        }
      }
LAB_0020c17f:
      piVar106 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
      if (piVar106 != (int *)0x0) {
        LOCK();
        *piVar106 = *piVar106 + -1;
        UNLOCK();
        if (*piVar106 == 0) {
          if (local_318.allocator == (Allocator *)0x0) {
            if (local_318.data != (void *)0x0) {
              free(local_318.data);
            }
          }
          else {
            (*(local_318.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  piVar106 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
  if (piVar106 != (int *)0x0) {
    LOCK();
    *piVar106 = *piVar106 + -1;
    UNLOCK();
    if (*piVar106 == 0) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0020c203:
  if (local_a8.refcount != (int *)0x0) {
    LOCK();
    *local_a8.refcount = *local_a8.refcount + -1;
    UNLOCK();
    if (*local_a8.refcount == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar100;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_avx input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}